

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen12dGPUCachePolicy.cpp
# Opt level: O0

GMM_STATUS __thiscall
GmmLib::GmmGen12dGPUCachePolicy::InitCachePolicy(GmmGen12dGPUCachePolicy *this)

{
  PRODUCT_FAMILY PVar1;
  GMM_CACHE_POLICY_ELEMENT *pGVar2;
  GMM_CACHE_POLICY_ELEMENT CachePolicyUsage;
  bool bVar3;
  WA_TABLE *pWVar4;
  GMM_PLATFORM_INFO *pGVar5;
  GMM_CACHE_POLICY_TBL_ELEMENT *pGVar6;
  GMM_PRIVATE_PAT *pGVar7;
  short sVar8;
  ushort uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  ulong extraout_RDX;
  undefined8 uStack_88;
  GMM_PRIVATE_PAT PAT;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  GMM_CACHE_POLICY_TBL_ELEMENT *local_60;
  GMM_CACHE_POLICY_TBL_ELEMENT *TblEle_2;
  GMM_CACHE_POLICY_TBL_ELEMENT *TblEle_1;
  GMM_CACHE_POLICY_TBL_ELEMENT *TblEle;
  GMM_PRIVATE_PAT UsagePATElement;
  uint32_t StartMocsIdx;
  GMM_CACHE_POLICY_TBL_ELEMENT UsageEle;
  uint64_t PTEValue;
  uint32_t i;
  uint32_t j;
  int32_t PATIdx;
  int32_t CPTblIdx;
  bool SpecialMOCS;
  bool CachePolicyError;
  GmmGen12dGPUCachePolicy *pGStack_18;
  uint32_t Usage;
  GmmGen12dGPUCachePolicy *this_local;
  
  if ((this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
      super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy ==
      (GMM_CACHE_POLICY_ELEMENT *)0x0) {
    this_local._4_4_ = GMM_ERROR;
  }
  else {
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[1].field_1.Value = pGVar2[1].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[1].field_1.Value = pGVar2[1].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[1].field_1.Value = pGVar2[1].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[1].field_1.Value = pGVar2[1].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[1].field_1.Value = pGVar2[1].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[1].field_1.Value = pGVar2[1].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[1].field_1.Value = pGVar2[1].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[1].field_1.Value = pGVar2[1].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[1].field_1.Value = pGVar2[1].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[1].field_1.Value = pGVar2[1].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[1].field_1.Value = pGVar2[1].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[1].field_1.Value = pGVar2[1].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[1].field_1.Value = pGVar2[1].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[1].field_1.Value = pGVar2[1].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[1].field_1.Value = pGVar2[1].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[1].field_1.Value = pGVar2[1].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[1].field_1.Value = pGVar2[1].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[1].field_1.Value = pGVar2[1].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[1].field_1.Value = pGVar2[1].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[1].field_1.Value = pGVar2[1].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[1].field_1.Value = pGVar2[1].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[1].field_1.Value = pGVar2[1].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[1].field_1.Value = pGVar2[1].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[1].field_1.Value = pGVar2[1].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[2].field_1.Value = pGVar2[2].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[2].field_1.Value = pGVar2[2].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[2].field_1.Value = pGVar2[2].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[2].field_1.Value = pGVar2[2].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[2].field_1.Value = pGVar2[2].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[2].field_1.Value = pGVar2[2].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[2].field_1.Value = pGVar2[2].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[2].field_1.Value = pGVar2[2].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[2].field_1.Value = pGVar2[2].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[2].field_1.Value = pGVar2[2].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[2].field_1.Value = pGVar2[2].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[2].field_1.Value = pGVar2[2].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[2].field_1.Value = pGVar2[2].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[2].field_1.Value = pGVar2[2].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[2].field_1.Value = pGVar2[2].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[2].field_1.Value = pGVar2[2].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[2].field_1.Value = pGVar2[2].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[2].field_1.Value = pGVar2[2].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[2].field_1.Value = pGVar2[2].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[2].field_1.Value = pGVar2[2].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[2].field_1.Value = pGVar2[2].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[2].field_1.Value = pGVar2[2].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[2].field_1.Value = pGVar2[2].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[2].field_1.Value = pGVar2[2].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[3].field_1.Value = pGVar2[3].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[3].field_1.Value = pGVar2[3].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[3].field_1.Value = pGVar2[3].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[3].field_1.Value = pGVar2[3].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[3].field_1.Value = pGVar2[3].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[3].field_1.Value = pGVar2[3].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[3].field_1.Value = pGVar2[3].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[3].field_1.Value = pGVar2[3].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[3].field_1.Value = pGVar2[3].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[3].field_1.Value = pGVar2[3].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[3].field_1.Value = pGVar2[3].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[3].field_1.Value = pGVar2[3].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[3].field_1.Value = pGVar2[3].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[3].field_1.Value = pGVar2[3].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[3].field_1.Value = pGVar2[3].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[3].field_1.Value = pGVar2[3].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[3].field_1.Value = pGVar2[3].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[3].field_1.Value = pGVar2[3].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[3].field_1.Value = pGVar2[3].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[3].field_1.Value = pGVar2[3].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[3].field_1.Value = pGVar2[3].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[3].field_1.Value = pGVar2[3].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[3].field_1.Value = pGVar2[3].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[3].field_1.Value = pGVar2[3].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[4].field_1.Value = pGVar2[4].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[4].field_1.Value = pGVar2[4].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[4].field_1.Value = pGVar2[4].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[4].field_1.Value = pGVar2[4].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[4].field_1.Value = pGVar2[4].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[4].field_1.Value = pGVar2[4].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[4].field_1.Value = pGVar2[4].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[4].field_1.Value = pGVar2[4].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[4].field_1.Value = pGVar2[4].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[4].field_1.Value = pGVar2[4].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[4].field_1.Value = pGVar2[4].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[4].field_1.Value = pGVar2[4].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[4].field_1.Value = pGVar2[4].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[4].field_1.Value = pGVar2[4].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[4].field_1.Value = pGVar2[4].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[4].field_1.Value = pGVar2[4].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[4].field_1.Value = pGVar2[4].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[4].field_1.Value = pGVar2[4].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[4].field_1.Value = pGVar2[4].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[4].field_1.Value = pGVar2[4].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[4].field_1.Value = pGVar2[4].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[4].field_1.Value = pGVar2[4].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[4].field_1.Value = pGVar2[4].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[4].field_1.Value = pGVar2[4].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[5].field_1.Value = pGVar2[5].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[5].field_1.Value = pGVar2[5].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[5].field_1.Value = pGVar2[5].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[5].field_1.Value = pGVar2[5].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[5].field_1.Value = pGVar2[5].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[5].field_1.Value = pGVar2[5].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[5].field_1.Value = pGVar2[5].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[5].field_1.Value = pGVar2[5].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[5].field_1.Value = pGVar2[5].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[5].field_1.Value = pGVar2[5].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[5].field_1.Value = pGVar2[5].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[5].field_1.Value = pGVar2[5].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[5].field_1.Value = pGVar2[5].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[5].field_1.Value = pGVar2[5].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[5].field_1.Value = pGVar2[5].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[5].field_1.Value = pGVar2[5].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[5].field_1.Value = pGVar2[5].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[5].field_1.Value = pGVar2[5].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[5].field_1.Value = pGVar2[5].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[5].field_1.Value = pGVar2[5].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[5].field_1.Value = pGVar2[5].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[5].field_1.Value = pGVar2[5].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[5].field_1.Value = pGVar2[5].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[5].field_1.Value = pGVar2[5].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[6].field_1.Value = pGVar2[6].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[6].field_1.Value = pGVar2[6].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[6].field_1.Value = pGVar2[6].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[6].field_1.Value = pGVar2[6].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[6].field_1.Value = pGVar2[6].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[6].field_1.Value = pGVar2[6].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[6].field_1.Value = pGVar2[6].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[6].field_1.Value = pGVar2[6].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[6].field_1.Value = pGVar2[6].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[6].field_1.Value = pGVar2[6].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[6].field_1.Value = pGVar2[6].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[6].field_1.Value = pGVar2[6].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[6].field_1.Value = pGVar2[6].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[6].field_1.Value = pGVar2[6].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[6].field_1.Value = pGVar2[6].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[6].field_1.Value = pGVar2[6].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[6].field_1.Value = pGVar2[6].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[6].field_1.Value = pGVar2[6].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[6].field_1.Value = pGVar2[6].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[6].field_1.Value = pGVar2[6].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[6].field_1.Value = pGVar2[6].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[6].field_1.Value = pGVar2[6].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[6].field_1.Value = pGVar2[6].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[6].field_1.Value = pGVar2[6].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[7].field_1.Value = pGVar2[7].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[7].field_1.Value = pGVar2[7].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[7].field_1.Value = pGVar2[7].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[7].field_1.Value = pGVar2[7].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[7].field_1.Value = pGVar2[7].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[7].field_1.Value = pGVar2[7].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[7].field_1.Value = pGVar2[7].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[7].field_1.Value = pGVar2[7].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[7].field_1.Value = pGVar2[7].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[7].field_1.Value = pGVar2[7].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[7].field_1.Value = pGVar2[7].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[7].field_1.Value = pGVar2[7].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[7].field_1.Value = pGVar2[7].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[7].field_1.Value = pGVar2[7].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[7].field_1.Value = pGVar2[7].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[7].field_1.Value = pGVar2[7].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[7].field_1.Value = pGVar2[7].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[7].field_1.Value = pGVar2[7].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[7].field_1.Value = pGVar2[7].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[7].field_1.Value = pGVar2[7].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[7].field_1.Value = pGVar2[7].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[7].field_1.Value = pGVar2[7].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[7].field_1.Value = pGVar2[7].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[7].field_1.Value = pGVar2[7].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[8].field_1.Value = pGVar2[8].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[8].field_1.Value = pGVar2[8].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[8].field_1.Value = pGVar2[8].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[8].field_1.Value = pGVar2[8].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[8].field_1.Value = pGVar2[8].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[8].field_1.Value = pGVar2[8].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[8].field_1.Value = pGVar2[8].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[8].field_1.Value = pGVar2[8].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[8].field_1.Value = pGVar2[8].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[8].field_1.Value = pGVar2[8].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[8].field_1.Value = pGVar2[8].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[8].field_1.Value = pGVar2[8].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[8].field_1.Value = pGVar2[8].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[8].field_1.Value = pGVar2[8].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[8].field_1.Value = pGVar2[8].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[8].field_1.Value = pGVar2[8].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[8].field_1.Value = pGVar2[8].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[8].field_1.Value = pGVar2[8].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[8].field_1.Value = pGVar2[8].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[8].field_1.Value = pGVar2[8].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[8].field_1.Value = pGVar2[8].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[8].field_1.Value = pGVar2[8].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[8].field_1.Value = pGVar2[8].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[8].field_1.Value = pGVar2[8].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[9].field_1.Value = pGVar2[9].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[9].field_1.Value = pGVar2[9].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[9].field_1.Value = pGVar2[9].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[9].field_1.Value = pGVar2[9].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[9].field_1.Value = pGVar2[9].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[9].field_1.Value = pGVar2[9].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[9].field_1.Value = pGVar2[9].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[9].field_1.Value = pGVar2[9].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[9].field_1.Value = pGVar2[9].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[9].field_1.Value = pGVar2[9].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[9].field_1.Value = pGVar2[9].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[9].field_1.Value = pGVar2[9].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[9].field_1.Value = pGVar2[9].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[9].field_1.Value = pGVar2[9].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[9].field_1.Value = pGVar2[9].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[9].field_1.Value = pGVar2[9].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[9].field_1.Value = pGVar2[9].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[9].field_1.Value = pGVar2[9].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[9].field_1.Value = pGVar2[9].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[9].field_1.Value = pGVar2[9].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[9].field_1.Value = pGVar2[9].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[9].field_1.Value = pGVar2[9].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[9].field_1.Value = pGVar2[9].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[9].field_1.Value = pGVar2[9].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[10].field_1.Value = pGVar2[10].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[10].field_1.Value = pGVar2[10].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[10].field_1.Value = pGVar2[10].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[10].field_1.Value = pGVar2[10].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[10].field_1.Value = pGVar2[10].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[10].field_1.Value = pGVar2[10].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[10].field_1.Value = pGVar2[10].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[10].field_1.Value = pGVar2[10].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[10].field_1.Value = pGVar2[10].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[10].field_1.Value = pGVar2[10].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[10].field_1.Value = pGVar2[10].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[10].field_1.Value = pGVar2[10].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[10].field_1.Value = pGVar2[10].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[10].field_1.Value = pGVar2[10].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[10].field_1.Value = pGVar2[10].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[10].field_1.Value = pGVar2[10].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[10].field_1.Value = pGVar2[10].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[10].field_1.Value = pGVar2[10].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[10].field_1.Value = pGVar2[10].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[10].field_1.Value = pGVar2[10].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[10].field_1.Value = pGVar2[10].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[10].field_1.Value = pGVar2[10].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[10].field_1.Value = pGVar2[10].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[10].field_1.Value = pGVar2[10].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb].field_1.Value = pGVar2[0xb].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb].field_1.Value = pGVar2[0xb].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb].field_1.Value = pGVar2[0xb].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb].field_1.Value = pGVar2[0xb].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb].field_1.Value = pGVar2[0xb].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb].field_1.Value = pGVar2[0xb].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb].field_1.Value = pGVar2[0xb].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb].field_1.Value = pGVar2[0xb].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb].field_1.Value = pGVar2[0xb].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb].field_1.Value = pGVar2[0xb].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb].field_1.Value = pGVar2[0xb].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb].field_1.Value = pGVar2[0xb].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb].field_1.Value = pGVar2[0xb].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb].field_1.Value = pGVar2[0xb].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb].field_1.Value = pGVar2[0xb].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb].field_1.Value = pGVar2[0xb].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb].field_1.Value = pGVar2[0xb].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb].field_1.Value = pGVar2[0xb].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb].field_1.Value = pGVar2[0xb].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb].field_1.Value = pGVar2[0xb].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb].field_1.Value = pGVar2[0xb].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb].field_1.Value = pGVar2[0xb].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb].field_1.Value = pGVar2[0xb].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb].field_1.Value = pGVar2[0xb].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x14].field_1.Value = pGVar2[0x14].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x14].field_1.Value = pGVar2[0x14].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x14].field_1.Value = pGVar2[0x14].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x14].field_1.Value = pGVar2[0x14].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x14].field_1.Value = pGVar2[0x14].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x14].field_1.Value = pGVar2[0x14].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x14].field_1.Value = pGVar2[0x14].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x14].field_1.Value = pGVar2[0x14].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x14].field_1.Value = pGVar2[0x14].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x14].field_1.Value = pGVar2[0x14].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x14].field_1.Value = pGVar2[0x14].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x14].field_1.Value = pGVar2[0x14].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x14].field_1.Value = pGVar2[0x14].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x14].field_1.Value = pGVar2[0x14].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x14].field_1.Value = pGVar2[0x14].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x14].field_1.Value = pGVar2[0x14].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x14].field_1.Value = pGVar2[0x14].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x14].field_1.Value = pGVar2[0x14].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x14].field_1.Value = pGVar2[0x14].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x14].field_1.Value = pGVar2[0x14].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x14].field_1.Value = pGVar2[0x14].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x14].field_1.Value = pGVar2[0x14].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x14].field_1.Value = pGVar2[0x14].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x14].field_1.Value = pGVar2[0x14].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc].field_1.Value = pGVar2[0xc].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc].field_1.Value = pGVar2[0xc].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc].field_1.Value = pGVar2[0xc].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc].field_1.Value = pGVar2[0xc].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc].field_1.Value = pGVar2[0xc].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc].field_1.Value = pGVar2[0xc].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc].field_1.Value = pGVar2[0xc].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc].field_1.Value = pGVar2[0xc].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc].field_1.Value = pGVar2[0xc].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc].field_1.Value = pGVar2[0xc].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc].field_1.Value = pGVar2[0xc].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc].field_1.Value = pGVar2[0xc].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc].field_1.Value = pGVar2[0xc].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc].field_1.Value = pGVar2[0xc].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc].field_1.Value = pGVar2[0xc].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc].field_1.Value = pGVar2[0xc].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc].field_1.Value = pGVar2[0xc].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc].field_1.Value = pGVar2[0xc].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc].field_1.Value = pGVar2[0xc].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc].field_1.Value = pGVar2[0xc].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc].field_1.Value = pGVar2[0xc].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc].field_1.Value = pGVar2[0xc].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc].field_1.Value = pGVar2[0xc].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc].field_1.Value = pGVar2[0xc].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd].field_1.Value = pGVar2[0xd].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd].field_1.Value = pGVar2[0xd].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd].field_1.Value = pGVar2[0xd].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd].field_1.Value = pGVar2[0xd].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd].field_1.Value = pGVar2[0xd].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd].field_1.Value = pGVar2[0xd].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd].field_1.Value = pGVar2[0xd].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd].field_1.Value = pGVar2[0xd].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd].field_1.Value = pGVar2[0xd].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd].field_1.Value = pGVar2[0xd].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd].field_1.Value = pGVar2[0xd].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd].field_1.Value = pGVar2[0xd].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd].field_1.Value = pGVar2[0xd].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd].field_1.Value = pGVar2[0xd].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd].field_1.Value = pGVar2[0xd].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd].field_1.Value = pGVar2[0xd].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd].field_1.Value = pGVar2[0xd].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd].field_1.Value = pGVar2[0xd].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd].field_1.Value = pGVar2[0xd].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd].field_1.Value = pGVar2[0xd].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd].field_1.Value = pGVar2[0xd].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd].field_1.Value = pGVar2[0xd].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd].field_1.Value = pGVar2[0xd].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd].field_1.Value = pGVar2[0xd].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe].field_1.Value = pGVar2[0xe].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe].field_1.Value = pGVar2[0xe].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe].field_1.Value = pGVar2[0xe].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe].field_1.Value = pGVar2[0xe].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe].field_1.Value = pGVar2[0xe].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe].field_1.Value = pGVar2[0xe].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe].field_1.Value = pGVar2[0xe].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe].field_1.Value = pGVar2[0xe].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe].field_1.Value = pGVar2[0xe].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe].field_1.Value = pGVar2[0xe].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe].field_1.Value = pGVar2[0xe].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe].field_1.Value = pGVar2[0xe].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe].field_1.Value = pGVar2[0xe].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe].field_1.Value = pGVar2[0xe].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe].field_1.Value = pGVar2[0xe].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe].field_1.Value = pGVar2[0xe].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe].field_1.Value = pGVar2[0xe].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe].field_1.Value = pGVar2[0xe].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe].field_1.Value = pGVar2[0xe].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe].field_1.Value = pGVar2[0xe].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe].field_1.Value = pGVar2[0xe].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe].field_1.Value = pGVar2[0xe].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe].field_1.Value = pGVar2[0xe].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe].field_1.Value = pGVar2[0xe].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xf].field_1.Value = pGVar2[0xf].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xf].field_1.Value = pGVar2[0xf].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xf].field_1.Value = pGVar2[0xf].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xf].field_1.Value = pGVar2[0xf].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xf].field_1.Value = pGVar2[0xf].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xf].field_1.Value = pGVar2[0xf].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xf].field_1.Value = pGVar2[0xf].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xf].field_1.Value = pGVar2[0xf].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xf].field_1.Value = pGVar2[0xf].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xf].field_1.Value = pGVar2[0xf].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xf].field_1.Value = pGVar2[0xf].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xf].field_1.Value = pGVar2[0xf].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xf].field_1.Value = pGVar2[0xf].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xf].field_1.Value = pGVar2[0xf].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xf].field_1.Value = pGVar2[0xf].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xf].field_1.Value = pGVar2[0xf].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xf].field_1.Value = pGVar2[0xf].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xf].field_1.Value = pGVar2[0xf].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xf].field_1.Value = pGVar2[0xf].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xf].field_1.Value = pGVar2[0xf].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xf].field_1.Value = pGVar2[0xf].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xf].field_1.Value = pGVar2[0xf].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xf].field_1.Value = pGVar2[0xf].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xf].field_1.Value = pGVar2[0xf].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x10].field_1.Value = pGVar2[0x10].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x10].field_1.Value = pGVar2[0x10].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x10].field_1.Value = pGVar2[0x10].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x10].field_1.Value = pGVar2[0x10].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x10].field_1.Value = pGVar2[0x10].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x10].field_1.Value = pGVar2[0x10].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x10].field_1.Value = pGVar2[0x10].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x10].field_1.Value = pGVar2[0x10].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x10].field_1.Value = pGVar2[0x10].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x10].field_1.Value = pGVar2[0x10].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x10].field_1.Value = pGVar2[0x10].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x10].field_1.Value = pGVar2[0x10].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x10].field_1.Value = pGVar2[0x10].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x10].field_1.Value = pGVar2[0x10].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x10].field_1.Value = pGVar2[0x10].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x10].field_1.Value = pGVar2[0x10].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x10].field_1.Value = pGVar2[0x10].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x10].field_1.Value = pGVar2[0x10].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x10].field_1.Value = pGVar2[0x10].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x10].field_1.Value = pGVar2[0x10].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x10].field_1.Value = pGVar2[0x10].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x10].field_1.Value = pGVar2[0x10].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x10].field_1.Value = pGVar2[0x10].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x10].field_1.Value = pGVar2[0x10].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11].field_1.Value = pGVar2[0x11].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11].field_1.Value = pGVar2[0x11].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11].field_1.Value = pGVar2[0x11].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11].field_1.Value = pGVar2[0x11].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11].field_1.Value = pGVar2[0x11].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11].field_1.Value = pGVar2[0x11].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11].field_1.Value = pGVar2[0x11].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11].field_1.Value = pGVar2[0x11].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11].field_1.Value = pGVar2[0x11].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11].field_1.Value = pGVar2[0x11].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11].field_1.Value = pGVar2[0x11].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11].field_1.Value = pGVar2[0x11].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11].field_1.Value = pGVar2[0x11].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11].field_1.Value = pGVar2[0x11].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11].field_1.Value = pGVar2[0x11].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11].field_1.Value = pGVar2[0x11].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11].field_1.Value = pGVar2[0x11].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11].field_1.Value = pGVar2[0x11].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11].field_1.Value = pGVar2[0x11].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11].field_1.Value = pGVar2[0x11].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11].field_1.Value = pGVar2[0x11].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11].field_1.Value = pGVar2[0x11].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11].field_1.Value = pGVar2[0x11].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11].field_1.Value = pGVar2[0x11].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x12].field_1.Value = pGVar2[0x12].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x12].field_1.Value = pGVar2[0x12].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x12].field_1.Value = pGVar2[0x12].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x12].field_1.Value = pGVar2[0x12].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x12].field_1.Value = pGVar2[0x12].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x12].field_1.Value = pGVar2[0x12].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x12].field_1.Value = pGVar2[0x12].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x12].field_1.Value = pGVar2[0x12].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x12].field_1.Value = pGVar2[0x12].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x12].field_1.Value = pGVar2[0x12].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x12].field_1.Value = pGVar2[0x12].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x12].field_1.Value = pGVar2[0x12].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x12].field_1.Value = pGVar2[0x12].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x12].field_1.Value = pGVar2[0x12].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x12].field_1.Value = pGVar2[0x12].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x12].field_1.Value = pGVar2[0x12].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x12].field_1.Value = pGVar2[0x12].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x12].field_1.Value = pGVar2[0x12].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x12].field_1.Value = pGVar2[0x12].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x12].field_1.Value = pGVar2[0x12].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x12].field_1.Value = pGVar2[0x12].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x12].field_1.Value = pGVar2[0x12].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x12].field_1.Value = pGVar2[0x12].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x12].field_1.Value = pGVar2[0x12].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x13].field_1.Value = pGVar2[0x13].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x13].field_1.Value = pGVar2[0x13].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x13].field_1.Value = pGVar2[0x13].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x13].field_1.Value = pGVar2[0x13].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x13].field_1.Value = pGVar2[0x13].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x13].field_1.Value = pGVar2[0x13].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x13].field_1.Value = pGVar2[0x13].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x13].field_1.Value = pGVar2[0x13].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x13].field_1.Value = pGVar2[0x13].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x13].field_1.Value = pGVar2[0x13].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x13].field_1.Value = pGVar2[0x13].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x13].field_1.Value = pGVar2[0x13].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x13].field_1.Value = pGVar2[0x13].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x13].field_1.Value = pGVar2[0x13].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x13].field_1.Value = pGVar2[0x13].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x13].field_1.Value = pGVar2[0x13].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x13].field_1.Value = pGVar2[0x13].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x13].field_1.Value = pGVar2[0x13].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x13].field_1.Value = pGVar2[0x13].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x13].field_1.Value = pGVar2[0x13].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x13].field_1.Value = pGVar2[0x13].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x13].field_1.Value = pGVar2[0x13].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x13].field_1.Value = pGVar2[0x13].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x13].field_1.Value = pGVar2[0x13].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x15].field_1.Value = pGVar2[0x15].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x15].field_1.Value = pGVar2[0x15].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x15].field_1.Value = pGVar2[0x15].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x15].field_1.Value = pGVar2[0x15].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x15].field_1.Value = pGVar2[0x15].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x15].field_1.Value = pGVar2[0x15].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x15].field_1.Value = pGVar2[0x15].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x15].field_1.Value = pGVar2[0x15].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x15].field_1.Value = pGVar2[0x15].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x15].field_1.Value = pGVar2[0x15].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x15].field_1.Value = pGVar2[0x15].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x15].field_1.Value = pGVar2[0x15].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x15].field_1.Value = pGVar2[0x15].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x15].field_1.Value = pGVar2[0x15].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x15].field_1.Value = pGVar2[0x15].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x15].field_1.Value = pGVar2[0x15].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x15].field_1.Value = pGVar2[0x15].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x15].field_1.Value = pGVar2[0x15].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x15].field_1.Value = pGVar2[0x15].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x15].field_1.Value = pGVar2[0x15].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x15].field_1.Value = pGVar2[0x15].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x15].field_1.Value = pGVar2[0x15].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x15].field_1.Value = pGVar2[0x15].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x15].field_1.Value = pGVar2[0x15].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x16].field_1.Value = pGVar2[0x16].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x16].field_1.Value = pGVar2[0x16].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x16].field_1.Value = pGVar2[0x16].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x16].field_1.Value = pGVar2[0x16].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x16].field_1.Value = pGVar2[0x16].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x16].field_1.Value = pGVar2[0x16].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x16].field_1.Value = pGVar2[0x16].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x16].field_1.Value = pGVar2[0x16].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x16].field_1.Value = pGVar2[0x16].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x16].field_1.Value = pGVar2[0x16].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x16].field_1.Value = pGVar2[0x16].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x16].field_1.Value = pGVar2[0x16].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x16].field_1.Value = pGVar2[0x16].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x16].field_1.Value = pGVar2[0x16].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x16].field_1.Value = pGVar2[0x16].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x16].field_1.Value = pGVar2[0x16].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x16].field_1.Value = pGVar2[0x16].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x16].field_1.Value = pGVar2[0x16].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x16].field_1.Value = pGVar2[0x16].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x16].field_1.Value = pGVar2[0x16].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x16].field_1.Value = pGVar2[0x16].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x16].field_1.Value = pGVar2[0x16].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x16].field_1.Value = pGVar2[0x16].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x16].field_1.Value = pGVar2[0x16].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    (pGVar2->field_1).Value = (pGVar2->field_1).Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    (pGVar2->field_1).Value = (pGVar2->field_1).Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    (pGVar2->field_1).Value = (pGVar2->field_1).Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    (pGVar2->field_1).Value = (pGVar2->field_1).Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    (pGVar2->field_1).Value = (pGVar2->field_1).Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    (pGVar2->field_1).Value = (pGVar2->field_1).Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    (pGVar2->field_1).Value = (pGVar2->field_1).Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    (pGVar2->field_1).Value = (pGVar2->field_1).Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    (pGVar2->field_1).Value = (pGVar2->field_1).Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    (pGVar2->field_1).Value = (pGVar2->field_1).Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    (pGVar2->field_1).Value = (pGVar2->field_1).Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    (pGVar2->field_1).Value = (pGVar2->field_1).Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    (pGVar2->field_1).Value = (pGVar2->field_1).Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    (pGVar2->field_1).Value = (pGVar2->field_1).Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    (pGVar2->field_1).Value = (pGVar2->field_1).Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    (pGVar2->field_1).Value = (pGVar2->field_1).Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    (pGVar2->field_1).Value = (pGVar2->field_1).Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    (pGVar2->field_1).Value = (pGVar2->field_1).Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    (pGVar2->field_1).Value = (pGVar2->field_1).Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    (pGVar2->field_1).Value = (pGVar2->field_1).Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    (pGVar2->field_1).Value = (pGVar2->field_1).Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    (pGVar2->field_1).Value = (pGVar2->field_1).Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    (pGVar2->field_1).Value = (pGVar2->field_1).Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    (pGVar2->field_1).Value = (pGVar2->field_1).Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x17].field_1.Value = pGVar2[0x17].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x17].field_1.Value = pGVar2[0x17].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x17].field_1.Value = pGVar2[0x17].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x17].field_1.Value = pGVar2[0x17].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x17].field_1.Value = pGVar2[0x17].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x17].field_1.Value = pGVar2[0x17].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x17].field_1.Value = pGVar2[0x17].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x17].field_1.Value = pGVar2[0x17].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x17].field_1.Value = pGVar2[0x17].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x17].field_1.Value = pGVar2[0x17].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x17].field_1.Value = pGVar2[0x17].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x17].field_1.Value = pGVar2[0x17].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x17].field_1.Value = pGVar2[0x17].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x17].field_1.Value = pGVar2[0x17].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x17].field_1.Value = pGVar2[0x17].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x17].field_1.Value = pGVar2[0x17].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x17].field_1.Value = pGVar2[0x17].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x17].field_1.Value = pGVar2[0x17].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x17].field_1.Value = pGVar2[0x17].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x17].field_1.Value = pGVar2[0x17].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x17].field_1.Value = pGVar2[0x17].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x17].field_1.Value = pGVar2[0x17].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x17].field_1.Value = pGVar2[0x17].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x17].field_1.Value = pGVar2[0x17].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x18].field_1.Value = pGVar2[0x18].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x18].field_1.Value = pGVar2[0x18].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x18].field_1.Value = pGVar2[0x18].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x18].field_1.Value = pGVar2[0x18].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x18].field_1.Value = pGVar2[0x18].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x18].field_1.Value = pGVar2[0x18].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x18].field_1.Value = pGVar2[0x18].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x18].field_1.Value = pGVar2[0x18].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x18].field_1.Value = pGVar2[0x18].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x18].field_1.Value = pGVar2[0x18].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x18].field_1.Value = pGVar2[0x18].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x18].field_1.Value = pGVar2[0x18].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x18].field_1.Value = pGVar2[0x18].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x18].field_1.Value = pGVar2[0x18].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x18].field_1.Value = pGVar2[0x18].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x18].field_1.Value = pGVar2[0x18].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x18].field_1.Value = pGVar2[0x18].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x18].field_1.Value = pGVar2[0x18].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x18].field_1.Value = pGVar2[0x18].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x18].field_1.Value = pGVar2[0x18].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x18].field_1.Value = pGVar2[0x18].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x18].field_1.Value = pGVar2[0x18].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x18].field_1.Value = pGVar2[0x18].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x18].field_1.Value = pGVar2[0x18].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x19].field_1.Value = pGVar2[0x19].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x19].field_1.Value = pGVar2[0x19].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x19].field_1.Value = pGVar2[0x19].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x19].field_1.Value = pGVar2[0x19].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x19].field_1.Value = pGVar2[0x19].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x19].field_1.Value = pGVar2[0x19].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x19].field_1.Value = pGVar2[0x19].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x19].field_1.Value = pGVar2[0x19].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x19].field_1.Value = pGVar2[0x19].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x19].field_1.Value = pGVar2[0x19].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x19].field_1.Value = pGVar2[0x19].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x19].field_1.Value = pGVar2[0x19].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x19].field_1.Value = pGVar2[0x19].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x19].field_1.Value = pGVar2[0x19].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x19].field_1.Value = pGVar2[0x19].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x19].field_1.Value = pGVar2[0x19].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x19].field_1.Value = pGVar2[0x19].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x19].field_1.Value = pGVar2[0x19].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x19].field_1.Value = pGVar2[0x19].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x19].field_1.Value = pGVar2[0x19].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x19].field_1.Value = pGVar2[0x19].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x19].field_1.Value = pGVar2[0x19].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x19].field_1.Value = pGVar2[0x19].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x19].field_1.Value = pGVar2[0x19].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1a].field_1.Value = pGVar2[0x1a].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1a].field_1.Value = pGVar2[0x1a].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1a].field_1.Value = pGVar2[0x1a].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1a].field_1.Value = pGVar2[0x1a].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1a].field_1.Value = pGVar2[0x1a].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1a].field_1.Value = pGVar2[0x1a].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1a].field_1.Value = pGVar2[0x1a].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1a].field_1.Value = pGVar2[0x1a].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1a].field_1.Value = pGVar2[0x1a].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1a].field_1.Value = pGVar2[0x1a].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1a].field_1.Value = pGVar2[0x1a].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1a].field_1.Value = pGVar2[0x1a].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1a].field_1.Value = pGVar2[0x1a].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1a].field_1.Value = pGVar2[0x1a].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1a].field_1.Value = pGVar2[0x1a].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1a].field_1.Value = pGVar2[0x1a].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1a].field_1.Value = pGVar2[0x1a].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1a].field_1.Value = pGVar2[0x1a].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1a].field_1.Value = pGVar2[0x1a].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1a].field_1.Value = pGVar2[0x1a].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1a].field_1.Value = pGVar2[0x1a].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1a].field_1.Value = pGVar2[0x1a].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1a].field_1.Value = pGVar2[0x1a].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1a].field_1.Value = pGVar2[0x1a].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1b].field_1.Value = pGVar2[0x1b].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1b].field_1.Value = pGVar2[0x1b].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1b].field_1.Value = pGVar2[0x1b].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1b].field_1.Value = pGVar2[0x1b].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1b].field_1.Value = pGVar2[0x1b].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1b].field_1.Value = pGVar2[0x1b].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1b].field_1.Value = pGVar2[0x1b].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1b].field_1.Value = pGVar2[0x1b].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1b].field_1.Value = pGVar2[0x1b].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1b].field_1.Value = pGVar2[0x1b].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1b].field_1.Value = pGVar2[0x1b].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1b].field_1.Value = pGVar2[0x1b].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1b].field_1.Value = pGVar2[0x1b].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1b].field_1.Value = pGVar2[0x1b].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1b].field_1.Value = pGVar2[0x1b].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1b].field_1.Value = pGVar2[0x1b].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1b].field_1.Value = pGVar2[0x1b].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1b].field_1.Value = pGVar2[0x1b].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1b].field_1.Value = pGVar2[0x1b].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1b].field_1.Value = pGVar2[0x1b].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1b].field_1.Value = pGVar2[0x1b].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1b].field_1.Value = pGVar2[0x1b].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1b].field_1.Value = pGVar2[0x1b].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1b].field_1.Value = pGVar2[0x1b].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1c].field_1.Value = pGVar2[0x1c].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1c].field_1.Value = pGVar2[0x1c].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1c].field_1.Value = pGVar2[0x1c].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1c].field_1.Value = pGVar2[0x1c].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1c].field_1.Value = pGVar2[0x1c].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1c].field_1.Value = pGVar2[0x1c].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1c].field_1.Value = pGVar2[0x1c].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1c].field_1.Value = pGVar2[0x1c].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1c].field_1.Value = pGVar2[0x1c].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1c].field_1.Value = pGVar2[0x1c].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1c].field_1.Value = pGVar2[0x1c].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1c].field_1.Value = pGVar2[0x1c].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1c].field_1.Value = pGVar2[0x1c].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1c].field_1.Value = pGVar2[0x1c].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1c].field_1.Value = pGVar2[0x1c].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1c].field_1.Value = pGVar2[0x1c].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1c].field_1.Value = pGVar2[0x1c].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1c].field_1.Value = pGVar2[0x1c].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1c].field_1.Value = pGVar2[0x1c].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1c].field_1.Value = pGVar2[0x1c].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1c].field_1.Value = pGVar2[0x1c].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1c].field_1.Value = pGVar2[0x1c].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1c].field_1.Value = pGVar2[0x1c].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1c].field_1.Value = pGVar2[0x1c].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1d].field_1.Value = pGVar2[0x1d].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1d].field_1.Value = pGVar2[0x1d].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1d].field_1.Value = pGVar2[0x1d].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1d].field_1.Value = pGVar2[0x1d].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1d].field_1.Value = pGVar2[0x1d].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1d].field_1.Value = pGVar2[0x1d].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1d].field_1.Value = pGVar2[0x1d].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1d].field_1.Value = pGVar2[0x1d].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1d].field_1.Value = pGVar2[0x1d].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1d].field_1.Value = pGVar2[0x1d].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1d].field_1.Value = pGVar2[0x1d].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1d].field_1.Value = pGVar2[0x1d].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1d].field_1.Value = pGVar2[0x1d].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1d].field_1.Value = pGVar2[0x1d].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1d].field_1.Value = pGVar2[0x1d].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1d].field_1.Value = pGVar2[0x1d].field_1.Value & 0xfffffffffdffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1d].field_1.Value = pGVar2[0x1d].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1d].field_1.Value = pGVar2[0x1d].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1d].field_1.Value = pGVar2[0x1d].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1d].field_1.Value = pGVar2[0x1d].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1d].field_1.Value = pGVar2[0x1d].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1d].field_1.Value = pGVar2[0x1d].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1d].field_1.Value = pGVar2[0x1d].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1d].field_1.Value = pGVar2[0x1d].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1e].field_1.Value = pGVar2[0x1e].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1e].field_1.Value = pGVar2[0x1e].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1e].field_1.Value = pGVar2[0x1e].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1e].field_1.Value = pGVar2[0x1e].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1e].field_1.Value = pGVar2[0x1e].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1e].field_1.Value = pGVar2[0x1e].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1e].field_1.Value = pGVar2[0x1e].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1e].field_1.Value = pGVar2[0x1e].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1e].field_1.Value = pGVar2[0x1e].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1e].field_1.Value = pGVar2[0x1e].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1e].field_1.Value = pGVar2[0x1e].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1e].field_1.Value = pGVar2[0x1e].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1e].field_1.Value = pGVar2[0x1e].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1e].field_1.Value = pGVar2[0x1e].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1e].field_1.Value = pGVar2[0x1e].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1e].field_1.Value = pGVar2[0x1e].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1e].field_1.Value = pGVar2[0x1e].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1e].field_1.Value = pGVar2[0x1e].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1e].field_1.Value = pGVar2[0x1e].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1e].field_1.Value = pGVar2[0x1e].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1e].field_1.Value = pGVar2[0x1e].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1e].field_1.Value = pGVar2[0x1e].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1e].field_1.Value = pGVar2[0x1e].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1e].field_1.Value = pGVar2[0x1e].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1f].field_1.Value = pGVar2[0x1f].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1f].field_1.Value = pGVar2[0x1f].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1f].field_1.Value = pGVar2[0x1f].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1f].field_1.Value = pGVar2[0x1f].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1f].field_1.Value = pGVar2[0x1f].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1f].field_1.Value = pGVar2[0x1f].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1f].field_1.Value = pGVar2[0x1f].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1f].field_1.Value = pGVar2[0x1f].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1f].field_1.Value = pGVar2[0x1f].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1f].field_1.Value = pGVar2[0x1f].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1f].field_1.Value = pGVar2[0x1f].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1f].field_1.Value = pGVar2[0x1f].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1f].field_1.Value = pGVar2[0x1f].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1f].field_1.Value = pGVar2[0x1f].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1f].field_1.Value = pGVar2[0x1f].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1f].field_1.Value = pGVar2[0x1f].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1f].field_1.Value = pGVar2[0x1f].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1f].field_1.Value = pGVar2[0x1f].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1f].field_1.Value = pGVar2[0x1f].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1f].field_1.Value = pGVar2[0x1f].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1f].field_1.Value = pGVar2[0x1f].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1f].field_1.Value = pGVar2[0x1f].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1f].field_1.Value = pGVar2[0x1f].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x1f].field_1.Value = pGVar2[0x1f].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x20].field_1.Value = pGVar2[0x20].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x20].field_1.Value = pGVar2[0x20].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x20].field_1.Value = pGVar2[0x20].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x20].field_1.Value = pGVar2[0x20].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x20].field_1.Value = pGVar2[0x20].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x20].field_1.Value = pGVar2[0x20].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x20].field_1.Value = pGVar2[0x20].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x20].field_1.Value = pGVar2[0x20].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x20].field_1.Value = pGVar2[0x20].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x20].field_1.Value = pGVar2[0x20].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x20].field_1.Value = pGVar2[0x20].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x20].field_1.Value = pGVar2[0x20].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x20].field_1.Value = pGVar2[0x20].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x20].field_1.Value = pGVar2[0x20].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x20].field_1.Value = pGVar2[0x20].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x20].field_1.Value = pGVar2[0x20].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x20].field_1.Value = pGVar2[0x20].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x20].field_1.Value = pGVar2[0x20].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x20].field_1.Value = pGVar2[0x20].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x20].field_1.Value = pGVar2[0x20].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x20].field_1.Value = pGVar2[0x20].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x20].field_1.Value = pGVar2[0x20].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x20].field_1.Value = pGVar2[0x20].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x20].field_1.Value = pGVar2[0x20].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x22].field_1.Value = pGVar2[0x22].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x22].field_1.Value = pGVar2[0x22].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x22].field_1.Value = pGVar2[0x22].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x22].field_1.Value = pGVar2[0x22].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x22].field_1.Value = pGVar2[0x22].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x22].field_1.Value = pGVar2[0x22].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x22].field_1.Value = pGVar2[0x22].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x22].field_1.Value = pGVar2[0x22].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x22].field_1.Value = pGVar2[0x22].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x22].field_1.Value = pGVar2[0x22].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x22].field_1.Value = pGVar2[0x22].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x22].field_1.Value = pGVar2[0x22].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x22].field_1.Value = pGVar2[0x22].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x22].field_1.Value = pGVar2[0x22].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x22].field_1.Value = pGVar2[0x22].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x22].field_1.Value = pGVar2[0x22].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x22].field_1.Value = pGVar2[0x22].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x22].field_1.Value = pGVar2[0x22].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x22].field_1.Value = pGVar2[0x22].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x22].field_1.Value = pGVar2[0x22].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x22].field_1.Value = pGVar2[0x22].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x22].field_1.Value = pGVar2[0x22].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x22].field_1.Value = pGVar2[0x22].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x22].field_1.Value = pGVar2[0x22].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x23].field_1.Value = pGVar2[0x23].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x23].field_1.Value = pGVar2[0x23].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x23].field_1.Value = pGVar2[0x23].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x23].field_1.Value = pGVar2[0x23].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x23].field_1.Value = pGVar2[0x23].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x23].field_1.Value = pGVar2[0x23].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x23].field_1.Value = pGVar2[0x23].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x23].field_1.Value = pGVar2[0x23].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x23].field_1.Value = pGVar2[0x23].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x23].field_1.Value = pGVar2[0x23].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x23].field_1.Value = pGVar2[0x23].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x23].field_1.Value = pGVar2[0x23].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x23].field_1.Value = pGVar2[0x23].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x23].field_1.Value = pGVar2[0x23].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x23].field_1.Value = pGVar2[0x23].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x23].field_1.Value = pGVar2[0x23].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x23].field_1.Value = pGVar2[0x23].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x23].field_1.Value = pGVar2[0x23].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x23].field_1.Value = pGVar2[0x23].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x23].field_1.Value = pGVar2[0x23].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x23].field_1.Value = pGVar2[0x23].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x23].field_1.Value = pGVar2[0x23].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x23].field_1.Value = pGVar2[0x23].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x23].field_1.Value = pGVar2[0x23].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x24].field_1.Value = pGVar2[0x24].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x24].field_1.Value = pGVar2[0x24].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x24].field_1.Value = pGVar2[0x24].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x24].field_1.Value = pGVar2[0x24].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x24].field_1.Value = pGVar2[0x24].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x24].field_1.Value = pGVar2[0x24].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x24].field_1.Value = pGVar2[0x24].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x24].field_1.Value = pGVar2[0x24].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x24].field_1.Value = pGVar2[0x24].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x24].field_1.Value = pGVar2[0x24].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x24].field_1.Value = pGVar2[0x24].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x24].field_1.Value = pGVar2[0x24].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x24].field_1.Value = pGVar2[0x24].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x24].field_1.Value = pGVar2[0x24].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x24].field_1.Value = pGVar2[0x24].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x24].field_1.Value = pGVar2[0x24].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x24].field_1.Value = pGVar2[0x24].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x24].field_1.Value = pGVar2[0x24].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x24].field_1.Value = pGVar2[0x24].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x24].field_1.Value = pGVar2[0x24].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x24].field_1.Value = pGVar2[0x24].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x24].field_1.Value = pGVar2[0x24].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x24].field_1.Value = pGVar2[0x24].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x24].field_1.Value = pGVar2[0x24].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x25].field_1.Value = pGVar2[0x25].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x25].field_1.Value = pGVar2[0x25].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x25].field_1.Value = pGVar2[0x25].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x25].field_1.Value = pGVar2[0x25].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x25].field_1.Value = pGVar2[0x25].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x25].field_1.Value = pGVar2[0x25].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x25].field_1.Value = pGVar2[0x25].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x25].field_1.Value = pGVar2[0x25].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x25].field_1.Value = pGVar2[0x25].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x25].field_1.Value = pGVar2[0x25].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x25].field_1.Value = pGVar2[0x25].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x25].field_1.Value = pGVar2[0x25].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x25].field_1.Value = pGVar2[0x25].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x25].field_1.Value = pGVar2[0x25].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x25].field_1.Value = pGVar2[0x25].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x25].field_1.Value = pGVar2[0x25].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x25].field_1.Value = pGVar2[0x25].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x25].field_1.Value = pGVar2[0x25].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x25].field_1.Value = pGVar2[0x25].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x25].field_1.Value = pGVar2[0x25].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x25].field_1.Value = pGVar2[0x25].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x25].field_1.Value = pGVar2[0x25].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x25].field_1.Value = pGVar2[0x25].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x25].field_1.Value = pGVar2[0x25].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x26].field_1.Value = pGVar2[0x26].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x26].field_1.Value = pGVar2[0x26].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x26].field_1.Value = pGVar2[0x26].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x26].field_1.Value = pGVar2[0x26].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x26].field_1.Value = pGVar2[0x26].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x26].field_1.Value = pGVar2[0x26].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x26].field_1.Value = pGVar2[0x26].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x26].field_1.Value = pGVar2[0x26].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x26].field_1.Value = pGVar2[0x26].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x26].field_1.Value = pGVar2[0x26].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x26].field_1.Value = pGVar2[0x26].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x26].field_1.Value = pGVar2[0x26].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x26].field_1.Value = pGVar2[0x26].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x26].field_1.Value = pGVar2[0x26].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x26].field_1.Value = pGVar2[0x26].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x26].field_1.Value = pGVar2[0x26].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x26].field_1.Value = pGVar2[0x26].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x26].field_1.Value = pGVar2[0x26].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x26].field_1.Value = pGVar2[0x26].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x26].field_1.Value = pGVar2[0x26].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x26].field_1.Value = pGVar2[0x26].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x26].field_1.Value = pGVar2[0x26].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x26].field_1.Value = pGVar2[0x26].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x26].field_1.Value = pGVar2[0x26].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x27].field_1.Value = pGVar2[0x27].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x27].field_1.Value = pGVar2[0x27].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x27].field_1.Value = pGVar2[0x27].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x27].field_1.Value = pGVar2[0x27].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x27].field_1.Value = pGVar2[0x27].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x27].field_1.Value = pGVar2[0x27].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x27].field_1.Value = pGVar2[0x27].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x27].field_1.Value = pGVar2[0x27].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x27].field_1.Value = pGVar2[0x27].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x27].field_1.Value = pGVar2[0x27].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x27].field_1.Value = pGVar2[0x27].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x27].field_1.Value = pGVar2[0x27].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x27].field_1.Value = pGVar2[0x27].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x27].field_1.Value = pGVar2[0x27].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x27].field_1.Value = pGVar2[0x27].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x27].field_1.Value = pGVar2[0x27].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x27].field_1.Value = pGVar2[0x27].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x27].field_1.Value = pGVar2[0x27].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x27].field_1.Value = pGVar2[0x27].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x27].field_1.Value = pGVar2[0x27].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x27].field_1.Value = pGVar2[0x27].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x27].field_1.Value = pGVar2[0x27].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x27].field_1.Value = pGVar2[0x27].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x27].field_1.Value = pGVar2[0x27].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x28].field_1.Value = pGVar2[0x28].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x28].field_1.Value = pGVar2[0x28].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x28].field_1.Value = pGVar2[0x28].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x28].field_1.Value = pGVar2[0x28].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x28].field_1.Value = pGVar2[0x28].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x28].field_1.Value = pGVar2[0x28].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x28].field_1.Value = pGVar2[0x28].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x28].field_1.Value = pGVar2[0x28].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x28].field_1.Value = pGVar2[0x28].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x28].field_1.Value = pGVar2[0x28].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x28].field_1.Value = pGVar2[0x28].field_1.Value & 0xffffffffffff3fff;
    pGStack_18 = this;
    pWVar4 = Context::GetWaTable((this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.
                                 super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                                 super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pGmmLibContext)
    ;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x28].field_1.Value =
         pGVar2[0x28].field_1.Value & 0xfffffffffffbffff |
         (ulong)((*(ulong *)&pWVar4->field_0x4 >> 0x34 & 1) == 0) << 0x12;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x28].field_1.Value = pGVar2[0x28].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x28].field_1.Value = pGVar2[0x28].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x28].field_1.Value = pGVar2[0x28].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x28].field_1.Value = pGVar2[0x28].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x28].field_1.Value = pGVar2[0x28].field_1.Value & 0xffffffffe3ffffff | 0x8000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x28].field_1.Value = pGVar2[0x28].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x28].field_1.Value = pGVar2[0x28].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x28].field_1.Value = pGVar2[0x28].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x28].field_1.Value = pGVar2[0x28].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x28].field_1.Value = pGVar2[0x28].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x28].field_1.Value = pGVar2[0x28].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x28].field_1.Value = pGVar2[0x28].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x29].field_1.Value = pGVar2[0x29].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x29].field_1.Value = pGVar2[0x29].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x29].field_1.Value = pGVar2[0x29].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x29].field_1.Value = pGVar2[0x29].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x29].field_1.Value = pGVar2[0x29].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x29].field_1.Value = pGVar2[0x29].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x29].field_1.Value = pGVar2[0x29].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x29].field_1.Value = pGVar2[0x29].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x29].field_1.Value = pGVar2[0x29].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x29].field_1.Value = pGVar2[0x29].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x29].field_1.Value = pGVar2[0x29].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x29].field_1.Value = pGVar2[0x29].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x29].field_1.Value = pGVar2[0x29].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x29].field_1.Value = pGVar2[0x29].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x29].field_1.Value = pGVar2[0x29].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x29].field_1.Value = pGVar2[0x29].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x29].field_1.Value = pGVar2[0x29].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x29].field_1.Value = pGVar2[0x29].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x29].field_1.Value = pGVar2[0x29].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x29].field_1.Value = pGVar2[0x29].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x29].field_1.Value = pGVar2[0x29].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x29].field_1.Value = pGVar2[0x29].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x29].field_1.Value = pGVar2[0x29].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x29].field_1.Value = pGVar2[0x29].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2a].field_1.Value = pGVar2[0x2a].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2a].field_1.Value = pGVar2[0x2a].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2a].field_1.Value = pGVar2[0x2a].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2a].field_1.Value = pGVar2[0x2a].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2a].field_1.Value = pGVar2[0x2a].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2a].field_1.Value = pGVar2[0x2a].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2a].field_1.Value = pGVar2[0x2a].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2a].field_1.Value = pGVar2[0x2a].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2a].field_1.Value = pGVar2[0x2a].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2a].field_1.Value = pGVar2[0x2a].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2a].field_1.Value = pGVar2[0x2a].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2a].field_1.Value = pGVar2[0x2a].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2a].field_1.Value = pGVar2[0x2a].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2a].field_1.Value = pGVar2[0x2a].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2a].field_1.Value = pGVar2[0x2a].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2a].field_1.Value = pGVar2[0x2a].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2a].field_1.Value = pGVar2[0x2a].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2a].field_1.Value = pGVar2[0x2a].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2a].field_1.Value = pGVar2[0x2a].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2a].field_1.Value = pGVar2[0x2a].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2a].field_1.Value = pGVar2[0x2a].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2a].field_1.Value = pGVar2[0x2a].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2a].field_1.Value = pGVar2[0x2a].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2a].field_1.Value = pGVar2[0x2a].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2b].field_1.Value = pGVar2[0x2b].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2b].field_1.Value = pGVar2[0x2b].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2b].field_1.Value = pGVar2[0x2b].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2b].field_1.Value = pGVar2[0x2b].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2b].field_1.Value = pGVar2[0x2b].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2b].field_1.Value = pGVar2[0x2b].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2b].field_1.Value = pGVar2[0x2b].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2b].field_1.Value = pGVar2[0x2b].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2b].field_1.Value = pGVar2[0x2b].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2b].field_1.Value = pGVar2[0x2b].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2b].field_1.Value = pGVar2[0x2b].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2b].field_1.Value = pGVar2[0x2b].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2b].field_1.Value = pGVar2[0x2b].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2b].field_1.Value = pGVar2[0x2b].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2b].field_1.Value = pGVar2[0x2b].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2b].field_1.Value = pGVar2[0x2b].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2b].field_1.Value = pGVar2[0x2b].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2b].field_1.Value = pGVar2[0x2b].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2b].field_1.Value = pGVar2[0x2b].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2b].field_1.Value = pGVar2[0x2b].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2b].field_1.Value = pGVar2[0x2b].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2b].field_1.Value = pGVar2[0x2b].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2b].field_1.Value = pGVar2[0x2b].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2b].field_1.Value = pGVar2[0x2b].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2c].field_1.Value = pGVar2[0x2c].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2c].field_1.Value = pGVar2[0x2c].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2c].field_1.Value = pGVar2[0x2c].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2c].field_1.Value = pGVar2[0x2c].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2c].field_1.Value = pGVar2[0x2c].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2c].field_1.Value = pGVar2[0x2c].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2c].field_1.Value = pGVar2[0x2c].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2c].field_1.Value = pGVar2[0x2c].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2c].field_1.Value = pGVar2[0x2c].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2c].field_1.Value = pGVar2[0x2c].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2c].field_1.Value = pGVar2[0x2c].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2c].field_1.Value = pGVar2[0x2c].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2c].field_1.Value = pGVar2[0x2c].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2c].field_1.Value = pGVar2[0x2c].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2c].field_1.Value = pGVar2[0x2c].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2c].field_1.Value = pGVar2[0x2c].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2c].field_1.Value = pGVar2[0x2c].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2c].field_1.Value = pGVar2[0x2c].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2c].field_1.Value = pGVar2[0x2c].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2c].field_1.Value = pGVar2[0x2c].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2c].field_1.Value = pGVar2[0x2c].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2c].field_1.Value = pGVar2[0x2c].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2c].field_1.Value = pGVar2[0x2c].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2c].field_1.Value = pGVar2[0x2c].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2d].field_1.Value = pGVar2[0x2d].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2d].field_1.Value = pGVar2[0x2d].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2d].field_1.Value = pGVar2[0x2d].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2d].field_1.Value = pGVar2[0x2d].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2d].field_1.Value = pGVar2[0x2d].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2d].field_1.Value = pGVar2[0x2d].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2d].field_1.Value = pGVar2[0x2d].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2d].field_1.Value = pGVar2[0x2d].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2d].field_1.Value = pGVar2[0x2d].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2d].field_1.Value = pGVar2[0x2d].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2d].field_1.Value = pGVar2[0x2d].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2d].field_1.Value = pGVar2[0x2d].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2d].field_1.Value = pGVar2[0x2d].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2d].field_1.Value = pGVar2[0x2d].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2d].field_1.Value = pGVar2[0x2d].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2d].field_1.Value = pGVar2[0x2d].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2d].field_1.Value = pGVar2[0x2d].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2d].field_1.Value = pGVar2[0x2d].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2d].field_1.Value = pGVar2[0x2d].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2d].field_1.Value = pGVar2[0x2d].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2d].field_1.Value = pGVar2[0x2d].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2d].field_1.Value = pGVar2[0x2d].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2d].field_1.Value = pGVar2[0x2d].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2d].field_1.Value = pGVar2[0x2d].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2e].field_1.Value = pGVar2[0x2e].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2e].field_1.Value = pGVar2[0x2e].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2e].field_1.Value = pGVar2[0x2e].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2e].field_1.Value = pGVar2[0x2e].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2e].field_1.Value = pGVar2[0x2e].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2e].field_1.Value = pGVar2[0x2e].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2e].field_1.Value = pGVar2[0x2e].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2e].field_1.Value = pGVar2[0x2e].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2e].field_1.Value = pGVar2[0x2e].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2e].field_1.Value = pGVar2[0x2e].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2e].field_1.Value = pGVar2[0x2e].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2e].field_1.Value = pGVar2[0x2e].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2e].field_1.Value = pGVar2[0x2e].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2e].field_1.Value = pGVar2[0x2e].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2e].field_1.Value = pGVar2[0x2e].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2e].field_1.Value = pGVar2[0x2e].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2e].field_1.Value = pGVar2[0x2e].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2e].field_1.Value = pGVar2[0x2e].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2e].field_1.Value = pGVar2[0x2e].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2e].field_1.Value = pGVar2[0x2e].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2e].field_1.Value = pGVar2[0x2e].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2e].field_1.Value = pGVar2[0x2e].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2e].field_1.Value = pGVar2[0x2e].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2e].field_1.Value = pGVar2[0x2e].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2f].field_1.Value = pGVar2[0x2f].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2f].field_1.Value = pGVar2[0x2f].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2f].field_1.Value = pGVar2[0x2f].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2f].field_1.Value = pGVar2[0x2f].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2f].field_1.Value = pGVar2[0x2f].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2f].field_1.Value = pGVar2[0x2f].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2f].field_1.Value = pGVar2[0x2f].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2f].field_1.Value = pGVar2[0x2f].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2f].field_1.Value = pGVar2[0x2f].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2f].field_1.Value = pGVar2[0x2f].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2f].field_1.Value = pGVar2[0x2f].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2f].field_1.Value = pGVar2[0x2f].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2f].field_1.Value = pGVar2[0x2f].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2f].field_1.Value = pGVar2[0x2f].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2f].field_1.Value = pGVar2[0x2f].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2f].field_1.Value = pGVar2[0x2f].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2f].field_1.Value = pGVar2[0x2f].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2f].field_1.Value = pGVar2[0x2f].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2f].field_1.Value = pGVar2[0x2f].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2f].field_1.Value = pGVar2[0x2f].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2f].field_1.Value = pGVar2[0x2f].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2f].field_1.Value = pGVar2[0x2f].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2f].field_1.Value = pGVar2[0x2f].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x2f].field_1.Value = pGVar2[0x2f].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x30].field_1.Value = pGVar2[0x30].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x30].field_1.Value = pGVar2[0x30].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x30].field_1.Value = pGVar2[0x30].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x30].field_1.Value = pGVar2[0x30].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x30].field_1.Value = pGVar2[0x30].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x30].field_1.Value = pGVar2[0x30].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x30].field_1.Value = pGVar2[0x30].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x30].field_1.Value = pGVar2[0x30].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x30].field_1.Value = pGVar2[0x30].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x30].field_1.Value = pGVar2[0x30].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x30].field_1.Value = pGVar2[0x30].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x30].field_1.Value = pGVar2[0x30].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x30].field_1.Value = pGVar2[0x30].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x30].field_1.Value = pGVar2[0x30].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x30].field_1.Value = pGVar2[0x30].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x30].field_1.Value = pGVar2[0x30].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x30].field_1.Value = pGVar2[0x30].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x30].field_1.Value = pGVar2[0x30].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x30].field_1.Value = pGVar2[0x30].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x30].field_1.Value = pGVar2[0x30].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x30].field_1.Value = pGVar2[0x30].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x30].field_1.Value = pGVar2[0x30].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x30].field_1.Value = pGVar2[0x30].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x30].field_1.Value = pGVar2[0x30].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x31].field_1.Value = pGVar2[0x31].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x31].field_1.Value = pGVar2[0x31].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x31].field_1.Value = pGVar2[0x31].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x31].field_1.Value = pGVar2[0x31].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x31].field_1.Value = pGVar2[0x31].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x31].field_1.Value = pGVar2[0x31].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x31].field_1.Value = pGVar2[0x31].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x31].field_1.Value = pGVar2[0x31].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x31].field_1.Value = pGVar2[0x31].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x31].field_1.Value = pGVar2[0x31].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x31].field_1.Value = pGVar2[0x31].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x31].field_1.Value = pGVar2[0x31].field_1.Value & 0xfffffffffffbffff | 0x40000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x31].field_1.Value = pGVar2[0x31].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x31].field_1.Value = pGVar2[0x31].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x31].field_1.Value = pGVar2[0x31].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x31].field_1.Value = pGVar2[0x31].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x31].field_1.Value = pGVar2[0x31].field_1.Value & 0xffffffffe3ffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x31].field_1.Value = pGVar2[0x31].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x31].field_1.Value = pGVar2[0x31].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x31].field_1.Value = pGVar2[0x31].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x31].field_1.Value = pGVar2[0x31].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x31].field_1.Value = pGVar2[0x31].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x31].field_1.Value = pGVar2[0x31].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x31].field_1.Value = pGVar2[0x31].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x32].field_1.Value = pGVar2[0x32].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x32].field_1.Value = pGVar2[0x32].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x32].field_1.Value = pGVar2[0x32].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x32].field_1.Value = pGVar2[0x32].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x32].field_1.Value = pGVar2[0x32].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x32].field_1.Value = pGVar2[0x32].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x32].field_1.Value = pGVar2[0x32].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x32].field_1.Value = pGVar2[0x32].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x32].field_1.Value = pGVar2[0x32].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x32].field_1.Value = pGVar2[0x32].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x32].field_1.Value = pGVar2[0x32].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x32].field_1.Value = pGVar2[0x32].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x32].field_1.Value = pGVar2[0x32].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x32].field_1.Value = pGVar2[0x32].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x32].field_1.Value = pGVar2[0x32].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x32].field_1.Value = pGVar2[0x32].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x32].field_1.Value = pGVar2[0x32].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x32].field_1.Value = pGVar2[0x32].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x32].field_1.Value = pGVar2[0x32].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x32].field_1.Value = pGVar2[0x32].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x32].field_1.Value = pGVar2[0x32].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x32].field_1.Value = pGVar2[0x32].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x32].field_1.Value = pGVar2[0x32].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x32].field_1.Value = pGVar2[0x32].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x33].field_1.Value = pGVar2[0x33].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x33].field_1.Value = pGVar2[0x33].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x33].field_1.Value = pGVar2[0x33].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x33].field_1.Value = pGVar2[0x33].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x33].field_1.Value = pGVar2[0x33].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x33].field_1.Value = pGVar2[0x33].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x33].field_1.Value = pGVar2[0x33].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x33].field_1.Value = pGVar2[0x33].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x33].field_1.Value = pGVar2[0x33].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x33].field_1.Value = pGVar2[0x33].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x33].field_1.Value = pGVar2[0x33].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x33].field_1.Value = pGVar2[0x33].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x33].field_1.Value = pGVar2[0x33].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x33].field_1.Value = pGVar2[0x33].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x33].field_1.Value = pGVar2[0x33].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x33].field_1.Value = pGVar2[0x33].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x33].field_1.Value = pGVar2[0x33].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x33].field_1.Value = pGVar2[0x33].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x33].field_1.Value = pGVar2[0x33].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x33].field_1.Value = pGVar2[0x33].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x33].field_1.Value = pGVar2[0x33].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x33].field_1.Value = pGVar2[0x33].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x33].field_1.Value = pGVar2[0x33].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x33].field_1.Value = pGVar2[0x33].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x34].field_1.Value = pGVar2[0x34].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x34].field_1.Value = pGVar2[0x34].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x34].field_1.Value = pGVar2[0x34].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x34].field_1.Value = pGVar2[0x34].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x34].field_1.Value = pGVar2[0x34].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x34].field_1.Value = pGVar2[0x34].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x34].field_1.Value = pGVar2[0x34].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x34].field_1.Value = pGVar2[0x34].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x34].field_1.Value = pGVar2[0x34].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x34].field_1.Value = pGVar2[0x34].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x34].field_1.Value = pGVar2[0x34].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x34].field_1.Value = pGVar2[0x34].field_1.Value & 0xfffffffffffbffff | 0x40000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x34].field_1.Value = pGVar2[0x34].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x34].field_1.Value = pGVar2[0x34].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x34].field_1.Value = pGVar2[0x34].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x34].field_1.Value = pGVar2[0x34].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x34].field_1.Value = pGVar2[0x34].field_1.Value & 0xffffffffe3ffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x34].field_1.Value = pGVar2[0x34].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x34].field_1.Value = pGVar2[0x34].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x34].field_1.Value = pGVar2[0x34].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x34].field_1.Value = pGVar2[0x34].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x34].field_1.Value = pGVar2[0x34].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x34].field_1.Value = pGVar2[0x34].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x34].field_1.Value = pGVar2[0x34].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x35].field_1.Value = pGVar2[0x35].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x35].field_1.Value = pGVar2[0x35].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x35].field_1.Value = pGVar2[0x35].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x35].field_1.Value = pGVar2[0x35].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x35].field_1.Value = pGVar2[0x35].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x35].field_1.Value = pGVar2[0x35].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x35].field_1.Value = pGVar2[0x35].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x35].field_1.Value = pGVar2[0x35].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x35].field_1.Value = pGVar2[0x35].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x35].field_1.Value = pGVar2[0x35].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x35].field_1.Value = pGVar2[0x35].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x35].field_1.Value = pGVar2[0x35].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x35].field_1.Value = pGVar2[0x35].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x35].field_1.Value = pGVar2[0x35].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x35].field_1.Value = pGVar2[0x35].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x35].field_1.Value = pGVar2[0x35].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x35].field_1.Value = pGVar2[0x35].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x35].field_1.Value = pGVar2[0x35].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x35].field_1.Value = pGVar2[0x35].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x35].field_1.Value = pGVar2[0x35].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x35].field_1.Value = pGVar2[0x35].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x35].field_1.Value = pGVar2[0x35].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x35].field_1.Value = pGVar2[0x35].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x35].field_1.Value = pGVar2[0x35].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x36].field_1.Value = pGVar2[0x36].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x36].field_1.Value = pGVar2[0x36].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x36].field_1.Value = pGVar2[0x36].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x36].field_1.Value = pGVar2[0x36].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x36].field_1.Value = pGVar2[0x36].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x36].field_1.Value = pGVar2[0x36].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x36].field_1.Value = pGVar2[0x36].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x36].field_1.Value = pGVar2[0x36].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x36].field_1.Value = pGVar2[0x36].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x36].field_1.Value = pGVar2[0x36].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x36].field_1.Value = pGVar2[0x36].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x36].field_1.Value = pGVar2[0x36].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x36].field_1.Value = pGVar2[0x36].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x36].field_1.Value = pGVar2[0x36].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x36].field_1.Value = pGVar2[0x36].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x36].field_1.Value = pGVar2[0x36].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x36].field_1.Value = pGVar2[0x36].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x36].field_1.Value = pGVar2[0x36].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x36].field_1.Value = pGVar2[0x36].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x36].field_1.Value = pGVar2[0x36].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x36].field_1.Value = pGVar2[0x36].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x36].field_1.Value = pGVar2[0x36].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x36].field_1.Value = pGVar2[0x36].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x36].field_1.Value = pGVar2[0x36].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x37].field_1.Value = pGVar2[0x37].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x37].field_1.Value = pGVar2[0x37].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x37].field_1.Value = pGVar2[0x37].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x37].field_1.Value = pGVar2[0x37].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x37].field_1.Value = pGVar2[0x37].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x37].field_1.Value = pGVar2[0x37].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x37].field_1.Value = pGVar2[0x37].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x37].field_1.Value = pGVar2[0x37].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x37].field_1.Value = pGVar2[0x37].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x37].field_1.Value = pGVar2[0x37].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x37].field_1.Value = pGVar2[0x37].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x37].field_1.Value = pGVar2[0x37].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x37].field_1.Value = pGVar2[0x37].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x37].field_1.Value = pGVar2[0x37].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x37].field_1.Value = pGVar2[0x37].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x37].field_1.Value = pGVar2[0x37].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x37].field_1.Value = pGVar2[0x37].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x37].field_1.Value = pGVar2[0x37].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x37].field_1.Value = pGVar2[0x37].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x37].field_1.Value = pGVar2[0x37].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x37].field_1.Value = pGVar2[0x37].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x37].field_1.Value = pGVar2[0x37].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x37].field_1.Value = pGVar2[0x37].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x37].field_1.Value = pGVar2[0x37].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x38].field_1.Value = pGVar2[0x38].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x38].field_1.Value = pGVar2[0x38].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x38].field_1.Value = pGVar2[0x38].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x38].field_1.Value = pGVar2[0x38].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x38].field_1.Value = pGVar2[0x38].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x38].field_1.Value = pGVar2[0x38].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x38].field_1.Value = pGVar2[0x38].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x38].field_1.Value = pGVar2[0x38].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x38].field_1.Value = pGVar2[0x38].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x38].field_1.Value = pGVar2[0x38].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x38].field_1.Value = pGVar2[0x38].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x38].field_1.Value = pGVar2[0x38].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x38].field_1.Value = pGVar2[0x38].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x38].field_1.Value = pGVar2[0x38].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x38].field_1.Value = pGVar2[0x38].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x38].field_1.Value = pGVar2[0x38].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x38].field_1.Value = pGVar2[0x38].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x38].field_1.Value = pGVar2[0x38].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x38].field_1.Value = pGVar2[0x38].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x38].field_1.Value = pGVar2[0x38].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x38].field_1.Value = pGVar2[0x38].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x38].field_1.Value = pGVar2[0x38].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x38].field_1.Value = pGVar2[0x38].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x38].field_1.Value = pGVar2[0x38].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3d].field_1.Value = pGVar2[0x3d].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3d].field_1.Value = pGVar2[0x3d].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3d].field_1.Value = pGVar2[0x3d].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3d].field_1.Value = pGVar2[0x3d].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3d].field_1.Value = pGVar2[0x3d].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3d].field_1.Value = pGVar2[0x3d].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3d].field_1.Value = pGVar2[0x3d].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3d].field_1.Value = pGVar2[0x3d].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3d].field_1.Value = pGVar2[0x3d].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3d].field_1.Value = pGVar2[0x3d].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3d].field_1.Value = pGVar2[0x3d].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3d].field_1.Value = pGVar2[0x3d].field_1.Value & 0xfffffffffffbffff | 0x40000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3d].field_1.Value = pGVar2[0x3d].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3d].field_1.Value = pGVar2[0x3d].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3d].field_1.Value = pGVar2[0x3d].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3d].field_1.Value = pGVar2[0x3d].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3d].field_1.Value = pGVar2[0x3d].field_1.Value & 0xffffffffe3ffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3d].field_1.Value = pGVar2[0x3d].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3d].field_1.Value = pGVar2[0x3d].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3d].field_1.Value = pGVar2[0x3d].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3d].field_1.Value = pGVar2[0x3d].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3d].field_1.Value = pGVar2[0x3d].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3d].field_1.Value = pGVar2[0x3d].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3d].field_1.Value = pGVar2[0x3d].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x39].field_1.Value = pGVar2[0x39].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x39].field_1.Value = pGVar2[0x39].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x39].field_1.Value = pGVar2[0x39].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x39].field_1.Value = pGVar2[0x39].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x39].field_1.Value = pGVar2[0x39].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x39].field_1.Value = pGVar2[0x39].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x39].field_1.Value = pGVar2[0x39].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x39].field_1.Value = pGVar2[0x39].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x39].field_1.Value = pGVar2[0x39].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x39].field_1.Value = pGVar2[0x39].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x39].field_1.Value = pGVar2[0x39].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x39].field_1.Value = pGVar2[0x39].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x39].field_1.Value = pGVar2[0x39].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x39].field_1.Value = pGVar2[0x39].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x39].field_1.Value = pGVar2[0x39].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x39].field_1.Value = pGVar2[0x39].field_1.Value & 0xfffffffffdffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x39].field_1.Value = pGVar2[0x39].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x39].field_1.Value = pGVar2[0x39].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x39].field_1.Value = pGVar2[0x39].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x39].field_1.Value = pGVar2[0x39].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x39].field_1.Value = pGVar2[0x39].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x39].field_1.Value = pGVar2[0x39].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x39].field_1.Value = pGVar2[0x39].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x39].field_1.Value = pGVar2[0x39].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3a].field_1.Value = pGVar2[0x3a].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3a].field_1.Value = pGVar2[0x3a].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3a].field_1.Value = pGVar2[0x3a].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3a].field_1.Value = pGVar2[0x3a].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3a].field_1.Value = pGVar2[0x3a].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3a].field_1.Value = pGVar2[0x3a].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3a].field_1.Value = pGVar2[0x3a].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3a].field_1.Value = pGVar2[0x3a].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3a].field_1.Value = pGVar2[0x3a].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3a].field_1.Value = pGVar2[0x3a].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3a].field_1.Value = pGVar2[0x3a].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3a].field_1.Value = pGVar2[0x3a].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3a].field_1.Value = pGVar2[0x3a].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3a].field_1.Value = pGVar2[0x3a].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3a].field_1.Value = pGVar2[0x3a].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3a].field_1.Value = pGVar2[0x3a].field_1.Value & 0xfffffffffdffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3a].field_1.Value = pGVar2[0x3a].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3a].field_1.Value = pGVar2[0x3a].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3a].field_1.Value = pGVar2[0x3a].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3a].field_1.Value = pGVar2[0x3a].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3a].field_1.Value = pGVar2[0x3a].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3a].field_1.Value = pGVar2[0x3a].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3a].field_1.Value = pGVar2[0x3a].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3a].field_1.Value = pGVar2[0x3a].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3b].field_1.Value = pGVar2[0x3b].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3b].field_1.Value = pGVar2[0x3b].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3b].field_1.Value = pGVar2[0x3b].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3b].field_1.Value = pGVar2[0x3b].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3b].field_1.Value = pGVar2[0x3b].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3b].field_1.Value = pGVar2[0x3b].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3b].field_1.Value = pGVar2[0x3b].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3b].field_1.Value = pGVar2[0x3b].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3b].field_1.Value = pGVar2[0x3b].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3b].field_1.Value = pGVar2[0x3b].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3b].field_1.Value = pGVar2[0x3b].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3b].field_1.Value = pGVar2[0x3b].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3b].field_1.Value = pGVar2[0x3b].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3b].field_1.Value = pGVar2[0x3b].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3b].field_1.Value = pGVar2[0x3b].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3b].field_1.Value = pGVar2[0x3b].field_1.Value & 0xfffffffffdffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3b].field_1.Value = pGVar2[0x3b].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3b].field_1.Value = pGVar2[0x3b].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3b].field_1.Value = pGVar2[0x3b].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3b].field_1.Value = pGVar2[0x3b].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3b].field_1.Value = pGVar2[0x3b].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3b].field_1.Value = pGVar2[0x3b].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3b].field_1.Value = pGVar2[0x3b].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3b].field_1.Value = pGVar2[0x3b].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3e].field_1.Value = pGVar2[0x3e].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3e].field_1.Value = pGVar2[0x3e].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3e].field_1.Value = pGVar2[0x3e].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3e].field_1.Value = pGVar2[0x3e].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3e].field_1.Value = pGVar2[0x3e].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3e].field_1.Value = pGVar2[0x3e].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3e].field_1.Value = pGVar2[0x3e].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3e].field_1.Value = pGVar2[0x3e].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3e].field_1.Value = pGVar2[0x3e].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3e].field_1.Value = pGVar2[0x3e].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3e].field_1.Value = pGVar2[0x3e].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3e].field_1.Value = pGVar2[0x3e].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3e].field_1.Value = pGVar2[0x3e].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3e].field_1.Value = pGVar2[0x3e].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3e].field_1.Value = pGVar2[0x3e].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3e].field_1.Value = pGVar2[0x3e].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3e].field_1.Value = pGVar2[0x3e].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3e].field_1.Value = pGVar2[0x3e].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3e].field_1.Value = pGVar2[0x3e].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3e].field_1.Value = pGVar2[0x3e].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3e].field_1.Value = pGVar2[0x3e].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3e].field_1.Value = pGVar2[0x3e].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3e].field_1.Value = pGVar2[0x3e].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3e].field_1.Value = pGVar2[0x3e].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x41].field_1.Value = pGVar2[0x41].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x41].field_1.Value = pGVar2[0x41].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x41].field_1.Value = pGVar2[0x41].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x41].field_1.Value = pGVar2[0x41].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x41].field_1.Value = pGVar2[0x41].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x41].field_1.Value = pGVar2[0x41].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x41].field_1.Value = pGVar2[0x41].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x41].field_1.Value = pGVar2[0x41].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x41].field_1.Value = pGVar2[0x41].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x41].field_1.Value = pGVar2[0x41].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x41].field_1.Value = pGVar2[0x41].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x41].field_1.Value = pGVar2[0x41].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x41].field_1.Value = pGVar2[0x41].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x41].field_1.Value = pGVar2[0x41].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x41].field_1.Value = pGVar2[0x41].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x41].field_1.Value = pGVar2[0x41].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x41].field_1.Value = pGVar2[0x41].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x41].field_1.Value = pGVar2[0x41].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x41].field_1.Value = pGVar2[0x41].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x41].field_1.Value = pGVar2[0x41].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x41].field_1.Value = pGVar2[0x41].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x41].field_1.Value = pGVar2[0x41].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x41].field_1.Value = pGVar2[0x41].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x41].field_1.Value = pGVar2[0x41].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x42].field_1.Value = pGVar2[0x42].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x42].field_1.Value = pGVar2[0x42].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x42].field_1.Value = pGVar2[0x42].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x42].field_1.Value = pGVar2[0x42].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x42].field_1.Value = pGVar2[0x42].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x42].field_1.Value = pGVar2[0x42].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x42].field_1.Value = pGVar2[0x42].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x42].field_1.Value = pGVar2[0x42].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x42].field_1.Value = pGVar2[0x42].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x42].field_1.Value = pGVar2[0x42].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x42].field_1.Value = pGVar2[0x42].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x42].field_1.Value = pGVar2[0x42].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x42].field_1.Value = pGVar2[0x42].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x42].field_1.Value = pGVar2[0x42].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x42].field_1.Value = pGVar2[0x42].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x42].field_1.Value = pGVar2[0x42].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x42].field_1.Value = pGVar2[0x42].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x42].field_1.Value = pGVar2[0x42].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x42].field_1.Value = pGVar2[0x42].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x42].field_1.Value = pGVar2[0x42].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x42].field_1.Value = pGVar2[0x42].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x42].field_1.Value = pGVar2[0x42].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x42].field_1.Value = pGVar2[0x42].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x42].field_1.Value = pGVar2[0x42].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x43].field_1.Value = pGVar2[0x43].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x43].field_1.Value = pGVar2[0x43].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x43].field_1.Value = pGVar2[0x43].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x43].field_1.Value = pGVar2[0x43].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x43].field_1.Value = pGVar2[0x43].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x43].field_1.Value = pGVar2[0x43].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x43].field_1.Value = pGVar2[0x43].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x43].field_1.Value = pGVar2[0x43].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x43].field_1.Value = pGVar2[0x43].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x43].field_1.Value = pGVar2[0x43].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x43].field_1.Value = pGVar2[0x43].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x43].field_1.Value = pGVar2[0x43].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x43].field_1.Value = pGVar2[0x43].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x43].field_1.Value = pGVar2[0x43].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x43].field_1.Value = pGVar2[0x43].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x43].field_1.Value = pGVar2[0x43].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x43].field_1.Value = pGVar2[0x43].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x43].field_1.Value = pGVar2[0x43].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x43].field_1.Value = pGVar2[0x43].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x43].field_1.Value = pGVar2[0x43].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x43].field_1.Value = pGVar2[0x43].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x43].field_1.Value = pGVar2[0x43].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x43].field_1.Value = pGVar2[0x43].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x43].field_1.Value = pGVar2[0x43].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x40].field_1.Value = pGVar2[0x40].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x40].field_1.Value = pGVar2[0x40].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x40].field_1.Value = pGVar2[0x40].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x40].field_1.Value = pGVar2[0x40].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x40].field_1.Value = pGVar2[0x40].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x40].field_1.Value = pGVar2[0x40].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x40].field_1.Value = pGVar2[0x40].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x40].field_1.Value = pGVar2[0x40].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x40].field_1.Value = pGVar2[0x40].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x40].field_1.Value = pGVar2[0x40].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x40].field_1.Value = pGVar2[0x40].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x40].field_1.Value = pGVar2[0x40].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x40].field_1.Value = pGVar2[0x40].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x40].field_1.Value = pGVar2[0x40].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x40].field_1.Value = pGVar2[0x40].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x40].field_1.Value = pGVar2[0x40].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x40].field_1.Value = pGVar2[0x40].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x40].field_1.Value = pGVar2[0x40].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x40].field_1.Value = pGVar2[0x40].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x40].field_1.Value = pGVar2[0x40].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x40].field_1.Value = pGVar2[0x40].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x40].field_1.Value = pGVar2[0x40].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x40].field_1.Value = pGVar2[0x40].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x40].field_1.Value = pGVar2[0x40].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x44].field_1.Value = pGVar2[0x44].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x44].field_1.Value = pGVar2[0x44].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x44].field_1.Value = pGVar2[0x44].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x44].field_1.Value = pGVar2[0x44].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x44].field_1.Value = pGVar2[0x44].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x44].field_1.Value = pGVar2[0x44].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x44].field_1.Value = pGVar2[0x44].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x44].field_1.Value = pGVar2[0x44].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x44].field_1.Value = pGVar2[0x44].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x44].field_1.Value = pGVar2[0x44].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x44].field_1.Value = pGVar2[0x44].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x44].field_1.Value = pGVar2[0x44].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x44].field_1.Value = pGVar2[0x44].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x44].field_1.Value = pGVar2[0x44].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x44].field_1.Value = pGVar2[0x44].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x44].field_1.Value = pGVar2[0x44].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x44].field_1.Value = pGVar2[0x44].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x44].field_1.Value = pGVar2[0x44].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x44].field_1.Value = pGVar2[0x44].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x44].field_1.Value = pGVar2[0x44].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x44].field_1.Value = pGVar2[0x44].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x44].field_1.Value = pGVar2[0x44].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x44].field_1.Value = pGVar2[0x44].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x44].field_1.Value = pGVar2[0x44].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x45].field_1.Value = pGVar2[0x45].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x45].field_1.Value = pGVar2[0x45].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x45].field_1.Value = pGVar2[0x45].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x45].field_1.Value = pGVar2[0x45].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x45].field_1.Value = pGVar2[0x45].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x45].field_1.Value = pGVar2[0x45].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x45].field_1.Value = pGVar2[0x45].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x45].field_1.Value = pGVar2[0x45].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x45].field_1.Value = pGVar2[0x45].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x45].field_1.Value = pGVar2[0x45].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x45].field_1.Value = pGVar2[0x45].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x45].field_1.Value = pGVar2[0x45].field_1.Value & 0xfffffffffffbffff | 0x40000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x45].field_1.Value = pGVar2[0x45].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x45].field_1.Value = pGVar2[0x45].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x45].field_1.Value = pGVar2[0x45].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x45].field_1.Value = pGVar2[0x45].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x45].field_1.Value = pGVar2[0x45].field_1.Value & 0xffffffffe3ffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x45].field_1.Value = pGVar2[0x45].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x45].field_1.Value = pGVar2[0x45].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x45].field_1.Value = pGVar2[0x45].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x45].field_1.Value = pGVar2[0x45].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x45].field_1.Value = pGVar2[0x45].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x45].field_1.Value = pGVar2[0x45].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x45].field_1.Value = pGVar2[0x45].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x46].field_1.Value = pGVar2[0x46].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x46].field_1.Value = pGVar2[0x46].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x46].field_1.Value = pGVar2[0x46].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x46].field_1.Value = pGVar2[0x46].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x46].field_1.Value = pGVar2[0x46].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x46].field_1.Value = pGVar2[0x46].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x46].field_1.Value = pGVar2[0x46].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x46].field_1.Value = pGVar2[0x46].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x46].field_1.Value = pGVar2[0x46].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x46].field_1.Value = pGVar2[0x46].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x46].field_1.Value = pGVar2[0x46].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x46].field_1.Value = pGVar2[0x46].field_1.Value & 0xfffffffffffbffff | 0x40000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x46].field_1.Value = pGVar2[0x46].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x46].field_1.Value = pGVar2[0x46].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x46].field_1.Value = pGVar2[0x46].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x46].field_1.Value = pGVar2[0x46].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x46].field_1.Value = pGVar2[0x46].field_1.Value & 0xffffffffe3ffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x46].field_1.Value = pGVar2[0x46].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x46].field_1.Value = pGVar2[0x46].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x46].field_1.Value = pGVar2[0x46].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x46].field_1.Value = pGVar2[0x46].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x46].field_1.Value = pGVar2[0x46].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x46].field_1.Value = pGVar2[0x46].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x46].field_1.Value = pGVar2[0x46].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x47].field_1.Value = pGVar2[0x47].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x47].field_1.Value = pGVar2[0x47].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x47].field_1.Value = pGVar2[0x47].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x47].field_1.Value = pGVar2[0x47].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x47].field_1.Value = pGVar2[0x47].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x47].field_1.Value = pGVar2[0x47].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x47].field_1.Value = pGVar2[0x47].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x47].field_1.Value = pGVar2[0x47].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x47].field_1.Value = pGVar2[0x47].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x47].field_1.Value = pGVar2[0x47].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x47].field_1.Value = pGVar2[0x47].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x47].field_1.Value = pGVar2[0x47].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x47].field_1.Value = pGVar2[0x47].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x47].field_1.Value = pGVar2[0x47].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x47].field_1.Value = pGVar2[0x47].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x47].field_1.Value = pGVar2[0x47].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x47].field_1.Value = pGVar2[0x47].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x47].field_1.Value = pGVar2[0x47].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x47].field_1.Value = pGVar2[0x47].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x47].field_1.Value = pGVar2[0x47].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x47].field_1.Value = pGVar2[0x47].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x47].field_1.Value = pGVar2[0x47].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x47].field_1.Value = pGVar2[0x47].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x47].field_1.Value = pGVar2[0x47].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4d].field_1.Value = pGVar2[0x4d].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4d].field_1.Value = pGVar2[0x4d].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4d].field_1.Value = pGVar2[0x4d].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4d].field_1.Value = pGVar2[0x4d].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4d].field_1.Value = pGVar2[0x4d].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4d].field_1.Value = pGVar2[0x4d].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4d].field_1.Value = pGVar2[0x4d].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4d].field_1.Value = pGVar2[0x4d].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4d].field_1.Value = pGVar2[0x4d].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4d].field_1.Value = pGVar2[0x4d].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4d].field_1.Value = pGVar2[0x4d].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4d].field_1.Value = pGVar2[0x4d].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4d].field_1.Value = pGVar2[0x4d].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4d].field_1.Value = pGVar2[0x4d].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4d].field_1.Value = pGVar2[0x4d].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4d].field_1.Value = pGVar2[0x4d].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4d].field_1.Value = pGVar2[0x4d].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4d].field_1.Value = pGVar2[0x4d].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4d].field_1.Value = pGVar2[0x4d].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4d].field_1.Value = pGVar2[0x4d].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4d].field_1.Value = pGVar2[0x4d].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4d].field_1.Value = pGVar2[0x4d].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4d].field_1.Value = pGVar2[0x4d].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4d].field_1.Value = pGVar2[0x4d].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x48].field_1.Value = pGVar2[0x48].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x48].field_1.Value = pGVar2[0x48].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x48].field_1.Value = pGVar2[0x48].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x48].field_1.Value = pGVar2[0x48].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x48].field_1.Value = pGVar2[0x48].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x48].field_1.Value = pGVar2[0x48].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x48].field_1.Value = pGVar2[0x48].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x48].field_1.Value = pGVar2[0x48].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x48].field_1.Value = pGVar2[0x48].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x48].field_1.Value = pGVar2[0x48].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x48].field_1.Value = pGVar2[0x48].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x48].field_1.Value = pGVar2[0x48].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x48].field_1.Value = pGVar2[0x48].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x48].field_1.Value = pGVar2[0x48].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x48].field_1.Value = pGVar2[0x48].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x48].field_1.Value = pGVar2[0x48].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x48].field_1.Value = pGVar2[0x48].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x48].field_1.Value = pGVar2[0x48].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x48].field_1.Value = pGVar2[0x48].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x48].field_1.Value = pGVar2[0x48].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x48].field_1.Value = pGVar2[0x48].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x48].field_1.Value = pGVar2[0x48].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x48].field_1.Value = pGVar2[0x48].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x48].field_1.Value = pGVar2[0x48].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x49].field_1.Value = pGVar2[0x49].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x49].field_1.Value = pGVar2[0x49].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x49].field_1.Value = pGVar2[0x49].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x49].field_1.Value = pGVar2[0x49].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x49].field_1.Value = pGVar2[0x49].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x49].field_1.Value = pGVar2[0x49].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x49].field_1.Value = pGVar2[0x49].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x49].field_1.Value = pGVar2[0x49].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x49].field_1.Value = pGVar2[0x49].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x49].field_1.Value = pGVar2[0x49].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x49].field_1.Value = pGVar2[0x49].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x49].field_1.Value = pGVar2[0x49].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x49].field_1.Value = pGVar2[0x49].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x49].field_1.Value = pGVar2[0x49].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x49].field_1.Value = pGVar2[0x49].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x49].field_1.Value = pGVar2[0x49].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x49].field_1.Value = pGVar2[0x49].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x49].field_1.Value = pGVar2[0x49].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x49].field_1.Value = pGVar2[0x49].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x49].field_1.Value = pGVar2[0x49].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x49].field_1.Value = pGVar2[0x49].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x49].field_1.Value = pGVar2[0x49].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x49].field_1.Value = pGVar2[0x49].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x49].field_1.Value = pGVar2[0x49].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4a].field_1.Value = pGVar2[0x4a].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4a].field_1.Value = pGVar2[0x4a].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4a].field_1.Value = pGVar2[0x4a].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4a].field_1.Value = pGVar2[0x4a].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4a].field_1.Value = pGVar2[0x4a].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4a].field_1.Value = pGVar2[0x4a].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4a].field_1.Value = pGVar2[0x4a].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4a].field_1.Value = pGVar2[0x4a].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4a].field_1.Value = pGVar2[0x4a].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4a].field_1.Value = pGVar2[0x4a].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4a].field_1.Value = pGVar2[0x4a].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4a].field_1.Value = pGVar2[0x4a].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4a].field_1.Value = pGVar2[0x4a].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4a].field_1.Value = pGVar2[0x4a].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4a].field_1.Value = pGVar2[0x4a].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4a].field_1.Value = pGVar2[0x4a].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4a].field_1.Value = pGVar2[0x4a].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4a].field_1.Value = pGVar2[0x4a].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4a].field_1.Value = pGVar2[0x4a].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4a].field_1.Value = pGVar2[0x4a].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4a].field_1.Value = pGVar2[0x4a].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4a].field_1.Value = pGVar2[0x4a].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4a].field_1.Value = pGVar2[0x4a].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4a].field_1.Value = pGVar2[0x4a].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4b].field_1.Value = pGVar2[0x4b].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4b].field_1.Value = pGVar2[0x4b].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4b].field_1.Value = pGVar2[0x4b].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4b].field_1.Value = pGVar2[0x4b].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4b].field_1.Value = pGVar2[0x4b].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4b].field_1.Value = pGVar2[0x4b].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4b].field_1.Value = pGVar2[0x4b].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4b].field_1.Value = pGVar2[0x4b].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4b].field_1.Value = pGVar2[0x4b].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4b].field_1.Value = pGVar2[0x4b].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4b].field_1.Value = pGVar2[0x4b].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4b].field_1.Value = pGVar2[0x4b].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4b].field_1.Value = pGVar2[0x4b].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4b].field_1.Value = pGVar2[0x4b].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4b].field_1.Value = pGVar2[0x4b].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4b].field_1.Value = pGVar2[0x4b].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4b].field_1.Value = pGVar2[0x4b].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4b].field_1.Value = pGVar2[0x4b].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4b].field_1.Value = pGVar2[0x4b].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4b].field_1.Value = pGVar2[0x4b].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4b].field_1.Value = pGVar2[0x4b].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4b].field_1.Value = pGVar2[0x4b].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4b].field_1.Value = pGVar2[0x4b].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4b].field_1.Value = pGVar2[0x4b].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4c].field_1.Value = pGVar2[0x4c].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4c].field_1.Value = pGVar2[0x4c].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4c].field_1.Value = pGVar2[0x4c].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4c].field_1.Value = pGVar2[0x4c].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4c].field_1.Value = pGVar2[0x4c].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4c].field_1.Value = pGVar2[0x4c].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4c].field_1.Value = pGVar2[0x4c].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4c].field_1.Value = pGVar2[0x4c].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4c].field_1.Value = pGVar2[0x4c].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4c].field_1.Value = pGVar2[0x4c].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4c].field_1.Value = pGVar2[0x4c].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4c].field_1.Value = pGVar2[0x4c].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4c].field_1.Value = pGVar2[0x4c].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4c].field_1.Value = pGVar2[0x4c].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4c].field_1.Value = pGVar2[0x4c].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4c].field_1.Value = pGVar2[0x4c].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4c].field_1.Value = pGVar2[0x4c].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4c].field_1.Value = pGVar2[0x4c].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4c].field_1.Value = pGVar2[0x4c].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4c].field_1.Value = pGVar2[0x4c].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4c].field_1.Value = pGVar2[0x4c].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4c].field_1.Value = pGVar2[0x4c].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4c].field_1.Value = pGVar2[0x4c].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4c].field_1.Value = pGVar2[0x4c].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4e].field_1.Value = pGVar2[0x4e].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4e].field_1.Value = pGVar2[0x4e].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4e].field_1.Value = pGVar2[0x4e].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4e].field_1.Value = pGVar2[0x4e].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4e].field_1.Value = pGVar2[0x4e].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4e].field_1.Value = pGVar2[0x4e].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4e].field_1.Value = pGVar2[0x4e].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4e].field_1.Value = pGVar2[0x4e].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4e].field_1.Value = pGVar2[0x4e].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4e].field_1.Value = pGVar2[0x4e].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4e].field_1.Value = pGVar2[0x4e].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4e].field_1.Value = pGVar2[0x4e].field_1.Value & 0xfffffffffffbffff | 0x40000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4e].field_1.Value = pGVar2[0x4e].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4e].field_1.Value = pGVar2[0x4e].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4e].field_1.Value = pGVar2[0x4e].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4e].field_1.Value = pGVar2[0x4e].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4e].field_1.Value = pGVar2[0x4e].field_1.Value & 0xffffffffe3ffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4e].field_1.Value = pGVar2[0x4e].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4e].field_1.Value = pGVar2[0x4e].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4e].field_1.Value = pGVar2[0x4e].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4e].field_1.Value = pGVar2[0x4e].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4e].field_1.Value = pGVar2[0x4e].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4e].field_1.Value = pGVar2[0x4e].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x4e].field_1.Value = pGVar2[0x4e].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x50].field_1.Value = pGVar2[0x50].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x50].field_1.Value = pGVar2[0x50].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x50].field_1.Value = pGVar2[0x50].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x50].field_1.Value = pGVar2[0x50].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x50].field_1.Value = pGVar2[0x50].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x50].field_1.Value = pGVar2[0x50].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x50].field_1.Value = pGVar2[0x50].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x50].field_1.Value = pGVar2[0x50].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x50].field_1.Value = pGVar2[0x50].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x50].field_1.Value = pGVar2[0x50].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x50].field_1.Value = pGVar2[0x50].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x50].field_1.Value = pGVar2[0x50].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x50].field_1.Value = pGVar2[0x50].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x50].field_1.Value = pGVar2[0x50].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x50].field_1.Value = pGVar2[0x50].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x50].field_1.Value = pGVar2[0x50].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x50].field_1.Value = pGVar2[0x50].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x50].field_1.Value = pGVar2[0x50].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x50].field_1.Value = pGVar2[0x50].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x50].field_1.Value = pGVar2[0x50].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x50].field_1.Value = pGVar2[0x50].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x50].field_1.Value = pGVar2[0x50].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x50].field_1.Value = pGVar2[0x50].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x50].field_1.Value = pGVar2[0x50].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x51].field_1.Value = pGVar2[0x51].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x51].field_1.Value = pGVar2[0x51].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x51].field_1.Value = pGVar2[0x51].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x51].field_1.Value = pGVar2[0x51].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x51].field_1.Value = pGVar2[0x51].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x51].field_1.Value = pGVar2[0x51].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x51].field_1.Value = pGVar2[0x51].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x51].field_1.Value = pGVar2[0x51].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x51].field_1.Value = pGVar2[0x51].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x51].field_1.Value = pGVar2[0x51].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x51].field_1.Value = pGVar2[0x51].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x51].field_1.Value = pGVar2[0x51].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x51].field_1.Value = pGVar2[0x51].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x51].field_1.Value = pGVar2[0x51].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x51].field_1.Value = pGVar2[0x51].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x51].field_1.Value = pGVar2[0x51].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x51].field_1.Value = pGVar2[0x51].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x51].field_1.Value = pGVar2[0x51].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x51].field_1.Value = pGVar2[0x51].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x51].field_1.Value = pGVar2[0x51].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x51].field_1.Value = pGVar2[0x51].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x51].field_1.Value = pGVar2[0x51].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x51].field_1.Value = pGVar2[0x51].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x51].field_1.Value = pGVar2[0x51].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x52].field_1.Value = pGVar2[0x52].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x52].field_1.Value = pGVar2[0x52].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x52].field_1.Value = pGVar2[0x52].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x52].field_1.Value = pGVar2[0x52].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x52].field_1.Value = pGVar2[0x52].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x52].field_1.Value = pGVar2[0x52].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x52].field_1.Value = pGVar2[0x52].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x52].field_1.Value = pGVar2[0x52].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x52].field_1.Value = pGVar2[0x52].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x52].field_1.Value = pGVar2[0x52].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x52].field_1.Value = pGVar2[0x52].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x52].field_1.Value = pGVar2[0x52].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x52].field_1.Value = pGVar2[0x52].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x52].field_1.Value = pGVar2[0x52].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x52].field_1.Value = pGVar2[0x52].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x52].field_1.Value = pGVar2[0x52].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x52].field_1.Value = pGVar2[0x52].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x52].field_1.Value = pGVar2[0x52].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x52].field_1.Value = pGVar2[0x52].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x52].field_1.Value = pGVar2[0x52].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x52].field_1.Value = pGVar2[0x52].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x52].field_1.Value = pGVar2[0x52].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x52].field_1.Value = pGVar2[0x52].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x52].field_1.Value = pGVar2[0x52].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x53].field_1.Value = pGVar2[0x53].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x53].field_1.Value = pGVar2[0x53].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x53].field_1.Value = pGVar2[0x53].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x53].field_1.Value = pGVar2[0x53].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x53].field_1.Value = pGVar2[0x53].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x53].field_1.Value = pGVar2[0x53].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x53].field_1.Value = pGVar2[0x53].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x53].field_1.Value = pGVar2[0x53].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x53].field_1.Value = pGVar2[0x53].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x53].field_1.Value = pGVar2[0x53].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x53].field_1.Value = pGVar2[0x53].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x53].field_1.Value = pGVar2[0x53].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x53].field_1.Value = pGVar2[0x53].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x53].field_1.Value = pGVar2[0x53].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x53].field_1.Value = pGVar2[0x53].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x53].field_1.Value = pGVar2[0x53].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x53].field_1.Value = pGVar2[0x53].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x53].field_1.Value = pGVar2[0x53].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x53].field_1.Value = pGVar2[0x53].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x53].field_1.Value = pGVar2[0x53].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x53].field_1.Value = pGVar2[0x53].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x53].field_1.Value = pGVar2[0x53].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x53].field_1.Value = pGVar2[0x53].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x53].field_1.Value = pGVar2[0x53].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x54].field_1.Value = pGVar2[0x54].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x54].field_1.Value = pGVar2[0x54].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x54].field_1.Value = pGVar2[0x54].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x54].field_1.Value = pGVar2[0x54].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x54].field_1.Value = pGVar2[0x54].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x54].field_1.Value = pGVar2[0x54].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x54].field_1.Value = pGVar2[0x54].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x54].field_1.Value = pGVar2[0x54].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x54].field_1.Value = pGVar2[0x54].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x54].field_1.Value = pGVar2[0x54].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x54].field_1.Value = pGVar2[0x54].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x54].field_1.Value = pGVar2[0x54].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x54].field_1.Value = pGVar2[0x54].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x54].field_1.Value = pGVar2[0x54].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x54].field_1.Value = pGVar2[0x54].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x54].field_1.Value = pGVar2[0x54].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x54].field_1.Value = pGVar2[0x54].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x54].field_1.Value = pGVar2[0x54].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x54].field_1.Value = pGVar2[0x54].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x54].field_1.Value = pGVar2[0x54].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x54].field_1.Value = pGVar2[0x54].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x54].field_1.Value = pGVar2[0x54].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x54].field_1.Value = pGVar2[0x54].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x54].field_1.Value = pGVar2[0x54].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5d].field_1.Value = pGVar2[0x5d].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5d].field_1.Value = pGVar2[0x5d].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5d].field_1.Value = pGVar2[0x5d].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5d].field_1.Value = pGVar2[0x5d].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5d].field_1.Value = pGVar2[0x5d].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5d].field_1.Value = pGVar2[0x5d].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5d].field_1.Value = pGVar2[0x5d].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5d].field_1.Value = pGVar2[0x5d].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5d].field_1.Value = pGVar2[0x5d].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5d].field_1.Value = pGVar2[0x5d].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5d].field_1.Value = pGVar2[0x5d].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5d].field_1.Value = pGVar2[0x5d].field_1.Value & 0xfffffffffffbffff | 0x40000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5d].field_1.Value = pGVar2[0x5d].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5d].field_1.Value = pGVar2[0x5d].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5d].field_1.Value = pGVar2[0x5d].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5d].field_1.Value = pGVar2[0x5d].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5d].field_1.Value = pGVar2[0x5d].field_1.Value & 0xffffffffe3ffffff | 0x8000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5d].field_1.Value = pGVar2[0x5d].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5d].field_1.Value = pGVar2[0x5d].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5d].field_1.Value = pGVar2[0x5d].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5d].field_1.Value = pGVar2[0x5d].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5d].field_1.Value = pGVar2[0x5d].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5d].field_1.Value = pGVar2[0x5d].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5d].field_1.Value = pGVar2[0x5d].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x55].field_1.Value = pGVar2[0x55].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x55].field_1.Value = pGVar2[0x55].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x55].field_1.Value = pGVar2[0x55].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x55].field_1.Value = pGVar2[0x55].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x55].field_1.Value = pGVar2[0x55].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x55].field_1.Value = pGVar2[0x55].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x55].field_1.Value = pGVar2[0x55].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x55].field_1.Value = pGVar2[0x55].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x55].field_1.Value = pGVar2[0x55].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x55].field_1.Value = pGVar2[0x55].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x55].field_1.Value = pGVar2[0x55].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x55].field_1.Value = pGVar2[0x55].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x55].field_1.Value = pGVar2[0x55].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x55].field_1.Value = pGVar2[0x55].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x55].field_1.Value = pGVar2[0x55].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x55].field_1.Value = pGVar2[0x55].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x55].field_1.Value = pGVar2[0x55].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x55].field_1.Value = pGVar2[0x55].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x55].field_1.Value = pGVar2[0x55].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x55].field_1.Value = pGVar2[0x55].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x55].field_1.Value = pGVar2[0x55].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x55].field_1.Value = pGVar2[0x55].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x55].field_1.Value = pGVar2[0x55].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x55].field_1.Value = pGVar2[0x55].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x56].field_1.Value = pGVar2[0x56].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x56].field_1.Value = pGVar2[0x56].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x56].field_1.Value = pGVar2[0x56].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x56].field_1.Value = pGVar2[0x56].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x56].field_1.Value = pGVar2[0x56].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x56].field_1.Value = pGVar2[0x56].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x56].field_1.Value = pGVar2[0x56].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x56].field_1.Value = pGVar2[0x56].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x56].field_1.Value = pGVar2[0x56].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x56].field_1.Value = pGVar2[0x56].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x56].field_1.Value = pGVar2[0x56].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x56].field_1.Value = pGVar2[0x56].field_1.Value & 0xfffffffffffbffff | 0x40000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x56].field_1.Value = pGVar2[0x56].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x56].field_1.Value = pGVar2[0x56].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x56].field_1.Value = pGVar2[0x56].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x56].field_1.Value = pGVar2[0x56].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x56].field_1.Value = pGVar2[0x56].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x56].field_1.Value = pGVar2[0x56].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x56].field_1.Value = pGVar2[0x56].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x56].field_1.Value = pGVar2[0x56].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x56].field_1.Value = pGVar2[0x56].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x56].field_1.Value = pGVar2[0x56].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x56].field_1.Value = pGVar2[0x56].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x56].field_1.Value = pGVar2[0x56].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5c].field_1.Value = pGVar2[0x5c].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5c].field_1.Value = pGVar2[0x5c].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5c].field_1.Value = pGVar2[0x5c].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5c].field_1.Value = pGVar2[0x5c].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5c].field_1.Value = pGVar2[0x5c].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5c].field_1.Value = pGVar2[0x5c].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5c].field_1.Value = pGVar2[0x5c].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5c].field_1.Value = pGVar2[0x5c].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5c].field_1.Value = pGVar2[0x5c].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5c].field_1.Value = pGVar2[0x5c].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5c].field_1.Value = pGVar2[0x5c].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5c].field_1.Value = pGVar2[0x5c].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5c].field_1.Value = pGVar2[0x5c].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5c].field_1.Value = pGVar2[0x5c].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5c].field_1.Value = pGVar2[0x5c].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5c].field_1.Value = pGVar2[0x5c].field_1.Value & 0xfffffffffdffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5c].field_1.Value = pGVar2[0x5c].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5c].field_1.Value = pGVar2[0x5c].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5c].field_1.Value = pGVar2[0x5c].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5c].field_1.Value = pGVar2[0x5c].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5c].field_1.Value = pGVar2[0x5c].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5c].field_1.Value = pGVar2[0x5c].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5c].field_1.Value = pGVar2[0x5c].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5c].field_1.Value = pGVar2[0x5c].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5e].field_1.Value = pGVar2[0x5e].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5e].field_1.Value = pGVar2[0x5e].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5e].field_1.Value = pGVar2[0x5e].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5e].field_1.Value = pGVar2[0x5e].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5e].field_1.Value = pGVar2[0x5e].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5e].field_1.Value = pGVar2[0x5e].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5e].field_1.Value = pGVar2[0x5e].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5e].field_1.Value = pGVar2[0x5e].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5e].field_1.Value = pGVar2[0x5e].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5e].field_1.Value = pGVar2[0x5e].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5e].field_1.Value = pGVar2[0x5e].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5e].field_1.Value = pGVar2[0x5e].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5e].field_1.Value = pGVar2[0x5e].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5e].field_1.Value = pGVar2[0x5e].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5e].field_1.Value = pGVar2[0x5e].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5e].field_1.Value = pGVar2[0x5e].field_1.Value & 0xfffffffffdffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5e].field_1.Value = pGVar2[0x5e].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5e].field_1.Value = pGVar2[0x5e].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5e].field_1.Value = pGVar2[0x5e].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5e].field_1.Value = pGVar2[0x5e].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5e].field_1.Value = pGVar2[0x5e].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5e].field_1.Value = pGVar2[0x5e].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5e].field_1.Value = pGVar2[0x5e].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5e].field_1.Value = pGVar2[0x5e].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5f].field_1.Value = pGVar2[0x5f].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5f].field_1.Value = pGVar2[0x5f].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5f].field_1.Value = pGVar2[0x5f].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5f].field_1.Value = pGVar2[0x5f].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5f].field_1.Value = pGVar2[0x5f].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5f].field_1.Value = pGVar2[0x5f].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5f].field_1.Value = pGVar2[0x5f].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5f].field_1.Value = pGVar2[0x5f].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5f].field_1.Value = pGVar2[0x5f].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5f].field_1.Value = pGVar2[0x5f].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5f].field_1.Value = pGVar2[0x5f].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5f].field_1.Value = pGVar2[0x5f].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5f].field_1.Value = pGVar2[0x5f].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5f].field_1.Value = pGVar2[0x5f].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5f].field_1.Value = pGVar2[0x5f].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5f].field_1.Value = pGVar2[0x5f].field_1.Value & 0xfffffffffdffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5f].field_1.Value = pGVar2[0x5f].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5f].field_1.Value = pGVar2[0x5f].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5f].field_1.Value = pGVar2[0x5f].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5f].field_1.Value = pGVar2[0x5f].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5f].field_1.Value = pGVar2[0x5f].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5f].field_1.Value = pGVar2[0x5f].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5f].field_1.Value = pGVar2[0x5f].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x5f].field_1.Value = pGVar2[0x5f].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x60].field_1.Value = pGVar2[0x60].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x60].field_1.Value = pGVar2[0x60].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x60].field_1.Value = pGVar2[0x60].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x60].field_1.Value = pGVar2[0x60].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x60].field_1.Value = pGVar2[0x60].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x60].field_1.Value = pGVar2[0x60].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x60].field_1.Value = pGVar2[0x60].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x60].field_1.Value = pGVar2[0x60].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x60].field_1.Value = pGVar2[0x60].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x60].field_1.Value = pGVar2[0x60].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x60].field_1.Value = pGVar2[0x60].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x60].field_1.Value = pGVar2[0x60].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x60].field_1.Value = pGVar2[0x60].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x60].field_1.Value = pGVar2[0x60].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x60].field_1.Value = pGVar2[0x60].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x60].field_1.Value = pGVar2[0x60].field_1.Value & 0xfffffffffdffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x60].field_1.Value = pGVar2[0x60].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x60].field_1.Value = pGVar2[0x60].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x60].field_1.Value = pGVar2[0x60].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x60].field_1.Value = pGVar2[0x60].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x60].field_1.Value = pGVar2[0x60].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x60].field_1.Value = pGVar2[0x60].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x60].field_1.Value = pGVar2[0x60].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x60].field_1.Value = pGVar2[0x60].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x61].field_1.Value = pGVar2[0x61].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x61].field_1.Value = pGVar2[0x61].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x61].field_1.Value = pGVar2[0x61].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x61].field_1.Value = pGVar2[0x61].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x61].field_1.Value = pGVar2[0x61].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x61].field_1.Value = pGVar2[0x61].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x61].field_1.Value = pGVar2[0x61].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x61].field_1.Value = pGVar2[0x61].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x61].field_1.Value = pGVar2[0x61].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x61].field_1.Value = pGVar2[0x61].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x61].field_1.Value = pGVar2[0x61].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x61].field_1.Value = pGVar2[0x61].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x61].field_1.Value = pGVar2[0x61].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x61].field_1.Value = pGVar2[0x61].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x61].field_1.Value = pGVar2[0x61].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x61].field_1.Value = pGVar2[0x61].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x61].field_1.Value = pGVar2[0x61].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x61].field_1.Value = pGVar2[0x61].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x61].field_1.Value = pGVar2[0x61].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x61].field_1.Value = pGVar2[0x61].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x61].field_1.Value = pGVar2[0x61].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x61].field_1.Value = pGVar2[0x61].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x61].field_1.Value = pGVar2[0x61].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x61].field_1.Value = pGVar2[0x61].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x62].field_1.Value = pGVar2[0x62].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x62].field_1.Value = pGVar2[0x62].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x62].field_1.Value = pGVar2[0x62].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x62].field_1.Value = pGVar2[0x62].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x62].field_1.Value = pGVar2[0x62].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x62].field_1.Value = pGVar2[0x62].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x62].field_1.Value = pGVar2[0x62].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x62].field_1.Value = pGVar2[0x62].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x62].field_1.Value = pGVar2[0x62].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x62].field_1.Value = pGVar2[0x62].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x62].field_1.Value = pGVar2[0x62].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x62].field_1.Value = pGVar2[0x62].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x62].field_1.Value = pGVar2[0x62].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x62].field_1.Value = pGVar2[0x62].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x62].field_1.Value = pGVar2[0x62].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x62].field_1.Value = pGVar2[0x62].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x62].field_1.Value = pGVar2[0x62].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x62].field_1.Value = pGVar2[0x62].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x62].field_1.Value = pGVar2[0x62].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x62].field_1.Value = pGVar2[0x62].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x62].field_1.Value = pGVar2[0x62].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x62].field_1.Value = pGVar2[0x62].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x62].field_1.Value = pGVar2[0x62].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x62].field_1.Value = pGVar2[0x62].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[99].field_1.Value = pGVar2[99].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[99].field_1.Value = pGVar2[99].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[99].field_1.Value = pGVar2[99].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[99].field_1.Value = pGVar2[99].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[99].field_1.Value = pGVar2[99].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[99].field_1.Value = pGVar2[99].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[99].field_1.Value = pGVar2[99].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[99].field_1.Value = pGVar2[99].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[99].field_1.Value = pGVar2[99].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[99].field_1.Value = pGVar2[99].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[99].field_1.Value = pGVar2[99].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[99].field_1.Value = pGVar2[99].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[99].field_1.Value = pGVar2[99].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[99].field_1.Value = pGVar2[99].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[99].field_1.Value = pGVar2[99].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[99].field_1.Value = pGVar2[99].field_1.Value & 0xfffffffffdffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[99].field_1.Value = pGVar2[99].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[99].field_1.Value = pGVar2[99].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[99].field_1.Value = pGVar2[99].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[99].field_1.Value = pGVar2[99].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[99].field_1.Value = pGVar2[99].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[99].field_1.Value = pGVar2[99].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[99].field_1.Value = pGVar2[99].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[99].field_1.Value = pGVar2[99].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[100].field_1.Value = pGVar2[100].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[100].field_1.Value = pGVar2[100].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[100].field_1.Value = pGVar2[100].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[100].field_1.Value = pGVar2[100].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[100].field_1.Value = pGVar2[100].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[100].field_1.Value = pGVar2[100].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[100].field_1.Value = pGVar2[100].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[100].field_1.Value = pGVar2[100].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[100].field_1.Value = pGVar2[100].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[100].field_1.Value = pGVar2[100].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[100].field_1.Value = pGVar2[100].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[100].field_1.Value = pGVar2[100].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[100].field_1.Value = pGVar2[100].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[100].field_1.Value = pGVar2[100].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[100].field_1.Value = pGVar2[100].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[100].field_1.Value = pGVar2[100].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[100].field_1.Value = pGVar2[100].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[100].field_1.Value = pGVar2[100].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[100].field_1.Value = pGVar2[100].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[100].field_1.Value = pGVar2[100].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[100].field_1.Value = pGVar2[100].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[100].field_1.Value = pGVar2[100].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[100].field_1.Value = pGVar2[100].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[100].field_1.Value = pGVar2[100].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x6d].field_1.Value = pGVar2[0x6d].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x6d].field_1.Value = pGVar2[0x6d].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x6d].field_1.Value = pGVar2[0x6d].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x6d].field_1.Value = pGVar2[0x6d].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x6d].field_1.Value = pGVar2[0x6d].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x6d].field_1.Value = pGVar2[0x6d].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x6d].field_1.Value = pGVar2[0x6d].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x6d].field_1.Value = pGVar2[0x6d].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x6d].field_1.Value = pGVar2[0x6d].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x6d].field_1.Value = pGVar2[0x6d].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x6d].field_1.Value = pGVar2[0x6d].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x6d].field_1.Value = pGVar2[0x6d].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x6d].field_1.Value = pGVar2[0x6d].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x6d].field_1.Value = pGVar2[0x6d].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x6d].field_1.Value = pGVar2[0x6d].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x6d].field_1.Value = pGVar2[0x6d].field_1.Value & 0xfffffffffdffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x6d].field_1.Value = pGVar2[0x6d].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x6d].field_1.Value = pGVar2[0x6d].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x6d].field_1.Value = pGVar2[0x6d].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x6d].field_1.Value = pGVar2[0x6d].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x6d].field_1.Value = pGVar2[0x6d].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x6d].field_1.Value = pGVar2[0x6d].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x6d].field_1.Value = pGVar2[0x6d].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x6d].field_1.Value = pGVar2[0x6d].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x6e].field_1.Value = pGVar2[0x6e].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x6e].field_1.Value = pGVar2[0x6e].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x6e].field_1.Value = pGVar2[0x6e].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x6e].field_1.Value = pGVar2[0x6e].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x6e].field_1.Value = pGVar2[0x6e].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x6e].field_1.Value = pGVar2[0x6e].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x6e].field_1.Value = pGVar2[0x6e].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x6e].field_1.Value = pGVar2[0x6e].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x6e].field_1.Value = pGVar2[0x6e].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x6e].field_1.Value = pGVar2[0x6e].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x6e].field_1.Value = pGVar2[0x6e].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x6e].field_1.Value = pGVar2[0x6e].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x6e].field_1.Value = pGVar2[0x6e].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x6e].field_1.Value = pGVar2[0x6e].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x6e].field_1.Value = pGVar2[0x6e].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x6e].field_1.Value = pGVar2[0x6e].field_1.Value & 0xfffffffffdffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x6e].field_1.Value = pGVar2[0x6e].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x6e].field_1.Value = pGVar2[0x6e].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x6e].field_1.Value = pGVar2[0x6e].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x6e].field_1.Value = pGVar2[0x6e].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x6e].field_1.Value = pGVar2[0x6e].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x6e].field_1.Value = pGVar2[0x6e].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x6e].field_1.Value = pGVar2[0x6e].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x6e].field_1.Value = pGVar2[0x6e].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x70].field_1.Value = pGVar2[0x70].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x70].field_1.Value = pGVar2[0x70].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x70].field_1.Value = pGVar2[0x70].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x70].field_1.Value = pGVar2[0x70].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x70].field_1.Value = pGVar2[0x70].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x70].field_1.Value = pGVar2[0x70].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x70].field_1.Value = pGVar2[0x70].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x70].field_1.Value = pGVar2[0x70].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x70].field_1.Value = pGVar2[0x70].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x70].field_1.Value = pGVar2[0x70].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x70].field_1.Value = pGVar2[0x70].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x70].field_1.Value = pGVar2[0x70].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x70].field_1.Value = pGVar2[0x70].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x70].field_1.Value = pGVar2[0x70].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x70].field_1.Value = pGVar2[0x70].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x70].field_1.Value = pGVar2[0x70].field_1.Value & 0xfffffffffdffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x70].field_1.Value = pGVar2[0x70].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x70].field_1.Value = pGVar2[0x70].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x70].field_1.Value = pGVar2[0x70].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x70].field_1.Value = pGVar2[0x70].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x70].field_1.Value = pGVar2[0x70].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x70].field_1.Value = pGVar2[0x70].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x70].field_1.Value = pGVar2[0x70].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x70].field_1.Value = pGVar2[0x70].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x71].field_1.Value = pGVar2[0x71].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x71].field_1.Value = pGVar2[0x71].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x71].field_1.Value = pGVar2[0x71].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x71].field_1.Value = pGVar2[0x71].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x71].field_1.Value = pGVar2[0x71].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x71].field_1.Value = pGVar2[0x71].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x71].field_1.Value = pGVar2[0x71].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x71].field_1.Value = pGVar2[0x71].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x71].field_1.Value = pGVar2[0x71].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x71].field_1.Value = pGVar2[0x71].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x71].field_1.Value = pGVar2[0x71].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x71].field_1.Value = pGVar2[0x71].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x71].field_1.Value = pGVar2[0x71].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x71].field_1.Value = pGVar2[0x71].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x71].field_1.Value = pGVar2[0x71].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x71].field_1.Value = pGVar2[0x71].field_1.Value & 0xfffffffffdffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x71].field_1.Value = pGVar2[0x71].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x71].field_1.Value = pGVar2[0x71].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x71].field_1.Value = pGVar2[0x71].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x71].field_1.Value = pGVar2[0x71].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x71].field_1.Value = pGVar2[0x71].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x71].field_1.Value = pGVar2[0x71].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x71].field_1.Value = pGVar2[0x71].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x71].field_1.Value = pGVar2[0x71].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x73].field_1.Value = pGVar2[0x73].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x73].field_1.Value = pGVar2[0x73].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x73].field_1.Value = pGVar2[0x73].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x73].field_1.Value = pGVar2[0x73].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x73].field_1.Value = pGVar2[0x73].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x73].field_1.Value = pGVar2[0x73].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x73].field_1.Value = pGVar2[0x73].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x73].field_1.Value = pGVar2[0x73].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x73].field_1.Value = pGVar2[0x73].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x73].field_1.Value = pGVar2[0x73].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x73].field_1.Value = pGVar2[0x73].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x73].field_1.Value = pGVar2[0x73].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x73].field_1.Value = pGVar2[0x73].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x73].field_1.Value = pGVar2[0x73].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x73].field_1.Value = pGVar2[0x73].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x73].field_1.Value = pGVar2[0x73].field_1.Value & 0xfffffffffdffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x73].field_1.Value = pGVar2[0x73].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x73].field_1.Value = pGVar2[0x73].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x73].field_1.Value = pGVar2[0x73].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x73].field_1.Value = pGVar2[0x73].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x73].field_1.Value = pGVar2[0x73].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x73].field_1.Value = pGVar2[0x73].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x73].field_1.Value = pGVar2[0x73].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x73].field_1.Value = pGVar2[0x73].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x75].field_1.Value = pGVar2[0x75].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x75].field_1.Value = pGVar2[0x75].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x75].field_1.Value = pGVar2[0x75].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x75].field_1.Value = pGVar2[0x75].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x75].field_1.Value = pGVar2[0x75].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x75].field_1.Value = pGVar2[0x75].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x75].field_1.Value = pGVar2[0x75].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x75].field_1.Value = pGVar2[0x75].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x75].field_1.Value = pGVar2[0x75].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x75].field_1.Value = pGVar2[0x75].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x75].field_1.Value = pGVar2[0x75].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x75].field_1.Value = pGVar2[0x75].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x75].field_1.Value = pGVar2[0x75].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x75].field_1.Value = pGVar2[0x75].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x75].field_1.Value = pGVar2[0x75].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x75].field_1.Value = pGVar2[0x75].field_1.Value & 0xfffffffffdffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x75].field_1.Value = pGVar2[0x75].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x75].field_1.Value = pGVar2[0x75].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x75].field_1.Value = pGVar2[0x75].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x75].field_1.Value = pGVar2[0x75].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x75].field_1.Value = pGVar2[0x75].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x75].field_1.Value = pGVar2[0x75].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x75].field_1.Value = pGVar2[0x75].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x75].field_1.Value = pGVar2[0x75].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x76].field_1.Value = pGVar2[0x76].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x76].field_1.Value = pGVar2[0x76].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x76].field_1.Value = pGVar2[0x76].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x76].field_1.Value = pGVar2[0x76].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x76].field_1.Value = pGVar2[0x76].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x76].field_1.Value = pGVar2[0x76].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x76].field_1.Value = pGVar2[0x76].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x76].field_1.Value = pGVar2[0x76].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x76].field_1.Value = pGVar2[0x76].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x76].field_1.Value = pGVar2[0x76].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x76].field_1.Value = pGVar2[0x76].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x76].field_1.Value = pGVar2[0x76].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x76].field_1.Value = pGVar2[0x76].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x76].field_1.Value = pGVar2[0x76].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x76].field_1.Value = pGVar2[0x76].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x76].field_1.Value = pGVar2[0x76].field_1.Value & 0xfffffffffdffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x76].field_1.Value = pGVar2[0x76].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x76].field_1.Value = pGVar2[0x76].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x76].field_1.Value = pGVar2[0x76].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x76].field_1.Value = pGVar2[0x76].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x76].field_1.Value = pGVar2[0x76].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x76].field_1.Value = pGVar2[0x76].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x76].field_1.Value = pGVar2[0x76].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x76].field_1.Value = pGVar2[0x76].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x77].field_1.Value = pGVar2[0x77].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x77].field_1.Value = pGVar2[0x77].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x77].field_1.Value = pGVar2[0x77].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x77].field_1.Value = pGVar2[0x77].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x77].field_1.Value = pGVar2[0x77].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x77].field_1.Value = pGVar2[0x77].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x77].field_1.Value = pGVar2[0x77].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x77].field_1.Value = pGVar2[0x77].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x77].field_1.Value = pGVar2[0x77].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x77].field_1.Value = pGVar2[0x77].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x77].field_1.Value = pGVar2[0x77].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x77].field_1.Value = pGVar2[0x77].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x77].field_1.Value = pGVar2[0x77].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x77].field_1.Value = pGVar2[0x77].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x77].field_1.Value = pGVar2[0x77].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x77].field_1.Value = pGVar2[0x77].field_1.Value & 0xfffffffffdffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x77].field_1.Value = pGVar2[0x77].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x77].field_1.Value = pGVar2[0x77].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x77].field_1.Value = pGVar2[0x77].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x77].field_1.Value = pGVar2[0x77].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x77].field_1.Value = pGVar2[0x77].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x77].field_1.Value = pGVar2[0x77].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x77].field_1.Value = pGVar2[0x77].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x77].field_1.Value = pGVar2[0x77].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x78].field_1.Value = pGVar2[0x78].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x78].field_1.Value = pGVar2[0x78].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x78].field_1.Value = pGVar2[0x78].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x78].field_1.Value = pGVar2[0x78].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x78].field_1.Value = pGVar2[0x78].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x78].field_1.Value = pGVar2[0x78].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x78].field_1.Value = pGVar2[0x78].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x78].field_1.Value = pGVar2[0x78].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x78].field_1.Value = pGVar2[0x78].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x78].field_1.Value = pGVar2[0x78].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x78].field_1.Value = pGVar2[0x78].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x78].field_1.Value = pGVar2[0x78].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x78].field_1.Value = pGVar2[0x78].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x78].field_1.Value = pGVar2[0x78].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x78].field_1.Value = pGVar2[0x78].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x78].field_1.Value = pGVar2[0x78].field_1.Value & 0xfffffffffdffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x78].field_1.Value = pGVar2[0x78].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x78].field_1.Value = pGVar2[0x78].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x78].field_1.Value = pGVar2[0x78].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x78].field_1.Value = pGVar2[0x78].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x78].field_1.Value = pGVar2[0x78].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x78].field_1.Value = pGVar2[0x78].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x78].field_1.Value = pGVar2[0x78].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x78].field_1.Value = pGVar2[0x78].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x79].field_1.Value = pGVar2[0x79].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x79].field_1.Value = pGVar2[0x79].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x79].field_1.Value = pGVar2[0x79].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x79].field_1.Value = pGVar2[0x79].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x79].field_1.Value = pGVar2[0x79].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x79].field_1.Value = pGVar2[0x79].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x79].field_1.Value = pGVar2[0x79].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x79].field_1.Value = pGVar2[0x79].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x79].field_1.Value = pGVar2[0x79].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x79].field_1.Value = pGVar2[0x79].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x79].field_1.Value = pGVar2[0x79].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x79].field_1.Value = pGVar2[0x79].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x79].field_1.Value = pGVar2[0x79].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x79].field_1.Value = pGVar2[0x79].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x79].field_1.Value = pGVar2[0x79].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x79].field_1.Value = pGVar2[0x79].field_1.Value & 0xfffffffffdffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x79].field_1.Value = pGVar2[0x79].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x79].field_1.Value = pGVar2[0x79].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x79].field_1.Value = pGVar2[0x79].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x79].field_1.Value = pGVar2[0x79].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x79].field_1.Value = pGVar2[0x79].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x79].field_1.Value = pGVar2[0x79].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x79].field_1.Value = pGVar2[0x79].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x79].field_1.Value = pGVar2[0x79].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7a].field_1.Value = pGVar2[0x7a].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7a].field_1.Value = pGVar2[0x7a].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7a].field_1.Value = pGVar2[0x7a].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7a].field_1.Value = pGVar2[0x7a].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7a].field_1.Value = pGVar2[0x7a].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7a].field_1.Value = pGVar2[0x7a].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7a].field_1.Value = pGVar2[0x7a].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7a].field_1.Value = pGVar2[0x7a].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7a].field_1.Value = pGVar2[0x7a].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7a].field_1.Value = pGVar2[0x7a].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7a].field_1.Value = pGVar2[0x7a].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7a].field_1.Value = pGVar2[0x7a].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7a].field_1.Value = pGVar2[0x7a].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7a].field_1.Value = pGVar2[0x7a].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7a].field_1.Value = pGVar2[0x7a].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7a].field_1.Value = pGVar2[0x7a].field_1.Value & 0xfffffffffdffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7a].field_1.Value = pGVar2[0x7a].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7a].field_1.Value = pGVar2[0x7a].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7a].field_1.Value = pGVar2[0x7a].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7a].field_1.Value = pGVar2[0x7a].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7a].field_1.Value = pGVar2[0x7a].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7a].field_1.Value = pGVar2[0x7a].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7a].field_1.Value = pGVar2[0x7a].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7a].field_1.Value = pGVar2[0x7a].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7b].field_1.Value = pGVar2[0x7b].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7b].field_1.Value = pGVar2[0x7b].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7b].field_1.Value = pGVar2[0x7b].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7b].field_1.Value = pGVar2[0x7b].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7b].field_1.Value = pGVar2[0x7b].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7b].field_1.Value = pGVar2[0x7b].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7b].field_1.Value = pGVar2[0x7b].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7b].field_1.Value = pGVar2[0x7b].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7b].field_1.Value = pGVar2[0x7b].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7b].field_1.Value = pGVar2[0x7b].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7b].field_1.Value = pGVar2[0x7b].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7b].field_1.Value = pGVar2[0x7b].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7b].field_1.Value = pGVar2[0x7b].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7b].field_1.Value = pGVar2[0x7b].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7b].field_1.Value = pGVar2[0x7b].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7b].field_1.Value = pGVar2[0x7b].field_1.Value & 0xfffffffffdffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7b].field_1.Value = pGVar2[0x7b].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7b].field_1.Value = pGVar2[0x7b].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7b].field_1.Value = pGVar2[0x7b].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7b].field_1.Value = pGVar2[0x7b].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7b].field_1.Value = pGVar2[0x7b].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7b].field_1.Value = pGVar2[0x7b].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7b].field_1.Value = pGVar2[0x7b].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7b].field_1.Value = pGVar2[0x7b].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7c].field_1.Value = pGVar2[0x7c].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7c].field_1.Value = pGVar2[0x7c].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7c].field_1.Value = pGVar2[0x7c].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7c].field_1.Value = pGVar2[0x7c].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7c].field_1.Value = pGVar2[0x7c].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7c].field_1.Value = pGVar2[0x7c].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7c].field_1.Value = pGVar2[0x7c].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7c].field_1.Value = pGVar2[0x7c].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7c].field_1.Value = pGVar2[0x7c].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7c].field_1.Value = pGVar2[0x7c].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7c].field_1.Value = pGVar2[0x7c].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7c].field_1.Value = pGVar2[0x7c].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7c].field_1.Value = pGVar2[0x7c].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7c].field_1.Value = pGVar2[0x7c].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7c].field_1.Value = pGVar2[0x7c].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7c].field_1.Value = pGVar2[0x7c].field_1.Value & 0xfffffffffdffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7c].field_1.Value = pGVar2[0x7c].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7c].field_1.Value = pGVar2[0x7c].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7c].field_1.Value = pGVar2[0x7c].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7c].field_1.Value = pGVar2[0x7c].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7c].field_1.Value = pGVar2[0x7c].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7c].field_1.Value = pGVar2[0x7c].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7c].field_1.Value = pGVar2[0x7c].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7c].field_1.Value = pGVar2[0x7c].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7d].field_1.Value = pGVar2[0x7d].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7d].field_1.Value = pGVar2[0x7d].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7d].field_1.Value = pGVar2[0x7d].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7d].field_1.Value = pGVar2[0x7d].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7d].field_1.Value = pGVar2[0x7d].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7d].field_1.Value = pGVar2[0x7d].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7d].field_1.Value = pGVar2[0x7d].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7d].field_1.Value = pGVar2[0x7d].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7d].field_1.Value = pGVar2[0x7d].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7d].field_1.Value = pGVar2[0x7d].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7d].field_1.Value = pGVar2[0x7d].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7d].field_1.Value = pGVar2[0x7d].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7d].field_1.Value = pGVar2[0x7d].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7d].field_1.Value = pGVar2[0x7d].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7d].field_1.Value = pGVar2[0x7d].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7d].field_1.Value = pGVar2[0x7d].field_1.Value & 0xfffffffffdffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7d].field_1.Value = pGVar2[0x7d].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7d].field_1.Value = pGVar2[0x7d].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7d].field_1.Value = pGVar2[0x7d].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7d].field_1.Value = pGVar2[0x7d].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7d].field_1.Value = pGVar2[0x7d].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7d].field_1.Value = pGVar2[0x7d].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7d].field_1.Value = pGVar2[0x7d].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7d].field_1.Value = pGVar2[0x7d].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7e].field_1.Value = pGVar2[0x7e].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7e].field_1.Value = pGVar2[0x7e].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7e].field_1.Value = pGVar2[0x7e].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7e].field_1.Value = pGVar2[0x7e].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7e].field_1.Value = pGVar2[0x7e].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7e].field_1.Value = pGVar2[0x7e].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7e].field_1.Value = pGVar2[0x7e].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7e].field_1.Value = pGVar2[0x7e].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7e].field_1.Value = pGVar2[0x7e].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7e].field_1.Value = pGVar2[0x7e].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7e].field_1.Value = pGVar2[0x7e].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7e].field_1.Value = pGVar2[0x7e].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7e].field_1.Value = pGVar2[0x7e].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7e].field_1.Value = pGVar2[0x7e].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7e].field_1.Value = pGVar2[0x7e].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7e].field_1.Value = pGVar2[0x7e].field_1.Value & 0xfffffffffdffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7e].field_1.Value = pGVar2[0x7e].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7e].field_1.Value = pGVar2[0x7e].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7e].field_1.Value = pGVar2[0x7e].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7e].field_1.Value = pGVar2[0x7e].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7e].field_1.Value = pGVar2[0x7e].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7e].field_1.Value = pGVar2[0x7e].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7e].field_1.Value = pGVar2[0x7e].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7e].field_1.Value = pGVar2[0x7e].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7f].field_1.Value = pGVar2[0x7f].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7f].field_1.Value = pGVar2[0x7f].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7f].field_1.Value = pGVar2[0x7f].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7f].field_1.Value = pGVar2[0x7f].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7f].field_1.Value = pGVar2[0x7f].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7f].field_1.Value = pGVar2[0x7f].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7f].field_1.Value = pGVar2[0x7f].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7f].field_1.Value = pGVar2[0x7f].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7f].field_1.Value = pGVar2[0x7f].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7f].field_1.Value = pGVar2[0x7f].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7f].field_1.Value = pGVar2[0x7f].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7f].field_1.Value = pGVar2[0x7f].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7f].field_1.Value = pGVar2[0x7f].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7f].field_1.Value = pGVar2[0x7f].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7f].field_1.Value = pGVar2[0x7f].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7f].field_1.Value = pGVar2[0x7f].field_1.Value & 0xfffffffffdffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7f].field_1.Value = pGVar2[0x7f].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7f].field_1.Value = pGVar2[0x7f].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7f].field_1.Value = pGVar2[0x7f].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7f].field_1.Value = pGVar2[0x7f].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7f].field_1.Value = pGVar2[0x7f].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7f].field_1.Value = pGVar2[0x7f].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7f].field_1.Value = pGVar2[0x7f].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x7f].field_1.Value = pGVar2[0x7f].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x80].field_1.Value = pGVar2[0x80].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x80].field_1.Value = pGVar2[0x80].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x80].field_1.Value = pGVar2[0x80].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x80].field_1.Value = pGVar2[0x80].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x80].field_1.Value = pGVar2[0x80].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x80].field_1.Value = pGVar2[0x80].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x80].field_1.Value = pGVar2[0x80].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x80].field_1.Value = pGVar2[0x80].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x80].field_1.Value = pGVar2[0x80].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x80].field_1.Value = pGVar2[0x80].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x80].field_1.Value = pGVar2[0x80].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x80].field_1.Value = pGVar2[0x80].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x80].field_1.Value = pGVar2[0x80].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x80].field_1.Value = pGVar2[0x80].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x80].field_1.Value = pGVar2[0x80].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x80].field_1.Value = pGVar2[0x80].field_1.Value & 0xfffffffffdffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x80].field_1.Value = pGVar2[0x80].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x80].field_1.Value = pGVar2[0x80].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x80].field_1.Value = pGVar2[0x80].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x80].field_1.Value = pGVar2[0x80].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x80].field_1.Value = pGVar2[0x80].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x80].field_1.Value = pGVar2[0x80].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x80].field_1.Value = pGVar2[0x80].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x80].field_1.Value = pGVar2[0x80].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x81].field_1.Value = pGVar2[0x81].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x81].field_1.Value = pGVar2[0x81].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x81].field_1.Value = pGVar2[0x81].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x81].field_1.Value = pGVar2[0x81].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x81].field_1.Value = pGVar2[0x81].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x81].field_1.Value = pGVar2[0x81].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x81].field_1.Value = pGVar2[0x81].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x81].field_1.Value = pGVar2[0x81].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x81].field_1.Value = pGVar2[0x81].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x81].field_1.Value = pGVar2[0x81].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x81].field_1.Value = pGVar2[0x81].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x81].field_1.Value = pGVar2[0x81].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x81].field_1.Value = pGVar2[0x81].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x81].field_1.Value = pGVar2[0x81].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x81].field_1.Value = pGVar2[0x81].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x81].field_1.Value = pGVar2[0x81].field_1.Value & 0xfffffffffdffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x81].field_1.Value = pGVar2[0x81].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x81].field_1.Value = pGVar2[0x81].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x81].field_1.Value = pGVar2[0x81].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x81].field_1.Value = pGVar2[0x81].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x81].field_1.Value = pGVar2[0x81].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x81].field_1.Value = pGVar2[0x81].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x81].field_1.Value = pGVar2[0x81].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x81].field_1.Value = pGVar2[0x81].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x82].field_1.Value = pGVar2[0x82].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x82].field_1.Value = pGVar2[0x82].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x82].field_1.Value = pGVar2[0x82].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x82].field_1.Value = pGVar2[0x82].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x82].field_1.Value = pGVar2[0x82].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x82].field_1.Value = pGVar2[0x82].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x82].field_1.Value = pGVar2[0x82].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x82].field_1.Value = pGVar2[0x82].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x82].field_1.Value = pGVar2[0x82].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x82].field_1.Value = pGVar2[0x82].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x82].field_1.Value = pGVar2[0x82].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x82].field_1.Value = pGVar2[0x82].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x82].field_1.Value = pGVar2[0x82].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x82].field_1.Value = pGVar2[0x82].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x82].field_1.Value = pGVar2[0x82].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x82].field_1.Value = pGVar2[0x82].field_1.Value & 0xfffffffffdffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x82].field_1.Value = pGVar2[0x82].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x82].field_1.Value = pGVar2[0x82].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x82].field_1.Value = pGVar2[0x82].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x82].field_1.Value = pGVar2[0x82].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x82].field_1.Value = pGVar2[0x82].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x82].field_1.Value = pGVar2[0x82].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x82].field_1.Value = pGVar2[0x82].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x82].field_1.Value = pGVar2[0x82].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x83].field_1.Value = pGVar2[0x83].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x83].field_1.Value = pGVar2[0x83].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x83].field_1.Value = pGVar2[0x83].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x83].field_1.Value = pGVar2[0x83].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x83].field_1.Value = pGVar2[0x83].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x83].field_1.Value = pGVar2[0x83].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x83].field_1.Value = pGVar2[0x83].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x83].field_1.Value = pGVar2[0x83].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x83].field_1.Value = pGVar2[0x83].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x83].field_1.Value = pGVar2[0x83].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x83].field_1.Value = pGVar2[0x83].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x83].field_1.Value = pGVar2[0x83].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x83].field_1.Value = pGVar2[0x83].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x83].field_1.Value = pGVar2[0x83].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x83].field_1.Value = pGVar2[0x83].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x83].field_1.Value = pGVar2[0x83].field_1.Value & 0xfffffffffdffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x83].field_1.Value = pGVar2[0x83].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x83].field_1.Value = pGVar2[0x83].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x83].field_1.Value = pGVar2[0x83].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x83].field_1.Value = pGVar2[0x83].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x83].field_1.Value = pGVar2[0x83].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x83].field_1.Value = pGVar2[0x83].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x83].field_1.Value = pGVar2[0x83].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x83].field_1.Value = pGVar2[0x83].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x84].field_1.Value = pGVar2[0x84].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x84].field_1.Value = pGVar2[0x84].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x84].field_1.Value = pGVar2[0x84].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x84].field_1.Value = pGVar2[0x84].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x84].field_1.Value = pGVar2[0x84].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x84].field_1.Value = pGVar2[0x84].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x84].field_1.Value = pGVar2[0x84].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x84].field_1.Value = pGVar2[0x84].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x84].field_1.Value = pGVar2[0x84].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x84].field_1.Value = pGVar2[0x84].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x84].field_1.Value = pGVar2[0x84].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x84].field_1.Value = pGVar2[0x84].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x84].field_1.Value = pGVar2[0x84].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x84].field_1.Value = pGVar2[0x84].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x84].field_1.Value = pGVar2[0x84].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x84].field_1.Value = pGVar2[0x84].field_1.Value & 0xfffffffffdffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x84].field_1.Value = pGVar2[0x84].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x84].field_1.Value = pGVar2[0x84].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x84].field_1.Value = pGVar2[0x84].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x84].field_1.Value = pGVar2[0x84].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x84].field_1.Value = pGVar2[0x84].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x84].field_1.Value = pGVar2[0x84].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x84].field_1.Value = pGVar2[0x84].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x84].field_1.Value = pGVar2[0x84].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x85].field_1.Value = pGVar2[0x85].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x85].field_1.Value = pGVar2[0x85].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x85].field_1.Value = pGVar2[0x85].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x85].field_1.Value = pGVar2[0x85].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x85].field_1.Value = pGVar2[0x85].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x85].field_1.Value = pGVar2[0x85].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x85].field_1.Value = pGVar2[0x85].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x85].field_1.Value = pGVar2[0x85].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x85].field_1.Value = pGVar2[0x85].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x85].field_1.Value = pGVar2[0x85].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x85].field_1.Value = pGVar2[0x85].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x85].field_1.Value = pGVar2[0x85].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x85].field_1.Value = pGVar2[0x85].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x85].field_1.Value = pGVar2[0x85].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x85].field_1.Value = pGVar2[0x85].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x85].field_1.Value = pGVar2[0x85].field_1.Value & 0xfffffffffdffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x85].field_1.Value = pGVar2[0x85].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x85].field_1.Value = pGVar2[0x85].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x85].field_1.Value = pGVar2[0x85].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x85].field_1.Value = pGVar2[0x85].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x85].field_1.Value = pGVar2[0x85].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x85].field_1.Value = pGVar2[0x85].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x85].field_1.Value = pGVar2[0x85].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x85].field_1.Value = pGVar2[0x85].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x86].field_1.Value = pGVar2[0x86].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x86].field_1.Value = pGVar2[0x86].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x86].field_1.Value = pGVar2[0x86].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x86].field_1.Value = pGVar2[0x86].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x86].field_1.Value = pGVar2[0x86].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x86].field_1.Value = pGVar2[0x86].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x86].field_1.Value = pGVar2[0x86].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x86].field_1.Value = pGVar2[0x86].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x86].field_1.Value = pGVar2[0x86].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x86].field_1.Value = pGVar2[0x86].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x86].field_1.Value = pGVar2[0x86].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x86].field_1.Value = pGVar2[0x86].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x86].field_1.Value = pGVar2[0x86].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x86].field_1.Value = pGVar2[0x86].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x86].field_1.Value = pGVar2[0x86].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x86].field_1.Value = pGVar2[0x86].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x86].field_1.Value = pGVar2[0x86].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x86].field_1.Value = pGVar2[0x86].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x86].field_1.Value = pGVar2[0x86].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x86].field_1.Value = pGVar2[0x86].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x86].field_1.Value = pGVar2[0x86].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x86].field_1.Value = pGVar2[0x86].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x86].field_1.Value = pGVar2[0x86].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x86].field_1.Value = pGVar2[0x86].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x87].field_1.Value = pGVar2[0x87].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x87].field_1.Value = pGVar2[0x87].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x87].field_1.Value = pGVar2[0x87].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x87].field_1.Value = pGVar2[0x87].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x87].field_1.Value = pGVar2[0x87].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x87].field_1.Value = pGVar2[0x87].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x87].field_1.Value = pGVar2[0x87].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x87].field_1.Value = pGVar2[0x87].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x87].field_1.Value = pGVar2[0x87].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x87].field_1.Value = pGVar2[0x87].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x87].field_1.Value = pGVar2[0x87].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x87].field_1.Value = pGVar2[0x87].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x87].field_1.Value = pGVar2[0x87].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x87].field_1.Value = pGVar2[0x87].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x87].field_1.Value = pGVar2[0x87].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x87].field_1.Value = pGVar2[0x87].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x87].field_1.Value = pGVar2[0x87].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x87].field_1.Value = pGVar2[0x87].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x87].field_1.Value = pGVar2[0x87].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x87].field_1.Value = pGVar2[0x87].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x87].field_1.Value = pGVar2[0x87].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x87].field_1.Value = pGVar2[0x87].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x87].field_1.Value = pGVar2[0x87].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x87].field_1.Value = pGVar2[0x87].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x88].field_1.Value = pGVar2[0x88].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x88].field_1.Value = pGVar2[0x88].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x88].field_1.Value = pGVar2[0x88].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x88].field_1.Value = pGVar2[0x88].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x88].field_1.Value = pGVar2[0x88].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x88].field_1.Value = pGVar2[0x88].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x88].field_1.Value = pGVar2[0x88].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x88].field_1.Value = pGVar2[0x88].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x88].field_1.Value = pGVar2[0x88].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x88].field_1.Value = pGVar2[0x88].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x88].field_1.Value = pGVar2[0x88].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x88].field_1.Value = pGVar2[0x88].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x88].field_1.Value = pGVar2[0x88].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x88].field_1.Value = pGVar2[0x88].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x88].field_1.Value = pGVar2[0x88].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x88].field_1.Value = pGVar2[0x88].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x88].field_1.Value = pGVar2[0x88].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x88].field_1.Value = pGVar2[0x88].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x88].field_1.Value = pGVar2[0x88].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x88].field_1.Value = pGVar2[0x88].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x88].field_1.Value = pGVar2[0x88].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x88].field_1.Value = pGVar2[0x88].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x88].field_1.Value = pGVar2[0x88].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x88].field_1.Value = pGVar2[0x88].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x89].field_1.Value = pGVar2[0x89].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x89].field_1.Value = pGVar2[0x89].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x89].field_1.Value = pGVar2[0x89].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x89].field_1.Value = pGVar2[0x89].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x89].field_1.Value = pGVar2[0x89].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x89].field_1.Value = pGVar2[0x89].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x89].field_1.Value = pGVar2[0x89].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x89].field_1.Value = pGVar2[0x89].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x89].field_1.Value = pGVar2[0x89].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x89].field_1.Value = pGVar2[0x89].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x89].field_1.Value = pGVar2[0x89].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x89].field_1.Value = pGVar2[0x89].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x89].field_1.Value = pGVar2[0x89].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x89].field_1.Value = pGVar2[0x89].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x89].field_1.Value = pGVar2[0x89].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x89].field_1.Value = pGVar2[0x89].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x89].field_1.Value = pGVar2[0x89].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x89].field_1.Value = pGVar2[0x89].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x89].field_1.Value = pGVar2[0x89].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x89].field_1.Value = pGVar2[0x89].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x89].field_1.Value = pGVar2[0x89].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x89].field_1.Value = pGVar2[0x89].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x89].field_1.Value = pGVar2[0x89].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x89].field_1.Value = pGVar2[0x89].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8a].field_1.Value = pGVar2[0x8a].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8a].field_1.Value = pGVar2[0x8a].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8a].field_1.Value = pGVar2[0x8a].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8a].field_1.Value = pGVar2[0x8a].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8a].field_1.Value = pGVar2[0x8a].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8a].field_1.Value = pGVar2[0x8a].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8a].field_1.Value = pGVar2[0x8a].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8a].field_1.Value = pGVar2[0x8a].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8a].field_1.Value = pGVar2[0x8a].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8a].field_1.Value = pGVar2[0x8a].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8a].field_1.Value = pGVar2[0x8a].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8a].field_1.Value = pGVar2[0x8a].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8a].field_1.Value = pGVar2[0x8a].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8a].field_1.Value = pGVar2[0x8a].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8a].field_1.Value = pGVar2[0x8a].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8a].field_1.Value = pGVar2[0x8a].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8a].field_1.Value = pGVar2[0x8a].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8a].field_1.Value = pGVar2[0x8a].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8a].field_1.Value = pGVar2[0x8a].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8a].field_1.Value = pGVar2[0x8a].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8a].field_1.Value = pGVar2[0x8a].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8a].field_1.Value = pGVar2[0x8a].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8a].field_1.Value = pGVar2[0x8a].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8a].field_1.Value = pGVar2[0x8a].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8b].field_1.Value = pGVar2[0x8b].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8b].field_1.Value = pGVar2[0x8b].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8b].field_1.Value = pGVar2[0x8b].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8b].field_1.Value = pGVar2[0x8b].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8b].field_1.Value = pGVar2[0x8b].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8b].field_1.Value = pGVar2[0x8b].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8b].field_1.Value = pGVar2[0x8b].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8b].field_1.Value = pGVar2[0x8b].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8b].field_1.Value = pGVar2[0x8b].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8b].field_1.Value = pGVar2[0x8b].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8b].field_1.Value = pGVar2[0x8b].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8b].field_1.Value = pGVar2[0x8b].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8b].field_1.Value = pGVar2[0x8b].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8b].field_1.Value = pGVar2[0x8b].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8b].field_1.Value = pGVar2[0x8b].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8b].field_1.Value = pGVar2[0x8b].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8b].field_1.Value = pGVar2[0x8b].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8b].field_1.Value = pGVar2[0x8b].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8b].field_1.Value = pGVar2[0x8b].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8b].field_1.Value = pGVar2[0x8b].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8b].field_1.Value = pGVar2[0x8b].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8b].field_1.Value = pGVar2[0x8b].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8b].field_1.Value = pGVar2[0x8b].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8b].field_1.Value = pGVar2[0x8b].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8c].field_1.Value = pGVar2[0x8c].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8c].field_1.Value = pGVar2[0x8c].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8c].field_1.Value = pGVar2[0x8c].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8c].field_1.Value = pGVar2[0x8c].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8c].field_1.Value = pGVar2[0x8c].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8c].field_1.Value = pGVar2[0x8c].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8c].field_1.Value = pGVar2[0x8c].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8c].field_1.Value = pGVar2[0x8c].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8c].field_1.Value = pGVar2[0x8c].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8c].field_1.Value = pGVar2[0x8c].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8c].field_1.Value = pGVar2[0x8c].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8c].field_1.Value = pGVar2[0x8c].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8c].field_1.Value = pGVar2[0x8c].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8c].field_1.Value = pGVar2[0x8c].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8c].field_1.Value = pGVar2[0x8c].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8c].field_1.Value = pGVar2[0x8c].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8c].field_1.Value = pGVar2[0x8c].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8c].field_1.Value = pGVar2[0x8c].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8c].field_1.Value = pGVar2[0x8c].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8c].field_1.Value = pGVar2[0x8c].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8c].field_1.Value = pGVar2[0x8c].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8c].field_1.Value = pGVar2[0x8c].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8c].field_1.Value = pGVar2[0x8c].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8c].field_1.Value = pGVar2[0x8c].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8d].field_1.Value = pGVar2[0x8d].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8d].field_1.Value = pGVar2[0x8d].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8d].field_1.Value = pGVar2[0x8d].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8d].field_1.Value = pGVar2[0x8d].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8d].field_1.Value = pGVar2[0x8d].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8d].field_1.Value = pGVar2[0x8d].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8d].field_1.Value = pGVar2[0x8d].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8d].field_1.Value = pGVar2[0x8d].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8d].field_1.Value = pGVar2[0x8d].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8d].field_1.Value = pGVar2[0x8d].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8d].field_1.Value = pGVar2[0x8d].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8d].field_1.Value = pGVar2[0x8d].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8d].field_1.Value = pGVar2[0x8d].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8d].field_1.Value = pGVar2[0x8d].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8d].field_1.Value = pGVar2[0x8d].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8d].field_1.Value = pGVar2[0x8d].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8d].field_1.Value = pGVar2[0x8d].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8d].field_1.Value = pGVar2[0x8d].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8d].field_1.Value = pGVar2[0x8d].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8d].field_1.Value = pGVar2[0x8d].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8d].field_1.Value = pGVar2[0x8d].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8d].field_1.Value = pGVar2[0x8d].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8d].field_1.Value = pGVar2[0x8d].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8d].field_1.Value = pGVar2[0x8d].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8e].field_1.Value = pGVar2[0x8e].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8e].field_1.Value = pGVar2[0x8e].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8e].field_1.Value = pGVar2[0x8e].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8e].field_1.Value = pGVar2[0x8e].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8e].field_1.Value = pGVar2[0x8e].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8e].field_1.Value = pGVar2[0x8e].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8e].field_1.Value = pGVar2[0x8e].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8e].field_1.Value = pGVar2[0x8e].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8e].field_1.Value = pGVar2[0x8e].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8e].field_1.Value = pGVar2[0x8e].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8e].field_1.Value = pGVar2[0x8e].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8e].field_1.Value = pGVar2[0x8e].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8e].field_1.Value = pGVar2[0x8e].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8e].field_1.Value = pGVar2[0x8e].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8e].field_1.Value = pGVar2[0x8e].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8e].field_1.Value = pGVar2[0x8e].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8e].field_1.Value = pGVar2[0x8e].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8e].field_1.Value = pGVar2[0x8e].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8e].field_1.Value = pGVar2[0x8e].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8e].field_1.Value = pGVar2[0x8e].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8e].field_1.Value = pGVar2[0x8e].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8e].field_1.Value = pGVar2[0x8e].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8e].field_1.Value = pGVar2[0x8e].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8e].field_1.Value = pGVar2[0x8e].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8f].field_1.Value = pGVar2[0x8f].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8f].field_1.Value = pGVar2[0x8f].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8f].field_1.Value = pGVar2[0x8f].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8f].field_1.Value = pGVar2[0x8f].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8f].field_1.Value = pGVar2[0x8f].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8f].field_1.Value = pGVar2[0x8f].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8f].field_1.Value = pGVar2[0x8f].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8f].field_1.Value = pGVar2[0x8f].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8f].field_1.Value = pGVar2[0x8f].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8f].field_1.Value = pGVar2[0x8f].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8f].field_1.Value = pGVar2[0x8f].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8f].field_1.Value = pGVar2[0x8f].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8f].field_1.Value = pGVar2[0x8f].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8f].field_1.Value = pGVar2[0x8f].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8f].field_1.Value = pGVar2[0x8f].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8f].field_1.Value = pGVar2[0x8f].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8f].field_1.Value = pGVar2[0x8f].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8f].field_1.Value = pGVar2[0x8f].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8f].field_1.Value = pGVar2[0x8f].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8f].field_1.Value = pGVar2[0x8f].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8f].field_1.Value = pGVar2[0x8f].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8f].field_1.Value = pGVar2[0x8f].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8f].field_1.Value = pGVar2[0x8f].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x8f].field_1.Value = pGVar2[0x8f].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x90].field_1.Value = pGVar2[0x90].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x90].field_1.Value = pGVar2[0x90].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x90].field_1.Value = pGVar2[0x90].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x90].field_1.Value = pGVar2[0x90].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x90].field_1.Value = pGVar2[0x90].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x90].field_1.Value = pGVar2[0x90].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x90].field_1.Value = pGVar2[0x90].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x90].field_1.Value = pGVar2[0x90].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x90].field_1.Value = pGVar2[0x90].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x90].field_1.Value = pGVar2[0x90].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x90].field_1.Value = pGVar2[0x90].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x90].field_1.Value = pGVar2[0x90].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x90].field_1.Value = pGVar2[0x90].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x90].field_1.Value = pGVar2[0x90].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x90].field_1.Value = pGVar2[0x90].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x90].field_1.Value = pGVar2[0x90].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x90].field_1.Value = pGVar2[0x90].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x90].field_1.Value = pGVar2[0x90].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x90].field_1.Value = pGVar2[0x90].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x90].field_1.Value = pGVar2[0x90].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x90].field_1.Value = pGVar2[0x90].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x90].field_1.Value = pGVar2[0x90].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x90].field_1.Value = pGVar2[0x90].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x90].field_1.Value = pGVar2[0x90].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa1].field_1.Value = pGVar2[0xa1].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa1].field_1.Value = pGVar2[0xa1].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa1].field_1.Value = pGVar2[0xa1].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa1].field_1.Value = pGVar2[0xa1].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa1].field_1.Value = pGVar2[0xa1].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa1].field_1.Value = pGVar2[0xa1].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa1].field_1.Value = pGVar2[0xa1].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa1].field_1.Value = pGVar2[0xa1].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa1].field_1.Value = pGVar2[0xa1].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa1].field_1.Value = pGVar2[0xa1].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa1].field_1.Value = pGVar2[0xa1].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa1].field_1.Value = pGVar2[0xa1].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa1].field_1.Value = pGVar2[0xa1].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa1].field_1.Value = pGVar2[0xa1].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa1].field_1.Value = pGVar2[0xa1].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa1].field_1.Value = pGVar2[0xa1].field_1.Value & 0xfffffffffdffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa1].field_1.Value = pGVar2[0xa1].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa1].field_1.Value = pGVar2[0xa1].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa1].field_1.Value = pGVar2[0xa1].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa1].field_1.Value = pGVar2[0xa1].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa1].field_1.Value = pGVar2[0xa1].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa1].field_1.Value = pGVar2[0xa1].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa1].field_1.Value = pGVar2[0xa1].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa1].field_1.Value = pGVar2[0xa1].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa2].field_1.Value = pGVar2[0xa2].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa2].field_1.Value = pGVar2[0xa2].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa2].field_1.Value = pGVar2[0xa2].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa2].field_1.Value = pGVar2[0xa2].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa2].field_1.Value = pGVar2[0xa2].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa2].field_1.Value = pGVar2[0xa2].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa2].field_1.Value = pGVar2[0xa2].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa2].field_1.Value = pGVar2[0xa2].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa2].field_1.Value = pGVar2[0xa2].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa2].field_1.Value = pGVar2[0xa2].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa2].field_1.Value = pGVar2[0xa2].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa2].field_1.Value = pGVar2[0xa2].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa2].field_1.Value = pGVar2[0xa2].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa2].field_1.Value = pGVar2[0xa2].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa2].field_1.Value = pGVar2[0xa2].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa2].field_1.Value = pGVar2[0xa2].field_1.Value & 0xfffffffffdffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa2].field_1.Value = pGVar2[0xa2].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa2].field_1.Value = pGVar2[0xa2].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa2].field_1.Value = pGVar2[0xa2].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa2].field_1.Value = pGVar2[0xa2].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa2].field_1.Value = pGVar2[0xa2].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa2].field_1.Value = pGVar2[0xa2].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa2].field_1.Value = pGVar2[0xa2].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa2].field_1.Value = pGVar2[0xa2].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x99].field_1.Value = pGVar2[0x99].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x99].field_1.Value = pGVar2[0x99].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x99].field_1.Value = pGVar2[0x99].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x99].field_1.Value = pGVar2[0x99].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x99].field_1.Value = pGVar2[0x99].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x99].field_1.Value = pGVar2[0x99].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x99].field_1.Value = pGVar2[0x99].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x99].field_1.Value = pGVar2[0x99].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x99].field_1.Value = pGVar2[0x99].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x99].field_1.Value = pGVar2[0x99].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x99].field_1.Value = pGVar2[0x99].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x99].field_1.Value = pGVar2[0x99].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x99].field_1.Value = pGVar2[0x99].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x99].field_1.Value = pGVar2[0x99].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x99].field_1.Value = pGVar2[0x99].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x99].field_1.Value = pGVar2[0x99].field_1.Value & 0xfffffffffdffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x99].field_1.Value = pGVar2[0x99].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x99].field_1.Value = pGVar2[0x99].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x99].field_1.Value = pGVar2[0x99].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x99].field_1.Value = pGVar2[0x99].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x99].field_1.Value = pGVar2[0x99].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x99].field_1.Value = pGVar2[0x99].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x99].field_1.Value = pGVar2[0x99].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x99].field_1.Value = pGVar2[0x99].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9a].field_1.Value = pGVar2[0x9a].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9a].field_1.Value = pGVar2[0x9a].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9a].field_1.Value = pGVar2[0x9a].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9a].field_1.Value = pGVar2[0x9a].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9a].field_1.Value = pGVar2[0x9a].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9a].field_1.Value = pGVar2[0x9a].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9a].field_1.Value = pGVar2[0x9a].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9a].field_1.Value = pGVar2[0x9a].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9a].field_1.Value = pGVar2[0x9a].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9a].field_1.Value = pGVar2[0x9a].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9a].field_1.Value = pGVar2[0x9a].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9a].field_1.Value = pGVar2[0x9a].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9a].field_1.Value = pGVar2[0x9a].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9a].field_1.Value = pGVar2[0x9a].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9a].field_1.Value = pGVar2[0x9a].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9a].field_1.Value = pGVar2[0x9a].field_1.Value & 0xfffffffffdffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9a].field_1.Value = pGVar2[0x9a].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9a].field_1.Value = pGVar2[0x9a].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9a].field_1.Value = pGVar2[0x9a].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9a].field_1.Value = pGVar2[0x9a].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9a].field_1.Value = pGVar2[0x9a].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9a].field_1.Value = pGVar2[0x9a].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9a].field_1.Value = pGVar2[0x9a].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9a].field_1.Value = pGVar2[0x9a].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9b].field_1.Value = pGVar2[0x9b].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9b].field_1.Value = pGVar2[0x9b].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9b].field_1.Value = pGVar2[0x9b].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9b].field_1.Value = pGVar2[0x9b].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9b].field_1.Value = pGVar2[0x9b].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9b].field_1.Value = pGVar2[0x9b].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9b].field_1.Value = pGVar2[0x9b].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9b].field_1.Value = pGVar2[0x9b].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9b].field_1.Value = pGVar2[0x9b].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9b].field_1.Value = pGVar2[0x9b].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9b].field_1.Value = pGVar2[0x9b].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9b].field_1.Value = pGVar2[0x9b].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9b].field_1.Value = pGVar2[0x9b].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9b].field_1.Value = pGVar2[0x9b].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9b].field_1.Value = pGVar2[0x9b].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9b].field_1.Value = pGVar2[0x9b].field_1.Value & 0xfffffffffdffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9b].field_1.Value = pGVar2[0x9b].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9b].field_1.Value = pGVar2[0x9b].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9b].field_1.Value = pGVar2[0x9b].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9b].field_1.Value = pGVar2[0x9b].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9b].field_1.Value = pGVar2[0x9b].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9b].field_1.Value = pGVar2[0x9b].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9b].field_1.Value = pGVar2[0x9b].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9b].field_1.Value = pGVar2[0x9b].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9c].field_1.Value = pGVar2[0x9c].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9c].field_1.Value = pGVar2[0x9c].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9c].field_1.Value = pGVar2[0x9c].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9c].field_1.Value = pGVar2[0x9c].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9c].field_1.Value = pGVar2[0x9c].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9c].field_1.Value = pGVar2[0x9c].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9c].field_1.Value = pGVar2[0x9c].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9c].field_1.Value = pGVar2[0x9c].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9c].field_1.Value = pGVar2[0x9c].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9c].field_1.Value = pGVar2[0x9c].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9c].field_1.Value = pGVar2[0x9c].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9c].field_1.Value = pGVar2[0x9c].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9c].field_1.Value = pGVar2[0x9c].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9c].field_1.Value = pGVar2[0x9c].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9c].field_1.Value = pGVar2[0x9c].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9c].field_1.Value = pGVar2[0x9c].field_1.Value & 0xfffffffffdffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9c].field_1.Value = pGVar2[0x9c].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9c].field_1.Value = pGVar2[0x9c].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9c].field_1.Value = pGVar2[0x9c].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9c].field_1.Value = pGVar2[0x9c].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9c].field_1.Value = pGVar2[0x9c].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9c].field_1.Value = pGVar2[0x9c].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9c].field_1.Value = pGVar2[0x9c].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9c].field_1.Value = pGVar2[0x9c].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9d].field_1.Value = pGVar2[0x9d].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9d].field_1.Value = pGVar2[0x9d].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9d].field_1.Value = pGVar2[0x9d].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9d].field_1.Value = pGVar2[0x9d].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9d].field_1.Value = pGVar2[0x9d].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9d].field_1.Value = pGVar2[0x9d].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9d].field_1.Value = pGVar2[0x9d].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9d].field_1.Value = pGVar2[0x9d].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9d].field_1.Value = pGVar2[0x9d].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9d].field_1.Value = pGVar2[0x9d].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9d].field_1.Value = pGVar2[0x9d].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9d].field_1.Value = pGVar2[0x9d].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9d].field_1.Value = pGVar2[0x9d].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9d].field_1.Value = pGVar2[0x9d].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9d].field_1.Value = pGVar2[0x9d].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9d].field_1.Value = pGVar2[0x9d].field_1.Value & 0xfffffffffdffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9d].field_1.Value = pGVar2[0x9d].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9d].field_1.Value = pGVar2[0x9d].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9d].field_1.Value = pGVar2[0x9d].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9d].field_1.Value = pGVar2[0x9d].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9d].field_1.Value = pGVar2[0x9d].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9d].field_1.Value = pGVar2[0x9d].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9d].field_1.Value = pGVar2[0x9d].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9d].field_1.Value = pGVar2[0x9d].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9e].field_1.Value = pGVar2[0x9e].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9e].field_1.Value = pGVar2[0x9e].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9e].field_1.Value = pGVar2[0x9e].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9e].field_1.Value = pGVar2[0x9e].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9e].field_1.Value = pGVar2[0x9e].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9e].field_1.Value = pGVar2[0x9e].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9e].field_1.Value = pGVar2[0x9e].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9e].field_1.Value = pGVar2[0x9e].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9e].field_1.Value = pGVar2[0x9e].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9e].field_1.Value = pGVar2[0x9e].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9e].field_1.Value = pGVar2[0x9e].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9e].field_1.Value = pGVar2[0x9e].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9e].field_1.Value = pGVar2[0x9e].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9e].field_1.Value = pGVar2[0x9e].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9e].field_1.Value = pGVar2[0x9e].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9e].field_1.Value = pGVar2[0x9e].field_1.Value & 0xfffffffffdffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9e].field_1.Value = pGVar2[0x9e].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9e].field_1.Value = pGVar2[0x9e].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9e].field_1.Value = pGVar2[0x9e].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9e].field_1.Value = pGVar2[0x9e].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9e].field_1.Value = pGVar2[0x9e].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9e].field_1.Value = pGVar2[0x9e].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9e].field_1.Value = pGVar2[0x9e].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9e].field_1.Value = pGVar2[0x9e].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9f].field_1.Value = pGVar2[0x9f].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9f].field_1.Value = pGVar2[0x9f].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9f].field_1.Value = pGVar2[0x9f].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9f].field_1.Value = pGVar2[0x9f].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9f].field_1.Value = pGVar2[0x9f].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9f].field_1.Value = pGVar2[0x9f].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9f].field_1.Value = pGVar2[0x9f].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9f].field_1.Value = pGVar2[0x9f].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9f].field_1.Value = pGVar2[0x9f].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9f].field_1.Value = pGVar2[0x9f].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9f].field_1.Value = pGVar2[0x9f].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9f].field_1.Value = pGVar2[0x9f].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9f].field_1.Value = pGVar2[0x9f].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9f].field_1.Value = pGVar2[0x9f].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9f].field_1.Value = pGVar2[0x9f].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9f].field_1.Value = pGVar2[0x9f].field_1.Value & 0xfffffffffdffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9f].field_1.Value = pGVar2[0x9f].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9f].field_1.Value = pGVar2[0x9f].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9f].field_1.Value = pGVar2[0x9f].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9f].field_1.Value = pGVar2[0x9f].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9f].field_1.Value = pGVar2[0x9f].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9f].field_1.Value = pGVar2[0x9f].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9f].field_1.Value = pGVar2[0x9f].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x9f].field_1.Value = pGVar2[0x9f].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa0].field_1.Value = pGVar2[0xa0].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa0].field_1.Value = pGVar2[0xa0].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa0].field_1.Value = pGVar2[0xa0].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa0].field_1.Value = pGVar2[0xa0].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa0].field_1.Value = pGVar2[0xa0].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa0].field_1.Value = pGVar2[0xa0].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa0].field_1.Value = pGVar2[0xa0].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa0].field_1.Value = pGVar2[0xa0].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa0].field_1.Value = pGVar2[0xa0].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa0].field_1.Value = pGVar2[0xa0].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa0].field_1.Value = pGVar2[0xa0].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa0].field_1.Value = pGVar2[0xa0].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa0].field_1.Value = pGVar2[0xa0].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa0].field_1.Value = pGVar2[0xa0].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa0].field_1.Value = pGVar2[0xa0].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa0].field_1.Value = pGVar2[0xa0].field_1.Value & 0xfffffffffdffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa0].field_1.Value = pGVar2[0xa0].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa0].field_1.Value = pGVar2[0xa0].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa0].field_1.Value = pGVar2[0xa0].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa0].field_1.Value = pGVar2[0xa0].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa0].field_1.Value = pGVar2[0xa0].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa0].field_1.Value = pGVar2[0xa0].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa0].field_1.Value = pGVar2[0xa0].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa0].field_1.Value = pGVar2[0xa0].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa4].field_1.Value = pGVar2[0xa4].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa4].field_1.Value = pGVar2[0xa4].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa4].field_1.Value = pGVar2[0xa4].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa4].field_1.Value = pGVar2[0xa4].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa4].field_1.Value = pGVar2[0xa4].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa4].field_1.Value = pGVar2[0xa4].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa4].field_1.Value = pGVar2[0xa4].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa4].field_1.Value = pGVar2[0xa4].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa4].field_1.Value = pGVar2[0xa4].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa4].field_1.Value = pGVar2[0xa4].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa4].field_1.Value = pGVar2[0xa4].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa4].field_1.Value = pGVar2[0xa4].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa4].field_1.Value = pGVar2[0xa4].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa4].field_1.Value = pGVar2[0xa4].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa4].field_1.Value = pGVar2[0xa4].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa4].field_1.Value = pGVar2[0xa4].field_1.Value & 0xfffffffffdffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa4].field_1.Value = pGVar2[0xa4].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa4].field_1.Value = pGVar2[0xa4].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa4].field_1.Value = pGVar2[0xa4].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa4].field_1.Value = pGVar2[0xa4].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa4].field_1.Value = pGVar2[0xa4].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa4].field_1.Value = pGVar2[0xa4].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa4].field_1.Value = pGVar2[0xa4].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa4].field_1.Value = pGVar2[0xa4].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa5].field_1.Value = pGVar2[0xa5].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa5].field_1.Value = pGVar2[0xa5].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa5].field_1.Value = pGVar2[0xa5].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa5].field_1.Value = pGVar2[0xa5].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa5].field_1.Value = pGVar2[0xa5].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa5].field_1.Value = pGVar2[0xa5].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa5].field_1.Value = pGVar2[0xa5].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa5].field_1.Value = pGVar2[0xa5].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa5].field_1.Value = pGVar2[0xa5].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa5].field_1.Value = pGVar2[0xa5].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa5].field_1.Value = pGVar2[0xa5].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa5].field_1.Value = pGVar2[0xa5].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa5].field_1.Value = pGVar2[0xa5].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa5].field_1.Value = pGVar2[0xa5].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa5].field_1.Value = pGVar2[0xa5].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa5].field_1.Value = pGVar2[0xa5].field_1.Value & 0xfffffffffdffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa5].field_1.Value = pGVar2[0xa5].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa5].field_1.Value = pGVar2[0xa5].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa5].field_1.Value = pGVar2[0xa5].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa5].field_1.Value = pGVar2[0xa5].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa5].field_1.Value = pGVar2[0xa5].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa5].field_1.Value = pGVar2[0xa5].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa5].field_1.Value = pGVar2[0xa5].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa5].field_1.Value = pGVar2[0xa5].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa6].field_1.Value = pGVar2[0xa6].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa6].field_1.Value = pGVar2[0xa6].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa6].field_1.Value = pGVar2[0xa6].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa6].field_1.Value = pGVar2[0xa6].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa6].field_1.Value = pGVar2[0xa6].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa6].field_1.Value = pGVar2[0xa6].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa6].field_1.Value = pGVar2[0xa6].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa6].field_1.Value = pGVar2[0xa6].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa6].field_1.Value = pGVar2[0xa6].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa6].field_1.Value = pGVar2[0xa6].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa6].field_1.Value = pGVar2[0xa6].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa6].field_1.Value = pGVar2[0xa6].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa6].field_1.Value = pGVar2[0xa6].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa6].field_1.Value = pGVar2[0xa6].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa6].field_1.Value = pGVar2[0xa6].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa6].field_1.Value = pGVar2[0xa6].field_1.Value & 0xfffffffffdffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa6].field_1.Value = pGVar2[0xa6].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa6].field_1.Value = pGVar2[0xa6].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa6].field_1.Value = pGVar2[0xa6].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa6].field_1.Value = pGVar2[0xa6].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa6].field_1.Value = pGVar2[0xa6].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa6].field_1.Value = pGVar2[0xa6].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa6].field_1.Value = pGVar2[0xa6].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa6].field_1.Value = pGVar2[0xa6].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa7].field_1.Value = pGVar2[0xa7].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa7].field_1.Value = pGVar2[0xa7].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa7].field_1.Value = pGVar2[0xa7].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa7].field_1.Value = pGVar2[0xa7].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa7].field_1.Value = pGVar2[0xa7].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa7].field_1.Value = pGVar2[0xa7].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa7].field_1.Value = pGVar2[0xa7].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa7].field_1.Value = pGVar2[0xa7].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa7].field_1.Value = pGVar2[0xa7].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa7].field_1.Value = pGVar2[0xa7].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa7].field_1.Value = pGVar2[0xa7].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa7].field_1.Value = pGVar2[0xa7].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa7].field_1.Value = pGVar2[0xa7].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa7].field_1.Value = pGVar2[0xa7].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa7].field_1.Value = pGVar2[0xa7].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa7].field_1.Value = pGVar2[0xa7].field_1.Value & 0xfffffffffdffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa7].field_1.Value = pGVar2[0xa7].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa7].field_1.Value = pGVar2[0xa7].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa7].field_1.Value = pGVar2[0xa7].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa7].field_1.Value = pGVar2[0xa7].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa7].field_1.Value = pGVar2[0xa7].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa7].field_1.Value = pGVar2[0xa7].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa7].field_1.Value = pGVar2[0xa7].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa7].field_1.Value = pGVar2[0xa7].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa8].field_1.Value = pGVar2[0xa8].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa8].field_1.Value = pGVar2[0xa8].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa8].field_1.Value = pGVar2[0xa8].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa8].field_1.Value = pGVar2[0xa8].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa8].field_1.Value = pGVar2[0xa8].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa8].field_1.Value = pGVar2[0xa8].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa8].field_1.Value = pGVar2[0xa8].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa8].field_1.Value = pGVar2[0xa8].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa8].field_1.Value = pGVar2[0xa8].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa8].field_1.Value = pGVar2[0xa8].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa8].field_1.Value = pGVar2[0xa8].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa8].field_1.Value = pGVar2[0xa8].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa8].field_1.Value = pGVar2[0xa8].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa8].field_1.Value = pGVar2[0xa8].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa8].field_1.Value = pGVar2[0xa8].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa8].field_1.Value = pGVar2[0xa8].field_1.Value & 0xfffffffffdffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa8].field_1.Value = pGVar2[0xa8].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa8].field_1.Value = pGVar2[0xa8].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa8].field_1.Value = pGVar2[0xa8].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa8].field_1.Value = pGVar2[0xa8].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa8].field_1.Value = pGVar2[0xa8].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa8].field_1.Value = pGVar2[0xa8].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa8].field_1.Value = pGVar2[0xa8].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa8].field_1.Value = pGVar2[0xa8].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb1].field_1.Value = pGVar2[0xb1].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb1].field_1.Value = pGVar2[0xb1].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb1].field_1.Value = pGVar2[0xb1].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb1].field_1.Value = pGVar2[0xb1].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb1].field_1.Value = pGVar2[0xb1].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb1].field_1.Value = pGVar2[0xb1].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb1].field_1.Value = pGVar2[0xb1].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb1].field_1.Value = pGVar2[0xb1].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb1].field_1.Value = pGVar2[0xb1].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb1].field_1.Value = pGVar2[0xb1].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb1].field_1.Value = pGVar2[0xb1].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb1].field_1.Value = pGVar2[0xb1].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb1].field_1.Value = pGVar2[0xb1].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb1].field_1.Value = pGVar2[0xb1].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb1].field_1.Value = pGVar2[0xb1].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb1].field_1.Value = pGVar2[0xb1].field_1.Value & 0xfffffffffdffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb1].field_1.Value = pGVar2[0xb1].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb1].field_1.Value = pGVar2[0xb1].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb1].field_1.Value = pGVar2[0xb1].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb1].field_1.Value = pGVar2[0xb1].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb1].field_1.Value = pGVar2[0xb1].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb1].field_1.Value = pGVar2[0xb1].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb1].field_1.Value = pGVar2[0xb1].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb1].field_1.Value = pGVar2[0xb1].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb2].field_1.Value = pGVar2[0xb2].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb2].field_1.Value = pGVar2[0xb2].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb2].field_1.Value = pGVar2[0xb2].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb2].field_1.Value = pGVar2[0xb2].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb2].field_1.Value = pGVar2[0xb2].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb2].field_1.Value = pGVar2[0xb2].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb2].field_1.Value = pGVar2[0xb2].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb2].field_1.Value = pGVar2[0xb2].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb2].field_1.Value = pGVar2[0xb2].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb2].field_1.Value = pGVar2[0xb2].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb2].field_1.Value = pGVar2[0xb2].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb2].field_1.Value = pGVar2[0xb2].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb2].field_1.Value = pGVar2[0xb2].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb2].field_1.Value = pGVar2[0xb2].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb2].field_1.Value = pGVar2[0xb2].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb2].field_1.Value = pGVar2[0xb2].field_1.Value & 0xfffffffffdffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb2].field_1.Value = pGVar2[0xb2].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb2].field_1.Value = pGVar2[0xb2].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb2].field_1.Value = pGVar2[0xb2].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb2].field_1.Value = pGVar2[0xb2].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb2].field_1.Value = pGVar2[0xb2].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb2].field_1.Value = pGVar2[0xb2].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb2].field_1.Value = pGVar2[0xb2].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb2].field_1.Value = pGVar2[0xb2].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb3].field_1.Value = pGVar2[0xb3].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb3].field_1.Value = pGVar2[0xb3].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb3].field_1.Value = pGVar2[0xb3].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb3].field_1.Value = pGVar2[0xb3].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb3].field_1.Value = pGVar2[0xb3].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb3].field_1.Value = pGVar2[0xb3].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb3].field_1.Value = pGVar2[0xb3].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb3].field_1.Value = pGVar2[0xb3].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb3].field_1.Value = pGVar2[0xb3].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb3].field_1.Value = pGVar2[0xb3].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb3].field_1.Value = pGVar2[0xb3].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb3].field_1.Value = pGVar2[0xb3].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb3].field_1.Value = pGVar2[0xb3].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb3].field_1.Value = pGVar2[0xb3].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb3].field_1.Value = pGVar2[0xb3].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb3].field_1.Value = pGVar2[0xb3].field_1.Value & 0xfffffffffdffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb3].field_1.Value = pGVar2[0xb3].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb3].field_1.Value = pGVar2[0xb3].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb3].field_1.Value = pGVar2[0xb3].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb3].field_1.Value = pGVar2[0xb3].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb3].field_1.Value = pGVar2[0xb3].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb3].field_1.Value = pGVar2[0xb3].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb3].field_1.Value = pGVar2[0xb3].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb3].field_1.Value = pGVar2[0xb3].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb4].field_1.Value = pGVar2[0xb4].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb4].field_1.Value = pGVar2[0xb4].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb4].field_1.Value = pGVar2[0xb4].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb4].field_1.Value = pGVar2[0xb4].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb4].field_1.Value = pGVar2[0xb4].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb4].field_1.Value = pGVar2[0xb4].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb4].field_1.Value = pGVar2[0xb4].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb4].field_1.Value = pGVar2[0xb4].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb4].field_1.Value = pGVar2[0xb4].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb4].field_1.Value = pGVar2[0xb4].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb4].field_1.Value = pGVar2[0xb4].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb4].field_1.Value = pGVar2[0xb4].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb4].field_1.Value = pGVar2[0xb4].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb4].field_1.Value = pGVar2[0xb4].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb4].field_1.Value = pGVar2[0xb4].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb4].field_1.Value = pGVar2[0xb4].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb4].field_1.Value = pGVar2[0xb4].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb4].field_1.Value = pGVar2[0xb4].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb4].field_1.Value = pGVar2[0xb4].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb4].field_1.Value = pGVar2[0xb4].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb4].field_1.Value = pGVar2[0xb4].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb4].field_1.Value = pGVar2[0xb4].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb4].field_1.Value = pGVar2[0xb4].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb4].field_1.Value = pGVar2[0xb4].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3c].field_1.Value = pGVar2[0x3c].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3c].field_1.Value = pGVar2[0x3c].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3c].field_1.Value = pGVar2[0x3c].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3c].field_1.Value = pGVar2[0x3c].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3c].field_1.Value = pGVar2[0x3c].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3c].field_1.Value = pGVar2[0x3c].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3c].field_1.Value = pGVar2[0x3c].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3c].field_1.Value = pGVar2[0x3c].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3c].field_1.Value = pGVar2[0x3c].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3c].field_1.Value = pGVar2[0x3c].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3c].field_1.Value = pGVar2[0x3c].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3c].field_1.Value = pGVar2[0x3c].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3c].field_1.Value = pGVar2[0x3c].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3c].field_1.Value = pGVar2[0x3c].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3c].field_1.Value = pGVar2[0x3c].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3c].field_1.Value = pGVar2[0x3c].field_1.Value & 0xfffffffffdffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3c].field_1.Value = pGVar2[0x3c].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3c].field_1.Value = pGVar2[0x3c].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3c].field_1.Value = pGVar2[0x3c].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3c].field_1.Value = pGVar2[0x3c].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3c].field_1.Value = pGVar2[0x3c].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3c].field_1.Value = pGVar2[0x3c].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3c].field_1.Value = pGVar2[0x3c].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x3c].field_1.Value = pGVar2[0x3c].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb5].field_1.Value = pGVar2[0xb5].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb5].field_1.Value = pGVar2[0xb5].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb5].field_1.Value = pGVar2[0xb5].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb5].field_1.Value = pGVar2[0xb5].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb5].field_1.Value = pGVar2[0xb5].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb5].field_1.Value = pGVar2[0xb5].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb5].field_1.Value = pGVar2[0xb5].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb5].field_1.Value = pGVar2[0xb5].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb5].field_1.Value = pGVar2[0xb5].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb5].field_1.Value = pGVar2[0xb5].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb5].field_1.Value = pGVar2[0xb5].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb5].field_1.Value = pGVar2[0xb5].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb5].field_1.Value = pGVar2[0xb5].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb5].field_1.Value = pGVar2[0xb5].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb5].field_1.Value = pGVar2[0xb5].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb5].field_1.Value = pGVar2[0xb5].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb5].field_1.Value = pGVar2[0xb5].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb5].field_1.Value = pGVar2[0xb5].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb5].field_1.Value = pGVar2[0xb5].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb5].field_1.Value = pGVar2[0xb5].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb5].field_1.Value = pGVar2[0xb5].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb5].field_1.Value = pGVar2[0xb5].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb5].field_1.Value = pGVar2[0xb5].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb5].field_1.Value = pGVar2[0xb5].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb6].field_1.Value = pGVar2[0xb6].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb6].field_1.Value = pGVar2[0xb6].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb6].field_1.Value = pGVar2[0xb6].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb6].field_1.Value = pGVar2[0xb6].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb6].field_1.Value = pGVar2[0xb6].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb6].field_1.Value = pGVar2[0xb6].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb6].field_1.Value = pGVar2[0xb6].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb6].field_1.Value = pGVar2[0xb6].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb6].field_1.Value = pGVar2[0xb6].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb6].field_1.Value = pGVar2[0xb6].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb6].field_1.Value = pGVar2[0xb6].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb6].field_1.Value = pGVar2[0xb6].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb6].field_1.Value = pGVar2[0xb6].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb6].field_1.Value = pGVar2[0xb6].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb6].field_1.Value = pGVar2[0xb6].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb6].field_1.Value = pGVar2[0xb6].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb6].field_1.Value = pGVar2[0xb6].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb6].field_1.Value = pGVar2[0xb6].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb6].field_1.Value = pGVar2[0xb6].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb6].field_1.Value = pGVar2[0xb6].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb6].field_1.Value = pGVar2[0xb6].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb6].field_1.Value = pGVar2[0xb6].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb6].field_1.Value = pGVar2[0xb6].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb6].field_1.Value = pGVar2[0xb6].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb7].field_1.Value = pGVar2[0xb7].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb7].field_1.Value = pGVar2[0xb7].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb7].field_1.Value = pGVar2[0xb7].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb7].field_1.Value = pGVar2[0xb7].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb7].field_1.Value = pGVar2[0xb7].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb7].field_1.Value = pGVar2[0xb7].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb7].field_1.Value = pGVar2[0xb7].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb7].field_1.Value = pGVar2[0xb7].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb7].field_1.Value = pGVar2[0xb7].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb7].field_1.Value = pGVar2[0xb7].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb7].field_1.Value = pGVar2[0xb7].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb7].field_1.Value = pGVar2[0xb7].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb7].field_1.Value = pGVar2[0xb7].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb7].field_1.Value = pGVar2[0xb7].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb7].field_1.Value = pGVar2[0xb7].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb7].field_1.Value = pGVar2[0xb7].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb7].field_1.Value = pGVar2[0xb7].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb7].field_1.Value = pGVar2[0xb7].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb7].field_1.Value = pGVar2[0xb7].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb7].field_1.Value = pGVar2[0xb7].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb7].field_1.Value = pGVar2[0xb7].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb7].field_1.Value = pGVar2[0xb7].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb7].field_1.Value = pGVar2[0xb7].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb7].field_1.Value = pGVar2[0xb7].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb8].field_1.Value = pGVar2[0xb8].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb8].field_1.Value = pGVar2[0xb8].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb8].field_1.Value = pGVar2[0xb8].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb8].field_1.Value = pGVar2[0xb8].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb8].field_1.Value = pGVar2[0xb8].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb8].field_1.Value = pGVar2[0xb8].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb8].field_1.Value = pGVar2[0xb8].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb8].field_1.Value = pGVar2[0xb8].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb8].field_1.Value = pGVar2[0xb8].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb8].field_1.Value = pGVar2[0xb8].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb8].field_1.Value = pGVar2[0xb8].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb8].field_1.Value = pGVar2[0xb8].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb8].field_1.Value = pGVar2[0xb8].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb8].field_1.Value = pGVar2[0xb8].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb8].field_1.Value = pGVar2[0xb8].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb8].field_1.Value = pGVar2[0xb8].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb8].field_1.Value = pGVar2[0xb8].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb8].field_1.Value = pGVar2[0xb8].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb8].field_1.Value = pGVar2[0xb8].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb8].field_1.Value = pGVar2[0xb8].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb8].field_1.Value = pGVar2[0xb8].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb8].field_1.Value = pGVar2[0xb8].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb8].field_1.Value = pGVar2[0xb8].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb8].field_1.Value = pGVar2[0xb8].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb9].field_1.Value = pGVar2[0xb9].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb9].field_1.Value = pGVar2[0xb9].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb9].field_1.Value = pGVar2[0xb9].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb9].field_1.Value = pGVar2[0xb9].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb9].field_1.Value = pGVar2[0xb9].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb9].field_1.Value = pGVar2[0xb9].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb9].field_1.Value = pGVar2[0xb9].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb9].field_1.Value = pGVar2[0xb9].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb9].field_1.Value = pGVar2[0xb9].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb9].field_1.Value = pGVar2[0xb9].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb9].field_1.Value = pGVar2[0xb9].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb9].field_1.Value = pGVar2[0xb9].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb9].field_1.Value = pGVar2[0xb9].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb9].field_1.Value = pGVar2[0xb9].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb9].field_1.Value = pGVar2[0xb9].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb9].field_1.Value = pGVar2[0xb9].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb9].field_1.Value = pGVar2[0xb9].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb9].field_1.Value = pGVar2[0xb9].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb9].field_1.Value = pGVar2[0xb9].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb9].field_1.Value = pGVar2[0xb9].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb9].field_1.Value = pGVar2[0xb9].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb9].field_1.Value = pGVar2[0xb9].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb9].field_1.Value = pGVar2[0xb9].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb9].field_1.Value = pGVar2[0xb9].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xba].field_1.Value = pGVar2[0xba].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xba].field_1.Value = pGVar2[0xba].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xba].field_1.Value = pGVar2[0xba].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xba].field_1.Value = pGVar2[0xba].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xba].field_1.Value = pGVar2[0xba].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xba].field_1.Value = pGVar2[0xba].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xba].field_1.Value = pGVar2[0xba].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xba].field_1.Value = pGVar2[0xba].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xba].field_1.Value = pGVar2[0xba].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xba].field_1.Value = pGVar2[0xba].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xba].field_1.Value = pGVar2[0xba].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xba].field_1.Value = pGVar2[0xba].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xba].field_1.Value = pGVar2[0xba].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xba].field_1.Value = pGVar2[0xba].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xba].field_1.Value = pGVar2[0xba].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xba].field_1.Value = pGVar2[0xba].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xba].field_1.Value = pGVar2[0xba].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xba].field_1.Value = pGVar2[0xba].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xba].field_1.Value = pGVar2[0xba].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xba].field_1.Value = pGVar2[0xba].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xba].field_1.Value = pGVar2[0xba].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xba].field_1.Value = pGVar2[0xba].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xba].field_1.Value = pGVar2[0xba].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xba].field_1.Value = pGVar2[0xba].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbb].field_1.Value = pGVar2[0xbb].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbb].field_1.Value = pGVar2[0xbb].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbb].field_1.Value = pGVar2[0xbb].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbb].field_1.Value = pGVar2[0xbb].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbb].field_1.Value = pGVar2[0xbb].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbb].field_1.Value = pGVar2[0xbb].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbb].field_1.Value = pGVar2[0xbb].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbb].field_1.Value = pGVar2[0xbb].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbb].field_1.Value = pGVar2[0xbb].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbb].field_1.Value = pGVar2[0xbb].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbb].field_1.Value = pGVar2[0xbb].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbb].field_1.Value = pGVar2[0xbb].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbb].field_1.Value = pGVar2[0xbb].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbb].field_1.Value = pGVar2[0xbb].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbb].field_1.Value = pGVar2[0xbb].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbb].field_1.Value = pGVar2[0xbb].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbb].field_1.Value = pGVar2[0xbb].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbb].field_1.Value = pGVar2[0xbb].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbb].field_1.Value = pGVar2[0xbb].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbb].field_1.Value = pGVar2[0xbb].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbb].field_1.Value = pGVar2[0xbb].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbb].field_1.Value = pGVar2[0xbb].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbb].field_1.Value = pGVar2[0xbb].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbb].field_1.Value = pGVar2[0xbb].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbc].field_1.Value = pGVar2[0xbc].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbc].field_1.Value = pGVar2[0xbc].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbc].field_1.Value = pGVar2[0xbc].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbc].field_1.Value = pGVar2[0xbc].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbc].field_1.Value = pGVar2[0xbc].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbc].field_1.Value = pGVar2[0xbc].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbc].field_1.Value = pGVar2[0xbc].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbc].field_1.Value = pGVar2[0xbc].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbc].field_1.Value = pGVar2[0xbc].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbc].field_1.Value = pGVar2[0xbc].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbc].field_1.Value = pGVar2[0xbc].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbc].field_1.Value = pGVar2[0xbc].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbc].field_1.Value = pGVar2[0xbc].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbc].field_1.Value = pGVar2[0xbc].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbc].field_1.Value = pGVar2[0xbc].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbc].field_1.Value = pGVar2[0xbc].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbc].field_1.Value = pGVar2[0xbc].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbc].field_1.Value = pGVar2[0xbc].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbc].field_1.Value = pGVar2[0xbc].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbc].field_1.Value = pGVar2[0xbc].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbc].field_1.Value = pGVar2[0xbc].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbc].field_1.Value = pGVar2[0xbc].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbc].field_1.Value = pGVar2[0xbc].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbc].field_1.Value = pGVar2[0xbc].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbd].field_1.Value = pGVar2[0xbd].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbd].field_1.Value = pGVar2[0xbd].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbd].field_1.Value = pGVar2[0xbd].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbd].field_1.Value = pGVar2[0xbd].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbd].field_1.Value = pGVar2[0xbd].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbd].field_1.Value = pGVar2[0xbd].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbd].field_1.Value = pGVar2[0xbd].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbd].field_1.Value = pGVar2[0xbd].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbd].field_1.Value = pGVar2[0xbd].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbd].field_1.Value = pGVar2[0xbd].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbd].field_1.Value = pGVar2[0xbd].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbd].field_1.Value = pGVar2[0xbd].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbd].field_1.Value = pGVar2[0xbd].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbd].field_1.Value = pGVar2[0xbd].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbd].field_1.Value = pGVar2[0xbd].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbd].field_1.Value = pGVar2[0xbd].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbd].field_1.Value = pGVar2[0xbd].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbd].field_1.Value = pGVar2[0xbd].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbd].field_1.Value = pGVar2[0xbd].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbd].field_1.Value = pGVar2[0xbd].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbd].field_1.Value = pGVar2[0xbd].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbd].field_1.Value = pGVar2[0xbd].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbd].field_1.Value = pGVar2[0xbd].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbd].field_1.Value = pGVar2[0xbd].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbe].field_1.Value = pGVar2[0xbe].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbe].field_1.Value = pGVar2[0xbe].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbe].field_1.Value = pGVar2[0xbe].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbe].field_1.Value = pGVar2[0xbe].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbe].field_1.Value = pGVar2[0xbe].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbe].field_1.Value = pGVar2[0xbe].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbe].field_1.Value = pGVar2[0xbe].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbe].field_1.Value = pGVar2[0xbe].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbe].field_1.Value = pGVar2[0xbe].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbe].field_1.Value = pGVar2[0xbe].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbe].field_1.Value = pGVar2[0xbe].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbe].field_1.Value = pGVar2[0xbe].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbe].field_1.Value = pGVar2[0xbe].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbe].field_1.Value = pGVar2[0xbe].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbe].field_1.Value = pGVar2[0xbe].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbe].field_1.Value = pGVar2[0xbe].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbe].field_1.Value = pGVar2[0xbe].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbe].field_1.Value = pGVar2[0xbe].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbe].field_1.Value = pGVar2[0xbe].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbe].field_1.Value = pGVar2[0xbe].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbe].field_1.Value = pGVar2[0xbe].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbe].field_1.Value = pGVar2[0xbe].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbe].field_1.Value = pGVar2[0xbe].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbe].field_1.Value = pGVar2[0xbe].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbf].field_1.Value = pGVar2[0xbf].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbf].field_1.Value = pGVar2[0xbf].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbf].field_1.Value = pGVar2[0xbf].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbf].field_1.Value = pGVar2[0xbf].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbf].field_1.Value = pGVar2[0xbf].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbf].field_1.Value = pGVar2[0xbf].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbf].field_1.Value = pGVar2[0xbf].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbf].field_1.Value = pGVar2[0xbf].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbf].field_1.Value = pGVar2[0xbf].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbf].field_1.Value = pGVar2[0xbf].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbf].field_1.Value = pGVar2[0xbf].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbf].field_1.Value = pGVar2[0xbf].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbf].field_1.Value = pGVar2[0xbf].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbf].field_1.Value = pGVar2[0xbf].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbf].field_1.Value = pGVar2[0xbf].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbf].field_1.Value = pGVar2[0xbf].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbf].field_1.Value = pGVar2[0xbf].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbf].field_1.Value = pGVar2[0xbf].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbf].field_1.Value = pGVar2[0xbf].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbf].field_1.Value = pGVar2[0xbf].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbf].field_1.Value = pGVar2[0xbf].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbf].field_1.Value = pGVar2[0xbf].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbf].field_1.Value = pGVar2[0xbf].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xbf].field_1.Value = pGVar2[0xbf].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc0].field_1.Value = pGVar2[0xc0].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc0].field_1.Value = pGVar2[0xc0].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc0].field_1.Value = pGVar2[0xc0].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc0].field_1.Value = pGVar2[0xc0].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc0].field_1.Value = pGVar2[0xc0].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc0].field_1.Value = pGVar2[0xc0].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc0].field_1.Value = pGVar2[0xc0].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc0].field_1.Value = pGVar2[0xc0].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc0].field_1.Value = pGVar2[0xc0].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc0].field_1.Value = pGVar2[0xc0].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc0].field_1.Value = pGVar2[0xc0].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc0].field_1.Value = pGVar2[0xc0].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc0].field_1.Value = pGVar2[0xc0].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc0].field_1.Value = pGVar2[0xc0].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc0].field_1.Value = pGVar2[0xc0].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc0].field_1.Value = pGVar2[0xc0].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc0].field_1.Value = pGVar2[0xc0].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc0].field_1.Value = pGVar2[0xc0].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc0].field_1.Value = pGVar2[0xc0].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc0].field_1.Value = pGVar2[0xc0].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc0].field_1.Value = pGVar2[0xc0].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc0].field_1.Value = pGVar2[0xc0].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc0].field_1.Value = pGVar2[0xc0].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc0].field_1.Value = pGVar2[0xc0].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc1].field_1.Value = pGVar2[0xc1].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc1].field_1.Value = pGVar2[0xc1].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc1].field_1.Value = pGVar2[0xc1].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc1].field_1.Value = pGVar2[0xc1].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc1].field_1.Value = pGVar2[0xc1].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc1].field_1.Value = pGVar2[0xc1].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc1].field_1.Value = pGVar2[0xc1].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc1].field_1.Value = pGVar2[0xc1].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc1].field_1.Value = pGVar2[0xc1].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc1].field_1.Value = pGVar2[0xc1].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc1].field_1.Value = pGVar2[0xc1].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc1].field_1.Value = pGVar2[0xc1].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc1].field_1.Value = pGVar2[0xc1].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc1].field_1.Value = pGVar2[0xc1].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc1].field_1.Value = pGVar2[0xc1].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc1].field_1.Value = pGVar2[0xc1].field_1.Value & 0xfffffffffdffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc1].field_1.Value = pGVar2[0xc1].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc1].field_1.Value = pGVar2[0xc1].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc1].field_1.Value = pGVar2[0xc1].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc1].field_1.Value = pGVar2[0xc1].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc1].field_1.Value = pGVar2[0xc1].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc1].field_1.Value = pGVar2[0xc1].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc1].field_1.Value = pGVar2[0xc1].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc1].field_1.Value = pGVar2[0xc1].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc2].field_1.Value = pGVar2[0xc2].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc2].field_1.Value = pGVar2[0xc2].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc2].field_1.Value = pGVar2[0xc2].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc2].field_1.Value = pGVar2[0xc2].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc2].field_1.Value = pGVar2[0xc2].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc2].field_1.Value = pGVar2[0xc2].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc2].field_1.Value = pGVar2[0xc2].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc2].field_1.Value = pGVar2[0xc2].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc2].field_1.Value = pGVar2[0xc2].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc2].field_1.Value = pGVar2[0xc2].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc2].field_1.Value = pGVar2[0xc2].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc2].field_1.Value = pGVar2[0xc2].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc2].field_1.Value = pGVar2[0xc2].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc2].field_1.Value = pGVar2[0xc2].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc2].field_1.Value = pGVar2[0xc2].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc2].field_1.Value = pGVar2[0xc2].field_1.Value & 0xfffffffffdffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc2].field_1.Value = pGVar2[0xc2].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc2].field_1.Value = pGVar2[0xc2].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc2].field_1.Value = pGVar2[0xc2].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc2].field_1.Value = pGVar2[0xc2].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc2].field_1.Value = pGVar2[0xc2].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc2].field_1.Value = pGVar2[0xc2].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc2].field_1.Value = pGVar2[0xc2].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc2].field_1.Value = pGVar2[0xc2].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc3].field_1.Value = pGVar2[0xc3].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc3].field_1.Value = pGVar2[0xc3].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc3].field_1.Value = pGVar2[0xc3].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc3].field_1.Value = pGVar2[0xc3].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc3].field_1.Value = pGVar2[0xc3].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc3].field_1.Value = pGVar2[0xc3].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc3].field_1.Value = pGVar2[0xc3].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc3].field_1.Value = pGVar2[0xc3].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc3].field_1.Value = pGVar2[0xc3].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc3].field_1.Value = pGVar2[0xc3].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc3].field_1.Value = pGVar2[0xc3].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc3].field_1.Value = pGVar2[0xc3].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc3].field_1.Value = pGVar2[0xc3].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc3].field_1.Value = pGVar2[0xc3].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc3].field_1.Value = pGVar2[0xc3].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc3].field_1.Value = pGVar2[0xc3].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc3].field_1.Value = pGVar2[0xc3].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc3].field_1.Value = pGVar2[0xc3].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc3].field_1.Value = pGVar2[0xc3].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc3].field_1.Value = pGVar2[0xc3].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc3].field_1.Value = pGVar2[0xc3].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc3].field_1.Value = pGVar2[0xc3].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc3].field_1.Value = pGVar2[0xc3].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc3].field_1.Value = pGVar2[0xc3].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc4].field_1.Value = pGVar2[0xc4].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc4].field_1.Value = pGVar2[0xc4].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc4].field_1.Value = pGVar2[0xc4].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc4].field_1.Value = pGVar2[0xc4].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc4].field_1.Value = pGVar2[0xc4].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc4].field_1.Value = pGVar2[0xc4].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc4].field_1.Value = pGVar2[0xc4].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc4].field_1.Value = pGVar2[0xc4].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc4].field_1.Value = pGVar2[0xc4].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc4].field_1.Value = pGVar2[0xc4].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc4].field_1.Value = pGVar2[0xc4].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc4].field_1.Value = pGVar2[0xc4].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc4].field_1.Value = pGVar2[0xc4].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc4].field_1.Value = pGVar2[0xc4].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc4].field_1.Value = pGVar2[0xc4].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc4].field_1.Value = pGVar2[0xc4].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc4].field_1.Value = pGVar2[0xc4].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc4].field_1.Value = pGVar2[0xc4].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc4].field_1.Value = pGVar2[0xc4].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc4].field_1.Value = pGVar2[0xc4].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc4].field_1.Value = pGVar2[0xc4].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc4].field_1.Value = pGVar2[0xc4].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc4].field_1.Value = pGVar2[0xc4].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc4].field_1.Value = pGVar2[0xc4].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc5].field_1.Value = pGVar2[0xc5].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc5].field_1.Value = pGVar2[0xc5].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc5].field_1.Value = pGVar2[0xc5].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc5].field_1.Value = pGVar2[0xc5].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc5].field_1.Value = pGVar2[0xc5].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc5].field_1.Value = pGVar2[0xc5].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc5].field_1.Value = pGVar2[0xc5].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc5].field_1.Value = pGVar2[0xc5].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc5].field_1.Value = pGVar2[0xc5].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc5].field_1.Value = pGVar2[0xc5].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc5].field_1.Value = pGVar2[0xc5].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc5].field_1.Value = pGVar2[0xc5].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc5].field_1.Value = pGVar2[0xc5].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc5].field_1.Value = pGVar2[0xc5].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc5].field_1.Value = pGVar2[0xc5].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc5].field_1.Value = pGVar2[0xc5].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc5].field_1.Value = pGVar2[0xc5].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc5].field_1.Value = pGVar2[0xc5].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc5].field_1.Value = pGVar2[0xc5].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc5].field_1.Value = pGVar2[0xc5].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc5].field_1.Value = pGVar2[0xc5].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc5].field_1.Value = pGVar2[0xc5].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc5].field_1.Value = pGVar2[0xc5].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc5].field_1.Value = pGVar2[0xc5].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc6].field_1.Value = pGVar2[0xc6].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc6].field_1.Value = pGVar2[0xc6].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc6].field_1.Value = pGVar2[0xc6].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc6].field_1.Value = pGVar2[0xc6].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc6].field_1.Value = pGVar2[0xc6].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc6].field_1.Value = pGVar2[0xc6].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc6].field_1.Value = pGVar2[0xc6].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc6].field_1.Value = pGVar2[0xc6].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc6].field_1.Value = pGVar2[0xc6].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc6].field_1.Value = pGVar2[0xc6].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc6].field_1.Value = pGVar2[0xc6].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc6].field_1.Value = pGVar2[0xc6].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc6].field_1.Value = pGVar2[0xc6].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc6].field_1.Value = pGVar2[0xc6].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc6].field_1.Value = pGVar2[0xc6].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc6].field_1.Value = pGVar2[0xc6].field_1.Value & 0xfffffffffdffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc6].field_1.Value = pGVar2[0xc6].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc6].field_1.Value = pGVar2[0xc6].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc6].field_1.Value = pGVar2[0xc6].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc6].field_1.Value = pGVar2[0xc6].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc6].field_1.Value = pGVar2[0xc6].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc6].field_1.Value = pGVar2[0xc6].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc6].field_1.Value = pGVar2[0xc6].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc6].field_1.Value = pGVar2[0xc6].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[199].field_1.Value = pGVar2[199].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[199].field_1.Value = pGVar2[199].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[199].field_1.Value = pGVar2[199].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[199].field_1.Value = pGVar2[199].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[199].field_1.Value = pGVar2[199].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[199].field_1.Value = pGVar2[199].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[199].field_1.Value = pGVar2[199].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[199].field_1.Value = pGVar2[199].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[199].field_1.Value = pGVar2[199].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[199].field_1.Value = pGVar2[199].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[199].field_1.Value = pGVar2[199].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[199].field_1.Value = pGVar2[199].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[199].field_1.Value = pGVar2[199].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[199].field_1.Value = pGVar2[199].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[199].field_1.Value = pGVar2[199].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[199].field_1.Value = pGVar2[199].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[199].field_1.Value = pGVar2[199].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[199].field_1.Value = pGVar2[199].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[199].field_1.Value = pGVar2[199].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[199].field_1.Value = pGVar2[199].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[199].field_1.Value = pGVar2[199].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[199].field_1.Value = pGVar2[199].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[199].field_1.Value = pGVar2[199].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[199].field_1.Value = pGVar2[199].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[200].field_1.Value = pGVar2[200].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[200].field_1.Value = pGVar2[200].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[200].field_1.Value = pGVar2[200].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[200].field_1.Value = pGVar2[200].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[200].field_1.Value = pGVar2[200].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[200].field_1.Value = pGVar2[200].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[200].field_1.Value = pGVar2[200].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[200].field_1.Value = pGVar2[200].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[200].field_1.Value = pGVar2[200].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[200].field_1.Value = pGVar2[200].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[200].field_1.Value = pGVar2[200].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[200].field_1.Value = pGVar2[200].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[200].field_1.Value = pGVar2[200].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[200].field_1.Value = pGVar2[200].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[200].field_1.Value = pGVar2[200].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[200].field_1.Value = pGVar2[200].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[200].field_1.Value = pGVar2[200].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[200].field_1.Value = pGVar2[200].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[200].field_1.Value = pGVar2[200].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[200].field_1.Value = pGVar2[200].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[200].field_1.Value = pGVar2[200].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[200].field_1.Value = pGVar2[200].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[200].field_1.Value = pGVar2[200].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[200].field_1.Value = pGVar2[200].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc9].field_1.Value = pGVar2[0xc9].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc9].field_1.Value = pGVar2[0xc9].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc9].field_1.Value = pGVar2[0xc9].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc9].field_1.Value = pGVar2[0xc9].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc9].field_1.Value = pGVar2[0xc9].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc9].field_1.Value = pGVar2[0xc9].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc9].field_1.Value = pGVar2[0xc9].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc9].field_1.Value = pGVar2[0xc9].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc9].field_1.Value = pGVar2[0xc9].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc9].field_1.Value = pGVar2[0xc9].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc9].field_1.Value = pGVar2[0xc9].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc9].field_1.Value = pGVar2[0xc9].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc9].field_1.Value = pGVar2[0xc9].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc9].field_1.Value = pGVar2[0xc9].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc9].field_1.Value = pGVar2[0xc9].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc9].field_1.Value = pGVar2[0xc9].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc9].field_1.Value = pGVar2[0xc9].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc9].field_1.Value = pGVar2[0xc9].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc9].field_1.Value = pGVar2[0xc9].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc9].field_1.Value = pGVar2[0xc9].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc9].field_1.Value = pGVar2[0xc9].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc9].field_1.Value = pGVar2[0xc9].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc9].field_1.Value = pGVar2[0xc9].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xc9].field_1.Value = pGVar2[0xc9].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xca].field_1.Value = pGVar2[0xca].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xca].field_1.Value = pGVar2[0xca].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xca].field_1.Value = pGVar2[0xca].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xca].field_1.Value = pGVar2[0xca].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xca].field_1.Value = pGVar2[0xca].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xca].field_1.Value = pGVar2[0xca].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xca].field_1.Value = pGVar2[0xca].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xca].field_1.Value = pGVar2[0xca].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xca].field_1.Value = pGVar2[0xca].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xca].field_1.Value = pGVar2[0xca].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xca].field_1.Value = pGVar2[0xca].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xca].field_1.Value = pGVar2[0xca].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xca].field_1.Value = pGVar2[0xca].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xca].field_1.Value = pGVar2[0xca].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xca].field_1.Value = pGVar2[0xca].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xca].field_1.Value = pGVar2[0xca].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xca].field_1.Value = pGVar2[0xca].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xca].field_1.Value = pGVar2[0xca].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xca].field_1.Value = pGVar2[0xca].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xca].field_1.Value = pGVar2[0xca].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xca].field_1.Value = pGVar2[0xca].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xca].field_1.Value = pGVar2[0xca].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xca].field_1.Value = pGVar2[0xca].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xca].field_1.Value = pGVar2[0xca].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcb].field_1.Value = pGVar2[0xcb].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcb].field_1.Value = pGVar2[0xcb].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcb].field_1.Value = pGVar2[0xcb].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcb].field_1.Value = pGVar2[0xcb].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcb].field_1.Value = pGVar2[0xcb].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcb].field_1.Value = pGVar2[0xcb].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcb].field_1.Value = pGVar2[0xcb].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcb].field_1.Value = pGVar2[0xcb].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcb].field_1.Value = pGVar2[0xcb].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcb].field_1.Value = pGVar2[0xcb].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcb].field_1.Value = pGVar2[0xcb].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcb].field_1.Value = pGVar2[0xcb].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcb].field_1.Value = pGVar2[0xcb].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcb].field_1.Value = pGVar2[0xcb].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcb].field_1.Value = pGVar2[0xcb].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcb].field_1.Value = pGVar2[0xcb].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcb].field_1.Value = pGVar2[0xcb].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcb].field_1.Value = pGVar2[0xcb].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcb].field_1.Value = pGVar2[0xcb].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcb].field_1.Value = pGVar2[0xcb].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcb].field_1.Value = pGVar2[0xcb].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcb].field_1.Value = pGVar2[0xcb].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcb].field_1.Value = pGVar2[0xcb].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcb].field_1.Value = pGVar2[0xcb].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcc].field_1.Value = pGVar2[0xcc].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcc].field_1.Value = pGVar2[0xcc].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcc].field_1.Value = pGVar2[0xcc].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcc].field_1.Value = pGVar2[0xcc].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcc].field_1.Value = pGVar2[0xcc].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcc].field_1.Value = pGVar2[0xcc].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcc].field_1.Value = pGVar2[0xcc].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcc].field_1.Value = pGVar2[0xcc].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcc].field_1.Value = pGVar2[0xcc].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcc].field_1.Value = pGVar2[0xcc].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcc].field_1.Value = pGVar2[0xcc].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcc].field_1.Value = pGVar2[0xcc].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcc].field_1.Value = pGVar2[0xcc].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcc].field_1.Value = pGVar2[0xcc].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcc].field_1.Value = pGVar2[0xcc].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcc].field_1.Value = pGVar2[0xcc].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcc].field_1.Value = pGVar2[0xcc].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcc].field_1.Value = pGVar2[0xcc].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcc].field_1.Value = pGVar2[0xcc].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcc].field_1.Value = pGVar2[0xcc].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcc].field_1.Value = pGVar2[0xcc].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcc].field_1.Value = pGVar2[0xcc].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcc].field_1.Value = pGVar2[0xcc].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcc].field_1.Value = pGVar2[0xcc].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcd].field_1.Value = pGVar2[0xcd].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcd].field_1.Value = pGVar2[0xcd].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcd].field_1.Value = pGVar2[0xcd].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcd].field_1.Value = pGVar2[0xcd].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcd].field_1.Value = pGVar2[0xcd].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcd].field_1.Value = pGVar2[0xcd].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcd].field_1.Value = pGVar2[0xcd].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcd].field_1.Value = pGVar2[0xcd].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcd].field_1.Value = pGVar2[0xcd].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcd].field_1.Value = pGVar2[0xcd].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcd].field_1.Value = pGVar2[0xcd].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcd].field_1.Value = pGVar2[0xcd].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcd].field_1.Value = pGVar2[0xcd].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcd].field_1.Value = pGVar2[0xcd].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcd].field_1.Value = pGVar2[0xcd].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcd].field_1.Value = pGVar2[0xcd].field_1.Value & 0xfffffffffdffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcd].field_1.Value = pGVar2[0xcd].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcd].field_1.Value = pGVar2[0xcd].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcd].field_1.Value = pGVar2[0xcd].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcd].field_1.Value = pGVar2[0xcd].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcd].field_1.Value = pGVar2[0xcd].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcd].field_1.Value = pGVar2[0xcd].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcd].field_1.Value = pGVar2[0xcd].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcd].field_1.Value = pGVar2[0xcd].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xce].field_1.Value = pGVar2[0xce].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xce].field_1.Value = pGVar2[0xce].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xce].field_1.Value = pGVar2[0xce].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xce].field_1.Value = pGVar2[0xce].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xce].field_1.Value = pGVar2[0xce].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xce].field_1.Value = pGVar2[0xce].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xce].field_1.Value = pGVar2[0xce].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xce].field_1.Value = pGVar2[0xce].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xce].field_1.Value = pGVar2[0xce].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xce].field_1.Value = pGVar2[0xce].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xce].field_1.Value = pGVar2[0xce].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xce].field_1.Value = pGVar2[0xce].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xce].field_1.Value = pGVar2[0xce].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xce].field_1.Value = pGVar2[0xce].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xce].field_1.Value = pGVar2[0xce].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xce].field_1.Value = pGVar2[0xce].field_1.Value & 0xfffffffffdffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xce].field_1.Value = pGVar2[0xce].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xce].field_1.Value = pGVar2[0xce].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xce].field_1.Value = pGVar2[0xce].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xce].field_1.Value = pGVar2[0xce].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xce].field_1.Value = pGVar2[0xce].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xce].field_1.Value = pGVar2[0xce].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xce].field_1.Value = pGVar2[0xce].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xce].field_1.Value = pGVar2[0xce].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcf].field_1.Value = pGVar2[0xcf].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcf].field_1.Value = pGVar2[0xcf].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcf].field_1.Value = pGVar2[0xcf].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcf].field_1.Value = pGVar2[0xcf].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcf].field_1.Value = pGVar2[0xcf].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcf].field_1.Value = pGVar2[0xcf].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcf].field_1.Value = pGVar2[0xcf].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcf].field_1.Value = pGVar2[0xcf].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcf].field_1.Value = pGVar2[0xcf].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcf].field_1.Value = pGVar2[0xcf].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcf].field_1.Value = pGVar2[0xcf].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcf].field_1.Value = pGVar2[0xcf].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcf].field_1.Value = pGVar2[0xcf].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcf].field_1.Value = pGVar2[0xcf].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcf].field_1.Value = pGVar2[0xcf].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcf].field_1.Value = pGVar2[0xcf].field_1.Value & 0xfffffffffdffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcf].field_1.Value = pGVar2[0xcf].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcf].field_1.Value = pGVar2[0xcf].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcf].field_1.Value = pGVar2[0xcf].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcf].field_1.Value = pGVar2[0xcf].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcf].field_1.Value = pGVar2[0xcf].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcf].field_1.Value = pGVar2[0xcf].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcf].field_1.Value = pGVar2[0xcf].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xcf].field_1.Value = pGVar2[0xcf].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd0].field_1.Value = pGVar2[0xd0].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd0].field_1.Value = pGVar2[0xd0].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd0].field_1.Value = pGVar2[0xd0].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd0].field_1.Value = pGVar2[0xd0].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd0].field_1.Value = pGVar2[0xd0].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd0].field_1.Value = pGVar2[0xd0].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd0].field_1.Value = pGVar2[0xd0].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd0].field_1.Value = pGVar2[0xd0].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd0].field_1.Value = pGVar2[0xd0].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd0].field_1.Value = pGVar2[0xd0].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd0].field_1.Value = pGVar2[0xd0].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd0].field_1.Value = pGVar2[0xd0].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd0].field_1.Value = pGVar2[0xd0].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd0].field_1.Value = pGVar2[0xd0].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd0].field_1.Value = pGVar2[0xd0].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd0].field_1.Value = pGVar2[0xd0].field_1.Value & 0xfffffffffdffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd0].field_1.Value = pGVar2[0xd0].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd0].field_1.Value = pGVar2[0xd0].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd0].field_1.Value = pGVar2[0xd0].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd0].field_1.Value = pGVar2[0xd0].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd0].field_1.Value = pGVar2[0xd0].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd0].field_1.Value = pGVar2[0xd0].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd0].field_1.Value = pGVar2[0xd0].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd0].field_1.Value = pGVar2[0xd0].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd1].field_1.Value = pGVar2[0xd1].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd1].field_1.Value = pGVar2[0xd1].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd1].field_1.Value = pGVar2[0xd1].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd1].field_1.Value = pGVar2[0xd1].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd1].field_1.Value = pGVar2[0xd1].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd1].field_1.Value = pGVar2[0xd1].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd1].field_1.Value = pGVar2[0xd1].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd1].field_1.Value = pGVar2[0xd1].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd1].field_1.Value = pGVar2[0xd1].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd1].field_1.Value = pGVar2[0xd1].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd1].field_1.Value = pGVar2[0xd1].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd1].field_1.Value = pGVar2[0xd1].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd1].field_1.Value = pGVar2[0xd1].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd1].field_1.Value = pGVar2[0xd1].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd1].field_1.Value = pGVar2[0xd1].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd1].field_1.Value = pGVar2[0xd1].field_1.Value & 0xfffffffffdffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd1].field_1.Value = pGVar2[0xd1].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd1].field_1.Value = pGVar2[0xd1].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd1].field_1.Value = pGVar2[0xd1].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd1].field_1.Value = pGVar2[0xd1].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd1].field_1.Value = pGVar2[0xd1].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd1].field_1.Value = pGVar2[0xd1].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd1].field_1.Value = pGVar2[0xd1].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd1].field_1.Value = pGVar2[0xd1].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd2].field_1.Value = pGVar2[0xd2].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd2].field_1.Value = pGVar2[0xd2].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd2].field_1.Value = pGVar2[0xd2].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd2].field_1.Value = pGVar2[0xd2].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd2].field_1.Value = pGVar2[0xd2].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd2].field_1.Value = pGVar2[0xd2].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd2].field_1.Value = pGVar2[0xd2].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd2].field_1.Value = pGVar2[0xd2].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd2].field_1.Value = pGVar2[0xd2].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd2].field_1.Value = pGVar2[0xd2].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd2].field_1.Value = pGVar2[0xd2].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd2].field_1.Value = pGVar2[0xd2].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd2].field_1.Value = pGVar2[0xd2].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd2].field_1.Value = pGVar2[0xd2].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd2].field_1.Value = pGVar2[0xd2].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd2].field_1.Value = pGVar2[0xd2].field_1.Value & 0xfffffffffdffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd2].field_1.Value = pGVar2[0xd2].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd2].field_1.Value = pGVar2[0xd2].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd2].field_1.Value = pGVar2[0xd2].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd2].field_1.Value = pGVar2[0xd2].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd2].field_1.Value = pGVar2[0xd2].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd2].field_1.Value = pGVar2[0xd2].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd2].field_1.Value = pGVar2[0xd2].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd2].field_1.Value = pGVar2[0xd2].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd3].field_1.Value = pGVar2[0xd3].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd3].field_1.Value = pGVar2[0xd3].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd3].field_1.Value = pGVar2[0xd3].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd3].field_1.Value = pGVar2[0xd3].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd3].field_1.Value = pGVar2[0xd3].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd3].field_1.Value = pGVar2[0xd3].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd3].field_1.Value = pGVar2[0xd3].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd3].field_1.Value = pGVar2[0xd3].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd3].field_1.Value = pGVar2[0xd3].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd3].field_1.Value = pGVar2[0xd3].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd3].field_1.Value = pGVar2[0xd3].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd3].field_1.Value = pGVar2[0xd3].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd3].field_1.Value = pGVar2[0xd3].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd3].field_1.Value = pGVar2[0xd3].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd3].field_1.Value = pGVar2[0xd3].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd3].field_1.Value = pGVar2[0xd3].field_1.Value & 0xfffffffffdffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd3].field_1.Value = pGVar2[0xd3].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd3].field_1.Value = pGVar2[0xd3].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd3].field_1.Value = pGVar2[0xd3].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd3].field_1.Value = pGVar2[0xd3].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd3].field_1.Value = pGVar2[0xd3].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd3].field_1.Value = pGVar2[0xd3].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd3].field_1.Value = pGVar2[0xd3].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd3].field_1.Value = pGVar2[0xd3].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd4].field_1.Value = pGVar2[0xd4].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd4].field_1.Value = pGVar2[0xd4].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd4].field_1.Value = pGVar2[0xd4].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd4].field_1.Value = pGVar2[0xd4].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd4].field_1.Value = pGVar2[0xd4].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd4].field_1.Value = pGVar2[0xd4].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd4].field_1.Value = pGVar2[0xd4].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd4].field_1.Value = pGVar2[0xd4].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd4].field_1.Value = pGVar2[0xd4].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd4].field_1.Value = pGVar2[0xd4].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd4].field_1.Value = pGVar2[0xd4].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd4].field_1.Value = pGVar2[0xd4].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd4].field_1.Value = pGVar2[0xd4].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd4].field_1.Value = pGVar2[0xd4].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd4].field_1.Value = pGVar2[0xd4].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd4].field_1.Value = pGVar2[0xd4].field_1.Value & 0xfffffffffdffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd4].field_1.Value = pGVar2[0xd4].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd4].field_1.Value = pGVar2[0xd4].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd4].field_1.Value = pGVar2[0xd4].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd4].field_1.Value = pGVar2[0xd4].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd4].field_1.Value = pGVar2[0xd4].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd4].field_1.Value = pGVar2[0xd4].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd4].field_1.Value = pGVar2[0xd4].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd4].field_1.Value = pGVar2[0xd4].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd5].field_1.Value = pGVar2[0xd5].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd5].field_1.Value = pGVar2[0xd5].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd5].field_1.Value = pGVar2[0xd5].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd5].field_1.Value = pGVar2[0xd5].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd5].field_1.Value = pGVar2[0xd5].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd5].field_1.Value = pGVar2[0xd5].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd5].field_1.Value = pGVar2[0xd5].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd5].field_1.Value = pGVar2[0xd5].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd5].field_1.Value = pGVar2[0xd5].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd5].field_1.Value = pGVar2[0xd5].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd5].field_1.Value = pGVar2[0xd5].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd5].field_1.Value = pGVar2[0xd5].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd5].field_1.Value = pGVar2[0xd5].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd5].field_1.Value = pGVar2[0xd5].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd5].field_1.Value = pGVar2[0xd5].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd5].field_1.Value = pGVar2[0xd5].field_1.Value & 0xfffffffffdffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd5].field_1.Value = pGVar2[0xd5].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd5].field_1.Value = pGVar2[0xd5].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd5].field_1.Value = pGVar2[0xd5].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd5].field_1.Value = pGVar2[0xd5].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd5].field_1.Value = pGVar2[0xd5].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd5].field_1.Value = pGVar2[0xd5].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd5].field_1.Value = pGVar2[0xd5].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd5].field_1.Value = pGVar2[0xd5].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd6].field_1.Value = pGVar2[0xd6].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd6].field_1.Value = pGVar2[0xd6].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd6].field_1.Value = pGVar2[0xd6].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd6].field_1.Value = pGVar2[0xd6].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd6].field_1.Value = pGVar2[0xd6].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd6].field_1.Value = pGVar2[0xd6].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd6].field_1.Value = pGVar2[0xd6].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd6].field_1.Value = pGVar2[0xd6].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd6].field_1.Value = pGVar2[0xd6].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd6].field_1.Value = pGVar2[0xd6].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd6].field_1.Value = pGVar2[0xd6].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd6].field_1.Value = pGVar2[0xd6].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd6].field_1.Value = pGVar2[0xd6].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd6].field_1.Value = pGVar2[0xd6].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd6].field_1.Value = pGVar2[0xd6].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd6].field_1.Value = pGVar2[0xd6].field_1.Value & 0xfffffffffdffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd6].field_1.Value = pGVar2[0xd6].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd6].field_1.Value = pGVar2[0xd6].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd6].field_1.Value = pGVar2[0xd6].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd6].field_1.Value = pGVar2[0xd6].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd6].field_1.Value = pGVar2[0xd6].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd6].field_1.Value = pGVar2[0xd6].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd6].field_1.Value = pGVar2[0xd6].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd6].field_1.Value = pGVar2[0xd6].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd7].field_1.Value = pGVar2[0xd7].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd7].field_1.Value = pGVar2[0xd7].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd7].field_1.Value = pGVar2[0xd7].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd7].field_1.Value = pGVar2[0xd7].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd7].field_1.Value = pGVar2[0xd7].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd7].field_1.Value = pGVar2[0xd7].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd7].field_1.Value = pGVar2[0xd7].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd7].field_1.Value = pGVar2[0xd7].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd7].field_1.Value = pGVar2[0xd7].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd7].field_1.Value = pGVar2[0xd7].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd7].field_1.Value = pGVar2[0xd7].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd7].field_1.Value = pGVar2[0xd7].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd7].field_1.Value = pGVar2[0xd7].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd7].field_1.Value = pGVar2[0xd7].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd7].field_1.Value = pGVar2[0xd7].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd7].field_1.Value = pGVar2[0xd7].field_1.Value & 0xfffffffffdffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd7].field_1.Value = pGVar2[0xd7].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd7].field_1.Value = pGVar2[0xd7].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd7].field_1.Value = pGVar2[0xd7].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd7].field_1.Value = pGVar2[0xd7].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd7].field_1.Value = pGVar2[0xd7].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd7].field_1.Value = pGVar2[0xd7].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd7].field_1.Value = pGVar2[0xd7].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd7].field_1.Value = pGVar2[0xd7].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd8].field_1.Value = pGVar2[0xd8].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd8].field_1.Value = pGVar2[0xd8].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd8].field_1.Value = pGVar2[0xd8].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd8].field_1.Value = pGVar2[0xd8].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd8].field_1.Value = pGVar2[0xd8].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd8].field_1.Value = pGVar2[0xd8].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd8].field_1.Value = pGVar2[0xd8].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd8].field_1.Value = pGVar2[0xd8].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd8].field_1.Value = pGVar2[0xd8].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd8].field_1.Value = pGVar2[0xd8].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd8].field_1.Value = pGVar2[0xd8].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd8].field_1.Value = pGVar2[0xd8].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd8].field_1.Value = pGVar2[0xd8].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd8].field_1.Value = pGVar2[0xd8].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd8].field_1.Value = pGVar2[0xd8].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd8].field_1.Value = pGVar2[0xd8].field_1.Value & 0xfffffffffdffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd8].field_1.Value = pGVar2[0xd8].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd8].field_1.Value = pGVar2[0xd8].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd8].field_1.Value = pGVar2[0xd8].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd8].field_1.Value = pGVar2[0xd8].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd8].field_1.Value = pGVar2[0xd8].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd8].field_1.Value = pGVar2[0xd8].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd8].field_1.Value = pGVar2[0xd8].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd8].field_1.Value = pGVar2[0xd8].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd9].field_1.Value = pGVar2[0xd9].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd9].field_1.Value = pGVar2[0xd9].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd9].field_1.Value = pGVar2[0xd9].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd9].field_1.Value = pGVar2[0xd9].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd9].field_1.Value = pGVar2[0xd9].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd9].field_1.Value = pGVar2[0xd9].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd9].field_1.Value = pGVar2[0xd9].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd9].field_1.Value = pGVar2[0xd9].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd9].field_1.Value = pGVar2[0xd9].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd9].field_1.Value = pGVar2[0xd9].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd9].field_1.Value = pGVar2[0xd9].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd9].field_1.Value = pGVar2[0xd9].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd9].field_1.Value = pGVar2[0xd9].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd9].field_1.Value = pGVar2[0xd9].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd9].field_1.Value = pGVar2[0xd9].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd9].field_1.Value = pGVar2[0xd9].field_1.Value & 0xfffffffffdffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd9].field_1.Value = pGVar2[0xd9].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd9].field_1.Value = pGVar2[0xd9].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd9].field_1.Value = pGVar2[0xd9].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd9].field_1.Value = pGVar2[0xd9].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd9].field_1.Value = pGVar2[0xd9].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd9].field_1.Value = pGVar2[0xd9].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd9].field_1.Value = pGVar2[0xd9].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xd9].field_1.Value = pGVar2[0xd9].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xda].field_1.Value = pGVar2[0xda].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xda].field_1.Value = pGVar2[0xda].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xda].field_1.Value = pGVar2[0xda].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xda].field_1.Value = pGVar2[0xda].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xda].field_1.Value = pGVar2[0xda].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xda].field_1.Value = pGVar2[0xda].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xda].field_1.Value = pGVar2[0xda].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xda].field_1.Value = pGVar2[0xda].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xda].field_1.Value = pGVar2[0xda].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xda].field_1.Value = pGVar2[0xda].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xda].field_1.Value = pGVar2[0xda].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xda].field_1.Value = pGVar2[0xda].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xda].field_1.Value = pGVar2[0xda].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xda].field_1.Value = pGVar2[0xda].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xda].field_1.Value = pGVar2[0xda].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xda].field_1.Value = pGVar2[0xda].field_1.Value & 0xfffffffffdffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xda].field_1.Value = pGVar2[0xda].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xda].field_1.Value = pGVar2[0xda].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xda].field_1.Value = pGVar2[0xda].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xda].field_1.Value = pGVar2[0xda].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xda].field_1.Value = pGVar2[0xda].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xda].field_1.Value = pGVar2[0xda].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xda].field_1.Value = pGVar2[0xda].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xda].field_1.Value = pGVar2[0xda].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x91].field_1.Value = pGVar2[0x91].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x91].field_1.Value = pGVar2[0x91].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x91].field_1.Value = pGVar2[0x91].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x91].field_1.Value = pGVar2[0x91].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x91].field_1.Value = pGVar2[0x91].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x91].field_1.Value = pGVar2[0x91].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x91].field_1.Value = pGVar2[0x91].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x91].field_1.Value = pGVar2[0x91].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x91].field_1.Value = pGVar2[0x91].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x91].field_1.Value = pGVar2[0x91].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x91].field_1.Value = pGVar2[0x91].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x91].field_1.Value = pGVar2[0x91].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x91].field_1.Value = pGVar2[0x91].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x91].field_1.Value = pGVar2[0x91].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x91].field_1.Value = pGVar2[0x91].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x91].field_1.Value = pGVar2[0x91].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x91].field_1.Value = pGVar2[0x91].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x91].field_1.Value = pGVar2[0x91].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x91].field_1.Value = pGVar2[0x91].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x91].field_1.Value = pGVar2[0x91].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x91].field_1.Value = pGVar2[0x91].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x91].field_1.Value = pGVar2[0x91].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x91].field_1.Value = pGVar2[0x91].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x91].field_1.Value = pGVar2[0x91].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa9].field_1.Value = pGVar2[0xa9].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa9].field_1.Value = pGVar2[0xa9].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa9].field_1.Value = pGVar2[0xa9].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa9].field_1.Value = pGVar2[0xa9].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa9].field_1.Value = pGVar2[0xa9].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa9].field_1.Value = pGVar2[0xa9].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa9].field_1.Value = pGVar2[0xa9].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa9].field_1.Value = pGVar2[0xa9].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa9].field_1.Value = pGVar2[0xa9].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa9].field_1.Value = pGVar2[0xa9].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa9].field_1.Value = pGVar2[0xa9].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa9].field_1.Value = pGVar2[0xa9].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa9].field_1.Value = pGVar2[0xa9].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa9].field_1.Value = pGVar2[0xa9].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa9].field_1.Value = pGVar2[0xa9].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa9].field_1.Value = pGVar2[0xa9].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa9].field_1.Value = pGVar2[0xa9].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa9].field_1.Value = pGVar2[0xa9].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa9].field_1.Value = pGVar2[0xa9].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa9].field_1.Value = pGVar2[0xa9].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa9].field_1.Value = pGVar2[0xa9].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa9].field_1.Value = pGVar2[0xa9].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa9].field_1.Value = pGVar2[0xa9].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xa9].field_1.Value = pGVar2[0xa9].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xaa].field_1.Value = pGVar2[0xaa].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xaa].field_1.Value = pGVar2[0xaa].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xaa].field_1.Value = pGVar2[0xaa].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xaa].field_1.Value = pGVar2[0xaa].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xaa].field_1.Value = pGVar2[0xaa].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xaa].field_1.Value = pGVar2[0xaa].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xaa].field_1.Value = pGVar2[0xaa].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xaa].field_1.Value = pGVar2[0xaa].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xaa].field_1.Value = pGVar2[0xaa].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xaa].field_1.Value = pGVar2[0xaa].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xaa].field_1.Value = pGVar2[0xaa].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xaa].field_1.Value = pGVar2[0xaa].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xaa].field_1.Value = pGVar2[0xaa].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xaa].field_1.Value = pGVar2[0xaa].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xaa].field_1.Value = pGVar2[0xaa].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xaa].field_1.Value = pGVar2[0xaa].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xaa].field_1.Value = pGVar2[0xaa].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xaa].field_1.Value = pGVar2[0xaa].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xaa].field_1.Value = pGVar2[0xaa].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xaa].field_1.Value = pGVar2[0xaa].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xaa].field_1.Value = pGVar2[0xaa].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xaa].field_1.Value = pGVar2[0xaa].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xaa].field_1.Value = pGVar2[0xaa].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xaa].field_1.Value = pGVar2[0xaa].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xab].field_1.Value = pGVar2[0xab].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xab].field_1.Value = pGVar2[0xab].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xab].field_1.Value = pGVar2[0xab].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xab].field_1.Value = pGVar2[0xab].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xab].field_1.Value = pGVar2[0xab].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xab].field_1.Value = pGVar2[0xab].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xab].field_1.Value = pGVar2[0xab].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xab].field_1.Value = pGVar2[0xab].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xab].field_1.Value = pGVar2[0xab].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xab].field_1.Value = pGVar2[0xab].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xab].field_1.Value = pGVar2[0xab].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xab].field_1.Value = pGVar2[0xab].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xab].field_1.Value = pGVar2[0xab].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xab].field_1.Value = pGVar2[0xab].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xab].field_1.Value = pGVar2[0xab].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xab].field_1.Value = pGVar2[0xab].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xab].field_1.Value = pGVar2[0xab].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xab].field_1.Value = pGVar2[0xab].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xab].field_1.Value = pGVar2[0xab].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xab].field_1.Value = pGVar2[0xab].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xab].field_1.Value = pGVar2[0xab].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xab].field_1.Value = pGVar2[0xab].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xab].field_1.Value = pGVar2[0xab].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xab].field_1.Value = pGVar2[0xab].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xac].field_1.Value = pGVar2[0xac].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xac].field_1.Value = pGVar2[0xac].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xac].field_1.Value = pGVar2[0xac].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xac].field_1.Value = pGVar2[0xac].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xac].field_1.Value = pGVar2[0xac].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xac].field_1.Value = pGVar2[0xac].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xac].field_1.Value = pGVar2[0xac].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xac].field_1.Value = pGVar2[0xac].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xac].field_1.Value = pGVar2[0xac].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xac].field_1.Value = pGVar2[0xac].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xac].field_1.Value = pGVar2[0xac].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xac].field_1.Value = pGVar2[0xac].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xac].field_1.Value = pGVar2[0xac].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xac].field_1.Value = pGVar2[0xac].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xac].field_1.Value = pGVar2[0xac].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xac].field_1.Value = pGVar2[0xac].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xac].field_1.Value = pGVar2[0xac].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xac].field_1.Value = pGVar2[0xac].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xac].field_1.Value = pGVar2[0xac].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xac].field_1.Value = pGVar2[0xac].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xac].field_1.Value = pGVar2[0xac].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xac].field_1.Value = pGVar2[0xac].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xac].field_1.Value = pGVar2[0xac].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xac].field_1.Value = pGVar2[0xac].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xad].field_1.Value = pGVar2[0xad].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xad].field_1.Value = pGVar2[0xad].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xad].field_1.Value = pGVar2[0xad].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xad].field_1.Value = pGVar2[0xad].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xad].field_1.Value = pGVar2[0xad].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xad].field_1.Value = pGVar2[0xad].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xad].field_1.Value = pGVar2[0xad].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xad].field_1.Value = pGVar2[0xad].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xad].field_1.Value = pGVar2[0xad].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xad].field_1.Value = pGVar2[0xad].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xad].field_1.Value = pGVar2[0xad].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xad].field_1.Value = pGVar2[0xad].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xad].field_1.Value = pGVar2[0xad].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xad].field_1.Value = pGVar2[0xad].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xad].field_1.Value = pGVar2[0xad].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xad].field_1.Value = pGVar2[0xad].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xad].field_1.Value = pGVar2[0xad].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xad].field_1.Value = pGVar2[0xad].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xad].field_1.Value = pGVar2[0xad].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xad].field_1.Value = pGVar2[0xad].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xad].field_1.Value = pGVar2[0xad].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xad].field_1.Value = pGVar2[0xad].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xad].field_1.Value = pGVar2[0xad].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xad].field_1.Value = pGVar2[0xad].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x97].field_1.Value = pGVar2[0x97].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x97].field_1.Value = pGVar2[0x97].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x97].field_1.Value = pGVar2[0x97].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x97].field_1.Value = pGVar2[0x97].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x97].field_1.Value = pGVar2[0x97].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x97].field_1.Value = pGVar2[0x97].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x97].field_1.Value = pGVar2[0x97].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x97].field_1.Value = pGVar2[0x97].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x97].field_1.Value = pGVar2[0x97].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x97].field_1.Value = pGVar2[0x97].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x97].field_1.Value = pGVar2[0x97].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x97].field_1.Value = pGVar2[0x97].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x97].field_1.Value = pGVar2[0x97].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x97].field_1.Value = pGVar2[0x97].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x97].field_1.Value = pGVar2[0x97].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x97].field_1.Value = pGVar2[0x97].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x97].field_1.Value = pGVar2[0x97].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x97].field_1.Value = pGVar2[0x97].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x97].field_1.Value = pGVar2[0x97].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x97].field_1.Value = pGVar2[0x97].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x97].field_1.Value = pGVar2[0x97].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x97].field_1.Value = pGVar2[0x97].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x97].field_1.Value = pGVar2[0x97].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x97].field_1.Value = pGVar2[0x97].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xae].field_1.Value = pGVar2[0xae].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xae].field_1.Value = pGVar2[0xae].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xae].field_1.Value = pGVar2[0xae].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xae].field_1.Value = pGVar2[0xae].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xae].field_1.Value = pGVar2[0xae].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xae].field_1.Value = pGVar2[0xae].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xae].field_1.Value = pGVar2[0xae].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xae].field_1.Value = pGVar2[0xae].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xae].field_1.Value = pGVar2[0xae].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xae].field_1.Value = pGVar2[0xae].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xae].field_1.Value = pGVar2[0xae].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xae].field_1.Value = pGVar2[0xae].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xae].field_1.Value = pGVar2[0xae].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xae].field_1.Value = pGVar2[0xae].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xae].field_1.Value = pGVar2[0xae].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xae].field_1.Value = pGVar2[0xae].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xae].field_1.Value = pGVar2[0xae].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xae].field_1.Value = pGVar2[0xae].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xae].field_1.Value = pGVar2[0xae].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xae].field_1.Value = pGVar2[0xae].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xae].field_1.Value = pGVar2[0xae].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xae].field_1.Value = pGVar2[0xae].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xae].field_1.Value = pGVar2[0xae].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xae].field_1.Value = pGVar2[0xae].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xaf].field_1.Value = pGVar2[0xaf].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xaf].field_1.Value = pGVar2[0xaf].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xaf].field_1.Value = pGVar2[0xaf].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xaf].field_1.Value = pGVar2[0xaf].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xaf].field_1.Value = pGVar2[0xaf].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xaf].field_1.Value = pGVar2[0xaf].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xaf].field_1.Value = pGVar2[0xaf].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xaf].field_1.Value = pGVar2[0xaf].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xaf].field_1.Value = pGVar2[0xaf].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xaf].field_1.Value = pGVar2[0xaf].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xaf].field_1.Value = pGVar2[0xaf].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xaf].field_1.Value = pGVar2[0xaf].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xaf].field_1.Value = pGVar2[0xaf].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xaf].field_1.Value = pGVar2[0xaf].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xaf].field_1.Value = pGVar2[0xaf].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xaf].field_1.Value = pGVar2[0xaf].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xaf].field_1.Value = pGVar2[0xaf].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xaf].field_1.Value = pGVar2[0xaf].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xaf].field_1.Value = pGVar2[0xaf].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xaf].field_1.Value = pGVar2[0xaf].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xaf].field_1.Value = pGVar2[0xaf].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xaf].field_1.Value = pGVar2[0xaf].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xaf].field_1.Value = pGVar2[0xaf].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xaf].field_1.Value = pGVar2[0xaf].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb0].field_1.Value = pGVar2[0xb0].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb0].field_1.Value = pGVar2[0xb0].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb0].field_1.Value = pGVar2[0xb0].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb0].field_1.Value = pGVar2[0xb0].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb0].field_1.Value = pGVar2[0xb0].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb0].field_1.Value = pGVar2[0xb0].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb0].field_1.Value = pGVar2[0xb0].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb0].field_1.Value = pGVar2[0xb0].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb0].field_1.Value = pGVar2[0xb0].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb0].field_1.Value = pGVar2[0xb0].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb0].field_1.Value = pGVar2[0xb0].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb0].field_1.Value = pGVar2[0xb0].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb0].field_1.Value = pGVar2[0xb0].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb0].field_1.Value = pGVar2[0xb0].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb0].field_1.Value = pGVar2[0xb0].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb0].field_1.Value = pGVar2[0xb0].field_1.Value & 0xfffffffffdffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb0].field_1.Value = pGVar2[0xb0].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb0].field_1.Value = pGVar2[0xb0].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb0].field_1.Value = pGVar2[0xb0].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb0].field_1.Value = pGVar2[0xb0].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb0].field_1.Value = pGVar2[0xb0].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb0].field_1.Value = pGVar2[0xb0].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb0].field_1.Value = pGVar2[0xb0].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xb0].field_1.Value = pGVar2[0xb0].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdc].field_1.Value = pGVar2[0xdc].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdc].field_1.Value = pGVar2[0xdc].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdc].field_1.Value = pGVar2[0xdc].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdc].field_1.Value = pGVar2[0xdc].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdc].field_1.Value = pGVar2[0xdc].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdc].field_1.Value = pGVar2[0xdc].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdc].field_1.Value = pGVar2[0xdc].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdc].field_1.Value = pGVar2[0xdc].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdc].field_1.Value = pGVar2[0xdc].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdc].field_1.Value = pGVar2[0xdc].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdc].field_1.Value = pGVar2[0xdc].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdc].field_1.Value = pGVar2[0xdc].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdc].field_1.Value = pGVar2[0xdc].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdc].field_1.Value = pGVar2[0xdc].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdc].field_1.Value = pGVar2[0xdc].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdc].field_1.Value = pGVar2[0xdc].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdc].field_1.Value = pGVar2[0xdc].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdc].field_1.Value = pGVar2[0xdc].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdc].field_1.Value = pGVar2[0xdc].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdc].field_1.Value = pGVar2[0xdc].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdc].field_1.Value = pGVar2[0xdc].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdc].field_1.Value = pGVar2[0xdc].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdc].field_1.Value = pGVar2[0xdc].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdc].field_1.Value = pGVar2[0xdc].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdd].field_1.Value = pGVar2[0xdd].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdd].field_1.Value = pGVar2[0xdd].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdd].field_1.Value = pGVar2[0xdd].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdd].field_1.Value = pGVar2[0xdd].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdd].field_1.Value = pGVar2[0xdd].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdd].field_1.Value = pGVar2[0xdd].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdd].field_1.Value = pGVar2[0xdd].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdd].field_1.Value = pGVar2[0xdd].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdd].field_1.Value = pGVar2[0xdd].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdd].field_1.Value = pGVar2[0xdd].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdd].field_1.Value = pGVar2[0xdd].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdd].field_1.Value = pGVar2[0xdd].field_1.Value & 0xfffffffffffbffff | 0x40000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdd].field_1.Value = pGVar2[0xdd].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdd].field_1.Value = pGVar2[0xdd].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdd].field_1.Value = pGVar2[0xdd].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdd].field_1.Value = pGVar2[0xdd].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdd].field_1.Value = pGVar2[0xdd].field_1.Value & 0xffffffffe3ffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdd].field_1.Value = pGVar2[0xdd].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdd].field_1.Value = pGVar2[0xdd].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdd].field_1.Value = pGVar2[0xdd].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdd].field_1.Value = pGVar2[0xdd].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdd].field_1.Value = pGVar2[0xdd].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdd].field_1.Value = pGVar2[0xdd].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdd].field_1.Value = pGVar2[0xdd].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xde].field_1.Value = pGVar2[0xde].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xde].field_1.Value = pGVar2[0xde].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xde].field_1.Value = pGVar2[0xde].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xde].field_1.Value = pGVar2[0xde].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xde].field_1.Value = pGVar2[0xde].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xde].field_1.Value = pGVar2[0xde].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xde].field_1.Value = pGVar2[0xde].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xde].field_1.Value = pGVar2[0xde].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xde].field_1.Value = pGVar2[0xde].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xde].field_1.Value = pGVar2[0xde].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xde].field_1.Value = pGVar2[0xde].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xde].field_1.Value = pGVar2[0xde].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xde].field_1.Value = pGVar2[0xde].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xde].field_1.Value = pGVar2[0xde].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xde].field_1.Value = pGVar2[0xde].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xde].field_1.Value = pGVar2[0xde].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xde].field_1.Value = pGVar2[0xde].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xde].field_1.Value = pGVar2[0xde].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xde].field_1.Value = pGVar2[0xde].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xde].field_1.Value = pGVar2[0xde].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xde].field_1.Value = pGVar2[0xde].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xde].field_1.Value = pGVar2[0xde].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xde].field_1.Value = pGVar2[0xde].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xde].field_1.Value = pGVar2[0xde].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdf].field_1.Value = pGVar2[0xdf].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdf].field_1.Value = pGVar2[0xdf].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdf].field_1.Value = pGVar2[0xdf].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdf].field_1.Value = pGVar2[0xdf].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdf].field_1.Value = pGVar2[0xdf].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdf].field_1.Value = pGVar2[0xdf].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdf].field_1.Value = pGVar2[0xdf].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdf].field_1.Value = pGVar2[0xdf].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdf].field_1.Value = pGVar2[0xdf].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdf].field_1.Value = pGVar2[0xdf].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdf].field_1.Value = pGVar2[0xdf].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdf].field_1.Value = pGVar2[0xdf].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdf].field_1.Value = pGVar2[0xdf].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdf].field_1.Value = pGVar2[0xdf].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdf].field_1.Value = pGVar2[0xdf].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdf].field_1.Value = pGVar2[0xdf].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdf].field_1.Value = pGVar2[0xdf].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdf].field_1.Value = pGVar2[0xdf].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdf].field_1.Value = pGVar2[0xdf].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdf].field_1.Value = pGVar2[0xdf].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdf].field_1.Value = pGVar2[0xdf].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdf].field_1.Value = pGVar2[0xdf].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdf].field_1.Value = pGVar2[0xdf].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xdf].field_1.Value = pGVar2[0xdf].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe0].field_1.Value = pGVar2[0xe0].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe0].field_1.Value = pGVar2[0xe0].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe0].field_1.Value = pGVar2[0xe0].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe0].field_1.Value = pGVar2[0xe0].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe0].field_1.Value = pGVar2[0xe0].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe0].field_1.Value = pGVar2[0xe0].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe0].field_1.Value = pGVar2[0xe0].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe0].field_1.Value = pGVar2[0xe0].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe0].field_1.Value = pGVar2[0xe0].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe0].field_1.Value = pGVar2[0xe0].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe0].field_1.Value = pGVar2[0xe0].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe0].field_1.Value = pGVar2[0xe0].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe0].field_1.Value = pGVar2[0xe0].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe0].field_1.Value = pGVar2[0xe0].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe0].field_1.Value = pGVar2[0xe0].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe0].field_1.Value = pGVar2[0xe0].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe0].field_1.Value = pGVar2[0xe0].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe0].field_1.Value = pGVar2[0xe0].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe0].field_1.Value = pGVar2[0xe0].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe0].field_1.Value = pGVar2[0xe0].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe0].field_1.Value = pGVar2[0xe0].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe0].field_1.Value = pGVar2[0xe0].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe0].field_1.Value = pGVar2[0xe0].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe0].field_1.Value = pGVar2[0xe0].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe1].field_1.Value = pGVar2[0xe1].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe1].field_1.Value = pGVar2[0xe1].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe1].field_1.Value = pGVar2[0xe1].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe1].field_1.Value = pGVar2[0xe1].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe1].field_1.Value = pGVar2[0xe1].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe1].field_1.Value = pGVar2[0xe1].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe1].field_1.Value = pGVar2[0xe1].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe1].field_1.Value = pGVar2[0xe1].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe1].field_1.Value = pGVar2[0xe1].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe1].field_1.Value = pGVar2[0xe1].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe1].field_1.Value = pGVar2[0xe1].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe1].field_1.Value = pGVar2[0xe1].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe1].field_1.Value = pGVar2[0xe1].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe1].field_1.Value = pGVar2[0xe1].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe1].field_1.Value = pGVar2[0xe1].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe1].field_1.Value = pGVar2[0xe1].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe1].field_1.Value = pGVar2[0xe1].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe1].field_1.Value = pGVar2[0xe1].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe1].field_1.Value = pGVar2[0xe1].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe1].field_1.Value = pGVar2[0xe1].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe1].field_1.Value = pGVar2[0xe1].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe1].field_1.Value = pGVar2[0xe1].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe1].field_1.Value = pGVar2[0xe1].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe1].field_1.Value = pGVar2[0xe1].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe2].field_1.Value = pGVar2[0xe2].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe2].field_1.Value = pGVar2[0xe2].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe2].field_1.Value = pGVar2[0xe2].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe2].field_1.Value = pGVar2[0xe2].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe2].field_1.Value = pGVar2[0xe2].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe2].field_1.Value = pGVar2[0xe2].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe2].field_1.Value = pGVar2[0xe2].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe2].field_1.Value = pGVar2[0xe2].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe2].field_1.Value = pGVar2[0xe2].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe2].field_1.Value = pGVar2[0xe2].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe2].field_1.Value = pGVar2[0xe2].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe2].field_1.Value = pGVar2[0xe2].field_1.Value & 0xfffffffffffbffff | 0x40000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe2].field_1.Value = pGVar2[0xe2].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe2].field_1.Value = pGVar2[0xe2].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe2].field_1.Value = pGVar2[0xe2].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe2].field_1.Value = pGVar2[0xe2].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe2].field_1.Value = pGVar2[0xe2].field_1.Value & 0xffffffffe3ffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe2].field_1.Value = pGVar2[0xe2].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe2].field_1.Value = pGVar2[0xe2].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe2].field_1.Value = pGVar2[0xe2].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe2].field_1.Value = pGVar2[0xe2].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe2].field_1.Value = pGVar2[0xe2].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe2].field_1.Value = pGVar2[0xe2].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe2].field_1.Value = pGVar2[0xe2].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe3].field_1.Value = pGVar2[0xe3].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe3].field_1.Value = pGVar2[0xe3].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe3].field_1.Value = pGVar2[0xe3].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe3].field_1.Value = pGVar2[0xe3].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe3].field_1.Value = pGVar2[0xe3].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe3].field_1.Value = pGVar2[0xe3].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe3].field_1.Value = pGVar2[0xe3].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe3].field_1.Value = pGVar2[0xe3].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe3].field_1.Value = pGVar2[0xe3].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe3].field_1.Value = pGVar2[0xe3].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe3].field_1.Value = pGVar2[0xe3].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe3].field_1.Value = pGVar2[0xe3].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe3].field_1.Value = pGVar2[0xe3].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe3].field_1.Value = pGVar2[0xe3].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe3].field_1.Value = pGVar2[0xe3].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe3].field_1.Value = pGVar2[0xe3].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe3].field_1.Value = pGVar2[0xe3].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe3].field_1.Value = pGVar2[0xe3].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe3].field_1.Value = pGVar2[0xe3].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe3].field_1.Value = pGVar2[0xe3].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe3].field_1.Value = pGVar2[0xe3].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe3].field_1.Value = pGVar2[0xe3].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe3].field_1.Value = pGVar2[0xe3].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe3].field_1.Value = pGVar2[0xe3].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe4].field_1.Value = pGVar2[0xe4].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe4].field_1.Value = pGVar2[0xe4].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe4].field_1.Value = pGVar2[0xe4].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe4].field_1.Value = pGVar2[0xe4].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe4].field_1.Value = pGVar2[0xe4].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe4].field_1.Value = pGVar2[0xe4].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe4].field_1.Value = pGVar2[0xe4].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe4].field_1.Value = pGVar2[0xe4].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe4].field_1.Value = pGVar2[0xe4].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe4].field_1.Value = pGVar2[0xe4].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe4].field_1.Value = pGVar2[0xe4].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe4].field_1.Value = pGVar2[0xe4].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe4].field_1.Value = pGVar2[0xe4].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe4].field_1.Value = pGVar2[0xe4].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe4].field_1.Value = pGVar2[0xe4].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe4].field_1.Value = pGVar2[0xe4].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe4].field_1.Value = pGVar2[0xe4].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe4].field_1.Value = pGVar2[0xe4].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe4].field_1.Value = pGVar2[0xe4].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe4].field_1.Value = pGVar2[0xe4].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe4].field_1.Value = pGVar2[0xe4].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe4].field_1.Value = pGVar2[0xe4].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe4].field_1.Value = pGVar2[0xe4].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe4].field_1.Value = pGVar2[0xe4].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe5].field_1.Value = pGVar2[0xe5].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe5].field_1.Value = pGVar2[0xe5].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe5].field_1.Value = pGVar2[0xe5].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe5].field_1.Value = pGVar2[0xe5].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe5].field_1.Value = pGVar2[0xe5].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe5].field_1.Value = pGVar2[0xe5].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe5].field_1.Value = pGVar2[0xe5].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe5].field_1.Value = pGVar2[0xe5].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe5].field_1.Value = pGVar2[0xe5].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe5].field_1.Value = pGVar2[0xe5].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe5].field_1.Value = pGVar2[0xe5].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe5].field_1.Value = pGVar2[0xe5].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe5].field_1.Value = pGVar2[0xe5].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe5].field_1.Value = pGVar2[0xe5].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe5].field_1.Value = pGVar2[0xe5].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe5].field_1.Value = pGVar2[0xe5].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe5].field_1.Value = pGVar2[0xe5].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe5].field_1.Value = pGVar2[0xe5].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe5].field_1.Value = pGVar2[0xe5].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe5].field_1.Value = pGVar2[0xe5].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe5].field_1.Value = pGVar2[0xe5].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe5].field_1.Value = pGVar2[0xe5].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe5].field_1.Value = pGVar2[0xe5].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe5].field_1.Value = pGVar2[0xe5].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe6].field_1.Value = pGVar2[0xe6].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe6].field_1.Value = pGVar2[0xe6].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe6].field_1.Value = pGVar2[0xe6].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe6].field_1.Value = pGVar2[0xe6].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe6].field_1.Value = pGVar2[0xe6].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe6].field_1.Value = pGVar2[0xe6].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe6].field_1.Value = pGVar2[0xe6].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe6].field_1.Value = pGVar2[0xe6].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe6].field_1.Value = pGVar2[0xe6].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe6].field_1.Value = pGVar2[0xe6].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe6].field_1.Value = pGVar2[0xe6].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe6].field_1.Value = pGVar2[0xe6].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe6].field_1.Value = pGVar2[0xe6].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe6].field_1.Value = pGVar2[0xe6].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe6].field_1.Value = pGVar2[0xe6].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe6].field_1.Value = pGVar2[0xe6].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe6].field_1.Value = pGVar2[0xe6].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe6].field_1.Value = pGVar2[0xe6].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe6].field_1.Value = pGVar2[0xe6].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe6].field_1.Value = pGVar2[0xe6].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe6].field_1.Value = pGVar2[0xe6].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe6].field_1.Value = pGVar2[0xe6].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe6].field_1.Value = pGVar2[0xe6].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe6].field_1.Value = pGVar2[0xe6].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe7].field_1.Value = pGVar2[0xe7].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe7].field_1.Value = pGVar2[0xe7].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe7].field_1.Value = pGVar2[0xe7].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe7].field_1.Value = pGVar2[0xe7].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe7].field_1.Value = pGVar2[0xe7].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe7].field_1.Value = pGVar2[0xe7].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe7].field_1.Value = pGVar2[0xe7].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe7].field_1.Value = pGVar2[0xe7].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe7].field_1.Value = pGVar2[0xe7].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe7].field_1.Value = pGVar2[0xe7].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe7].field_1.Value = pGVar2[0xe7].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe7].field_1.Value = pGVar2[0xe7].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe7].field_1.Value = pGVar2[0xe7].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe7].field_1.Value = pGVar2[0xe7].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe7].field_1.Value = pGVar2[0xe7].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe7].field_1.Value = pGVar2[0xe7].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe7].field_1.Value = pGVar2[0xe7].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe7].field_1.Value = pGVar2[0xe7].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe7].field_1.Value = pGVar2[0xe7].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe7].field_1.Value = pGVar2[0xe7].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe7].field_1.Value = pGVar2[0xe7].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe7].field_1.Value = pGVar2[0xe7].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe7].field_1.Value = pGVar2[0xe7].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe7].field_1.Value = pGVar2[0xe7].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe8].field_1.Value = pGVar2[0xe8].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe8].field_1.Value = pGVar2[0xe8].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe8].field_1.Value = pGVar2[0xe8].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe8].field_1.Value = pGVar2[0xe8].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe8].field_1.Value = pGVar2[0xe8].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe8].field_1.Value = pGVar2[0xe8].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe8].field_1.Value = pGVar2[0xe8].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe8].field_1.Value = pGVar2[0xe8].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe8].field_1.Value = pGVar2[0xe8].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe8].field_1.Value = pGVar2[0xe8].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe8].field_1.Value = pGVar2[0xe8].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe8].field_1.Value = pGVar2[0xe8].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe8].field_1.Value = pGVar2[0xe8].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe8].field_1.Value = pGVar2[0xe8].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe8].field_1.Value = pGVar2[0xe8].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe8].field_1.Value = pGVar2[0xe8].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe8].field_1.Value = pGVar2[0xe8].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe8].field_1.Value = pGVar2[0xe8].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe8].field_1.Value = pGVar2[0xe8].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe8].field_1.Value = pGVar2[0xe8].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe8].field_1.Value = pGVar2[0xe8].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe8].field_1.Value = pGVar2[0xe8].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe8].field_1.Value = pGVar2[0xe8].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe8].field_1.Value = pGVar2[0xe8].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe9].field_1.Value = pGVar2[0xe9].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe9].field_1.Value = pGVar2[0xe9].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe9].field_1.Value = pGVar2[0xe9].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe9].field_1.Value = pGVar2[0xe9].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe9].field_1.Value = pGVar2[0xe9].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe9].field_1.Value = pGVar2[0xe9].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe9].field_1.Value = pGVar2[0xe9].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe9].field_1.Value = pGVar2[0xe9].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe9].field_1.Value = pGVar2[0xe9].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe9].field_1.Value = pGVar2[0xe9].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe9].field_1.Value = pGVar2[0xe9].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe9].field_1.Value = pGVar2[0xe9].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe9].field_1.Value = pGVar2[0xe9].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe9].field_1.Value = pGVar2[0xe9].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe9].field_1.Value = pGVar2[0xe9].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe9].field_1.Value = pGVar2[0xe9].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe9].field_1.Value = pGVar2[0xe9].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe9].field_1.Value = pGVar2[0xe9].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe9].field_1.Value = pGVar2[0xe9].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe9].field_1.Value = pGVar2[0xe9].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe9].field_1.Value = pGVar2[0xe9].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe9].field_1.Value = pGVar2[0xe9].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe9].field_1.Value = pGVar2[0xe9].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xe9].field_1.Value = pGVar2[0xe9].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xea].field_1.Value = pGVar2[0xea].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xea].field_1.Value = pGVar2[0xea].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xea].field_1.Value = pGVar2[0xea].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xea].field_1.Value = pGVar2[0xea].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xea].field_1.Value = pGVar2[0xea].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xea].field_1.Value = pGVar2[0xea].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xea].field_1.Value = pGVar2[0xea].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xea].field_1.Value = pGVar2[0xea].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xea].field_1.Value = pGVar2[0xea].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xea].field_1.Value = pGVar2[0xea].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xea].field_1.Value = pGVar2[0xea].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xea].field_1.Value = pGVar2[0xea].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xea].field_1.Value = pGVar2[0xea].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xea].field_1.Value = pGVar2[0xea].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xea].field_1.Value = pGVar2[0xea].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xea].field_1.Value = pGVar2[0xea].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xea].field_1.Value = pGVar2[0xea].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xea].field_1.Value = pGVar2[0xea].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xea].field_1.Value = pGVar2[0xea].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xea].field_1.Value = pGVar2[0xea].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xea].field_1.Value = pGVar2[0xea].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xea].field_1.Value = pGVar2[0xea].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xea].field_1.Value = pGVar2[0xea].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xea].field_1.Value = pGVar2[0xea].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xeb].field_1.Value = pGVar2[0xeb].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xeb].field_1.Value = pGVar2[0xeb].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xeb].field_1.Value = pGVar2[0xeb].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xeb].field_1.Value = pGVar2[0xeb].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xeb].field_1.Value = pGVar2[0xeb].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xeb].field_1.Value = pGVar2[0xeb].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xeb].field_1.Value = pGVar2[0xeb].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xeb].field_1.Value = pGVar2[0xeb].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xeb].field_1.Value = pGVar2[0xeb].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xeb].field_1.Value = pGVar2[0xeb].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xeb].field_1.Value = pGVar2[0xeb].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xeb].field_1.Value = pGVar2[0xeb].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xeb].field_1.Value = pGVar2[0xeb].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xeb].field_1.Value = pGVar2[0xeb].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xeb].field_1.Value = pGVar2[0xeb].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xeb].field_1.Value = pGVar2[0xeb].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xeb].field_1.Value = pGVar2[0xeb].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xeb].field_1.Value = pGVar2[0xeb].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xeb].field_1.Value = pGVar2[0xeb].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xeb].field_1.Value = pGVar2[0xeb].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xeb].field_1.Value = pGVar2[0xeb].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xeb].field_1.Value = pGVar2[0xeb].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xeb].field_1.Value = pGVar2[0xeb].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xeb].field_1.Value = pGVar2[0xeb].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xed].field_1.Value = pGVar2[0xed].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xed].field_1.Value = pGVar2[0xed].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xed].field_1.Value = pGVar2[0xed].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xed].field_1.Value = pGVar2[0xed].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xed].field_1.Value = pGVar2[0xed].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xed].field_1.Value = pGVar2[0xed].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xed].field_1.Value = pGVar2[0xed].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xed].field_1.Value = pGVar2[0xed].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xed].field_1.Value = pGVar2[0xed].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xed].field_1.Value = pGVar2[0xed].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xed].field_1.Value = pGVar2[0xed].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xed].field_1.Value = pGVar2[0xed].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xed].field_1.Value = pGVar2[0xed].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xed].field_1.Value = pGVar2[0xed].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xed].field_1.Value = pGVar2[0xed].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xed].field_1.Value = pGVar2[0xed].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xed].field_1.Value = pGVar2[0xed].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xed].field_1.Value = pGVar2[0xed].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xed].field_1.Value = pGVar2[0xed].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xed].field_1.Value = pGVar2[0xed].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xed].field_1.Value = pGVar2[0xed].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xed].field_1.Value = pGVar2[0xed].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xed].field_1.Value = pGVar2[0xed].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xed].field_1.Value = pGVar2[0xed].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xf0].field_1.Value = pGVar2[0xf0].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xf0].field_1.Value = pGVar2[0xf0].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xf0].field_1.Value = pGVar2[0xf0].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xf0].field_1.Value = pGVar2[0xf0].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xf0].field_1.Value = pGVar2[0xf0].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xf0].field_1.Value = pGVar2[0xf0].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xf0].field_1.Value = pGVar2[0xf0].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xf0].field_1.Value = pGVar2[0xf0].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xf0].field_1.Value = pGVar2[0xf0].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xf0].field_1.Value = pGVar2[0xf0].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xf0].field_1.Value = pGVar2[0xf0].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xf0].field_1.Value = pGVar2[0xf0].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xf0].field_1.Value = pGVar2[0xf0].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xf0].field_1.Value = pGVar2[0xf0].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xf0].field_1.Value = pGVar2[0xf0].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xf0].field_1.Value = pGVar2[0xf0].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xf0].field_1.Value = pGVar2[0xf0].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xf0].field_1.Value = pGVar2[0xf0].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xf0].field_1.Value = pGVar2[0xf0].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xf0].field_1.Value = pGVar2[0xf0].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xf0].field_1.Value = pGVar2[0xf0].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xf0].field_1.Value = pGVar2[0xf0].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xf0].field_1.Value = pGVar2[0xf0].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0xf0].field_1.Value = pGVar2[0xf0].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x118].field_1.Value = pGVar2[0x118].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x118].field_1.Value = pGVar2[0x118].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x118].field_1.Value = pGVar2[0x118].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x118].field_1.Value = pGVar2[0x118].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x118].field_1.Value = pGVar2[0x118].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x118].field_1.Value = pGVar2[0x118].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x118].field_1.Value = pGVar2[0x118].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x118].field_1.Value = pGVar2[0x118].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x118].field_1.Value = pGVar2[0x118].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x118].field_1.Value = pGVar2[0x118].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x118].field_1.Value = pGVar2[0x118].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x118].field_1.Value = pGVar2[0x118].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x118].field_1.Value = pGVar2[0x118].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x118].field_1.Value = pGVar2[0x118].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x118].field_1.Value = pGVar2[0x118].field_1.Value & 0xfffffffffeffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x118].field_1.Value = pGVar2[0x118].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x118].field_1.Value = pGVar2[0x118].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x118].field_1.Value = pGVar2[0x118].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x118].field_1.Value = pGVar2[0x118].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x118].field_1.Value = pGVar2[0x118].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x118].field_1.Value = pGVar2[0x118].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x118].field_1.Value = pGVar2[0x118].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x118].field_1.Value = pGVar2[0x118].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x118].field_1.Value = pGVar2[0x118].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x119].field_1.Value = pGVar2[0x119].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x119].field_1.Value = pGVar2[0x119].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x119].field_1.Value = pGVar2[0x119].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x119].field_1.Value = pGVar2[0x119].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x119].field_1.Value = pGVar2[0x119].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x119].field_1.Value = pGVar2[0x119].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x119].field_1.Value = pGVar2[0x119].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x119].field_1.Value = pGVar2[0x119].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x119].field_1.Value = pGVar2[0x119].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x119].field_1.Value = pGVar2[0x119].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x119].field_1.Value = pGVar2[0x119].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x119].field_1.Value = pGVar2[0x119].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x119].field_1.Value = pGVar2[0x119].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x119].field_1.Value = pGVar2[0x119].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x119].field_1.Value = pGVar2[0x119].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x119].field_1.Value = pGVar2[0x119].field_1.Value & 0xfffffffffdffffff | 0x2000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x119].field_1.Value = pGVar2[0x119].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x119].field_1.Value = pGVar2[0x119].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x119].field_1.Value = pGVar2[0x119].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x119].field_1.Value = pGVar2[0x119].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x119].field_1.Value = pGVar2[0x119].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x119].field_1.Value = pGVar2[0x119].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x119].field_1.Value = pGVar2[0x119].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x119].field_1.Value = pGVar2[0x119].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11a].field_1.Value = pGVar2[0x11a].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11a].field_1.Value = pGVar2[0x11a].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11a].field_1.Value = pGVar2[0x11a].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11a].field_1.Value = pGVar2[0x11a].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11a].field_1.Value = pGVar2[0x11a].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11a].field_1.Value = pGVar2[0x11a].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11a].field_1.Value = pGVar2[0x11a].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11a].field_1.Value = pGVar2[0x11a].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11a].field_1.Value = pGVar2[0x11a].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11a].field_1.Value = pGVar2[0x11a].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11a].field_1.Value = pGVar2[0x11a].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11a].field_1.Value = pGVar2[0x11a].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11a].field_1.Value = pGVar2[0x11a].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11a].field_1.Value = pGVar2[0x11a].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11a].field_1.Value = pGVar2[0x11a].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11a].field_1.Value = pGVar2[0x11a].field_1.Value & 0xfffffffffdffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11a].field_1.Value = pGVar2[0x11a].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11a].field_1.Value = pGVar2[0x11a].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11a].field_1.Value = pGVar2[0x11a].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11a].field_1.Value = pGVar2[0x11a].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11a].field_1.Value = pGVar2[0x11a].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11a].field_1.Value = pGVar2[0x11a].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11a].field_1.Value = pGVar2[0x11a].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11a].field_1.Value = pGVar2[0x11a].field_1.Value & 0xffefffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11b].field_1.Value = pGVar2[0x11b].field_1.Value & 0xfffffffffffffffe;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11b].field_1.Value = pGVar2[0x11b].field_1.Value & 0xfffffffffffffffd;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11b].field_1.Value = pGVar2[0x11b].field_1.Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11b].field_1.Value = pGVar2[0x11b].field_1.Value & 0xfffffffffffffff7;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11b].field_1.Value = pGVar2[0x11b].field_1.Value & 0xffffffffffffffcf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11b].field_1.Value = pGVar2[0x11b].field_1.Value & 0xffffffffffffffbf;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11b].field_1.Value = pGVar2[0x11b].field_1.Value & 0xfffffffffffffc7f;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11b].field_1.Value = pGVar2[0x11b].field_1.Value & 0xffffffffffffe3ff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11b].field_1.Value = pGVar2[0x11b].field_1.Value & 0xffffffffffffdfff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11b].field_1.Value = pGVar2[0x11b].field_1.Value & 0xfffffffffffcffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11b].field_1.Value = pGVar2[0x11b].field_1.Value & 0xffffffffffff3fff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11b].field_1.Value = pGVar2[0x11b].field_1.Value & 0xfffffffffffbffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11b].field_1.Value = pGVar2[0x11b].field_1.Value & 0xffffffffffe7ffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11b].field_1.Value = pGVar2[0x11b].field_1.Value & 0xffffffffff1fffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11b].field_1.Value = pGVar2[0x11b].field_1.Value & 0xfffffffffeffffff | 0x1000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11b].field_1.Value = pGVar2[0x11b].field_1.Value & 0xfffffffffdffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11b].field_1.Value = pGVar2[0x11b].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11b].field_1.Value = pGVar2[0x11b].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11b].field_1.Value = pGVar2[0x11b].field_1.Value & 0xffffffff3fffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11b].field_1.Value = pGVar2[0x11b].field_1.Value & 0xfffffffcffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11b].field_1.Value = pGVar2[0x11b].field_1.Value & 0xfffffff3ffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11b].field_1.Value = pGVar2[0x11b].field_1.Value & 0xfffcffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11b].field_1.Value = pGVar2[0x11b].field_1.Value & 0xfff3ffffffffffff;
    pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    pGVar2[0x11b].field_1.Value = pGVar2[0x11b].field_1.Value & 0xffefffffffffffff;
    SetUpMOCSTable(this);
    pGVar5 = Context::GetPlatformInfo
                       ((this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.
                        super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                        super_GmmCachePolicyCommon.pGmmLibContext);
    if ((pGVar5->Platform).eProductFamily == IGFX_PVC) {
      SetupPAT(this);
    }
    for (CPTblIdx = 0; (uint)CPTblIdx < 0x11e; CPTblIdx = CPTblIdx + 1) {
      PATIdx._3_1_ = 0;
      PATIdx._2_1_ = 0;
      j = 0xffffffff;
      i = 0xffffffff;
      UsageEle.LeCC = (anon_union_4_3_53f8f047_for_LeCC)0x0;
      UsageEle.L3 = (anon_union_2_3_6e525fdd_for_L3)0x0;
      UsageEle.HDCL1 = '\0';
      UsageEle._7_1_ = 0;
      _UsagePATElement = 0;
      TblEle._4_4_ = 0;
      TblEle._0_4_ = 0;
      pGVar5 = Context::GetPlatformInfo
                         ((this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.
                          super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                          super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pGmmLibContext);
      PVar1 = (pGVar5->Platform).eProductFamily;
      if ((PVar1 == IGFX_DG1) || (PVar1 == IGFX_XE_HP_SDV)) {
LAB_00208d70:
        TblEle._4_4_ = 1;
      }
      else if (PVar1 == IGFX_DG2) {
        TblEle._4_4_ = 0;
      }
      else {
        if (PVar1 == IGFX_PVC) goto LAB_00208d70;
        TblEle._4_4_ = 1;
      }
      pGVar5 = Context::GetPlatformInfo
                         ((this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.
                          super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                          super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pGmmLibContext);
      if ((int)(pGVar5->Platform).eProductFamily < 0x4f6) {
        j = IsSpecialMOCSUsage(this,CPTblIdx,(bool *)((long)&PATIdx + 2));
      }
      if ((((this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[(uint)CPTblIdx].field_1.Value >> 0x12 & 1) != 0) &&
         (pGVar5 = Context::GetPlatformInfo
                             ((this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.
                              super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pGmmLibContext),
         (int)(pGVar5->Platform).eProductFamily < 0x4e3)) {
        _UsagePATElement = CONCAT16(1,_UsagePATElement);
      }
      _UsagePATElement = _UsagePATElement & 0xffff00f0ffffffff;
      sVar8 = 1;
      if (((this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
           [(uint)CPTblIdx].field_1.Value >> 2 & 1) != 0) {
        sVar8 = 3;
      }
      uVar9 = (ushort)StartMocsIdx & 0xffcf | sVar8 << 4;
      if (((this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
           [(uint)CPTblIdx].field_1.Value >> 10 & 7) != 0) {
        StartMocsIdx._0_2_ = uVar9 | 1;
        uVar9 = (ushort)StartMocsIdx |
                ((ushort)((this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.
                          super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                          super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
                          [(uint)CPTblIdx].field_1.Value >> 10) & 7) << 1;
      }
      _UsagePATElement = CONCAT26(StartMocsIdx._2_2_,CONCAT24(uVar9,UsagePATElement.Value));
      pGVar5 = Context::GetPlatformInfo
                         ((this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.
                          super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                          super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pGmmLibContext);
      if ((pGVar5->Platform).eProductFamily == IGFX_PVC) {
        pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.
                 super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                 super_GmmCachePolicyCommon.pCachePolicy;
        pGVar2[(uint)CPTblIdx].field_1.Value =
             pGVar2[(uint)CPTblIdx].field_1.Value & 0xfffffffffeffffff;
        pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.
                 super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                 super_GmmCachePolicyCommon.pCachePolicy;
        pGVar2[(uint)CPTblIdx].field_1.Value =
             pGVar2[(uint)CPTblIdx].field_1.Value & 0xfffffffffdffffff;
      }
      if ((((PATIdx._2_1_ & 1) == 0) &&
          (pGVar5 = Context::GetPlatformInfo
                              ((this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.
                               super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                               super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pGmmLibContext),
          0x4e1 < (int)(pGVar5->Platform).eProductFamily)) &&
         (pGVar5 = Context::GetPlatformInfo
                             ((this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.
                              super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pGmmLibContext),
         (pGVar5->Platform).eProductFamily != IGFX_PVC)) {
        if (((this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy[(uint)CPTblIdx].field_1.Value >> 2 & 1) == 0) {
          _UsagePATElement =
               CONCAT24((ushort)StartMocsIdx & 0xffbf |
                        ((ushort)((this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.
                                  super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                                  super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
                                  [(uint)CPTblIdx].field_1.Value >> 0x18) & 1) << 6,
                        UsagePATElement.Value);
        }
        _UsagePATElement =
             CONCAT24((ushort)StartMocsIdx & 0xff7f |
                      ((ushort)((this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.
                                super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                                super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
                                [(uint)CPTblIdx].field_1.Value >> 0x19) & 1) << 7,
                      UsagePATElement.Value);
      }
      if ((int)j < 0x3c) {
        if (StartMocsIdx._2_1_ == '\0') {
          for (PTEValue._4_4_ = TblEle._4_4_;
              PTEValue._4_4_ <=
              (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
              super_GmmGen9CachePolicy.CurrentMaxMocsIndex; PTEValue._4_4_ = PTEValue._4_4_ + 1) {
            if (((((this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.
                   super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                   super_GmmCachePolicyCommon.pCachePolicy[(uint)CPTblIdx].field_1.Value >> 2 & 1)
                  == 0) &&
                (((this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.
                  super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                  super_GmmCachePolicyCommon.pCachePolicy[(uint)CPTblIdx].field_1.Value >> 0x18 & 1)
                 == 0)) &&
               (((this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.
                 super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                 super_GmmCachePolicyCommon.pCachePolicy[(uint)CPTblIdx].field_1.Value >> 0x19 & 1)
                == 0)) {
              j = TblEle._4_4_;
              break;
            }
            local_60 = Context::GetCachePolicyTlbElement
                                 ((this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.
                                  super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                                  super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pGmmLibContext
                                 );
            local_60 = local_60 + PTEValue._4_4_;
            if ((local_60->L3).UshortValue == (ushort)StartMocsIdx) {
              j = PTEValue._4_4_;
              break;
            }
          }
        }
        else {
          for (PTEValue._4_4_ = 0x30;
              PTEValue._4_4_ <=
              (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
              super_GmmGen9CachePolicy.CurrentMaxL1HdcMocsIndex; PTEValue._4_4_ = PTEValue._4_4_ + 1
              ) {
            pGVar6 = Context::GetCachePolicyTlbElement
                               ((this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.
                                super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                                super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pGmmLibContext);
            TblEle_2 = pGVar6 + PTEValue._4_4_;
            if (((TblEle_2->L3).UshortValue == (ushort)StartMocsIdx) &&
               (TblEle_2->HDCL1 == StartMocsIdx._2_1_)) {
              j = PTEValue._4_4_;
              break;
            }
          }
        }
      }
      else {
        pGVar6 = Context::GetCachePolicyTlbElement
                           ((this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.
                            super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                            super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pGmmLibContext);
        TblEle_1 = pGVar6 + (int)j;
      }
      if (j == 0xffffffff) {
        PATIdx._3_1_ = 1;
        j = TblEle._4_4_;
      }
      memcpy(&stack0xffffffffffffff78,
             (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy + (uint)CPTblIdx,0x28);
      CachePolicyUsage.field_1 =
           (anon_union_8_2_649915e9_for_GMM_CACHE_POLICY_ELEMENT_REC_1)uStack_80;
      CachePolicyUsage._0_8_ = uStack_88;
      CachePolicyUsage.MemoryObjectOverride = (MEMORY_OBJECT_CONTROL_STATE)(undefined4)local_78;
      CachePolicyUsage.field_3 =
           (anon_union_4_2_78ef2503_for_GMM_CACHE_POLICY_ELEMENT_REC_4)local_78._4_4_;
      CachePolicyUsage.PTE = (GMM_PTE_CACHE_CONTROL_BITS)uStack_70;
      CachePolicyUsage.Override = (undefined4)local_68;
      CachePolicyUsage.IsOverridenByRegkey = local_68._4_4_;
      bVar3 = GmmGen8CachePolicy::GetUsagePTEValue
                        ((GmmGen8CachePolicy *)this,CachePolicyUsage,CPTblIdx,(uint64_t *)&UsageEle)
      ;
      if (!bVar3) {
        PATIdx._3_1_ = 1;
      }
      (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
      super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
      [(uint)CPTblIdx].PTE.field_4.DwordValue = (uint32_t)UsageEle.LeCC;
      (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
      super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
      [(uint)CPTblIdx].PTE.field_4.HighDwordValue = 0;
      pGVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy
               .super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
               pCachePolicy;
      pGVar2[(uint)CPTblIdx].MemoryObjectOverride.DwordValue =
           pGVar2[(uint)CPTblIdx].MemoryObjectOverride.DwordValue & 0xffffff81 | (j & 0x3f) << 1;
      (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
      super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
      [(uint)CPTblIdx].Override = 0xffffffff;
      pGVar5 = Context::GetPlatformInfo
                         ((this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.
                          super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                          super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pGmmLibContext);
      if ((pGVar5->Platform).eProductFamily == IGFX_PVC) {
        uVar13 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.
                 super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                 super_GmmCachePolicyCommon.pCachePolicy[(uint)CPTblIdx].field_1.Value >> 2 & 1;
        uVar10 = 0;
        if (uVar13 != 0) {
          uVar10 = 3;
        }
        TblEle._0_4_ = (uint)TblEle & 0xc | uVar10;
        for (PTEValue._0_4_ = 0;
            (uint)PTEValue <=
            *(uint *)&(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.field_0x2c;
            PTEValue._0_4_ = (uint)PTEValue + 1) {
          pGVar7 = GmmGen8CachePolicy::GetPrivatePATEntry
                             ((GMM_PRIVATE_PAT *)this,(GmmGen8CachePolicy *)(ulong)(uint)PTEValue,
                              (uint32_t)uVar13);
          if (((uint)TblEle & 3) == ((uint)pGVar7 & 3)) {
            i = (uint)PTEValue;
            break;
          }
          uVar13 = extraout_RDX;
        }
        if (i == 0xffffffff) {
          i = 0;
        }
        (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
        [(uint)CPTblIdx].field_3.PATIndex = i;
        uVar10 = 0;
        if ((i & 4) != 0) {
          uVar10 = 0x80;
        }
        uVar11 = 0;
        if ((i & 2) != 0) {
          uVar11 = 0x10;
        }
        uVar12 = 0;
        if ((i & 1) != 0) {
          uVar12 = 8;
        }
        (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
        [(uint)CPTblIdx].PTE.field_4.DwordValue = uVar10 | uVar11 | uVar12;
        uVar10 = 0;
        if ((i & 0x10) != 0) {
          uVar10 = 0x20000000;
        }
        uVar11 = 0;
        if ((i & 8) != 0) {
          uVar11 = 0x40000000;
        }
        (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
        [(uint)CPTblIdx].PTE.field_4.HighDwordValue = uVar10 | uVar11;
      }
    }
    this_local._4_4_ = GMM_SUCCESS;
  }
  return this_local._4_4_;
}

Assistant:

GMM_STATUS GmmLib::GmmGen12dGPUCachePolicy::InitCachePolicy()
{

    __GMM_ASSERTPTR(pCachePolicy, GMM_ERROR);

#define DEFINE_CACHE_ELEMENT(usage, l3, l3_scc, hdcl1, go, uclookup, l1cc) DEFINE_CP_ELEMENT(usage, 0, 0, l3, 0, 0, 0, 0, l3_scc, 0, 0, 0, hdcl1, 0, 0, go, uclookup, l1cc, 0, 0, 0, 0, 0, 0)

#include "GmmGen12dGPUCachePolicy.h"

#define L3_UNCACHEABLE (0x1)
#define L3_WB_CACHEABLE (0x3)
#define L3_PAT_UNCACHEABLE (0x0)

#define DISABLE_SKIP_CACHING_CONTROL (0x0)
#define ENABLE_SKIP_CACHING_CONTROL (0x1)

#define DISABLE_SELF_SNOOP_OVERRIDE (0x0)
#define CLASS_SERVICE_ZERO (0x0)
#define GMM_GEN12_MAX_NUMBER_MOCS_INDEXES (60) // On TGL last four (#60-#63) are reserved by h/w, few? are sw configurable though (#60)
    {
        SetUpMOCSTable();
    }
    
    if(GFX_GET_CURRENT_PRODUCT(pGmmLibContext->GetPlatformInfo().Platform) == IGFX_PVC)
    {
        SetupPAT();
    }

    {
        // Define index of cache element
        uint32_t Usage = 0;

#if(_WIN32 && (_DEBUG || _RELEASE_INTERNAL))
        void *pKmdGmmContext = NULL;

	OverrideCachePolicy(pKmdGmmContext);
#endif

        // Process the cache policy and fill in the look up table
        for(; Usage < GMM_RESOURCE_USAGE_MAX; Usage++)
        {
            bool                         CachePolicyError = false;
            bool                         SpecialMOCS      = false;
            int32_t                      CPTblIdx = -1, PATIdx = -1;
            uint32_t                     j = 0, i = 0;
            uint64_t                     PTEValue        = 0;
            GMM_CACHE_POLICY_TBL_ELEMENT UsageEle        = {0};
            uint32_t                     StartMocsIdx    = 0;
            GMM_PRIVATE_PAT              UsagePATElement = {0};


            switch(GFX_GET_CURRENT_PRODUCT(pGmmLibContext->GetPlatformInfo().Platform))
            {
	        case IGFX_DG1:
                case IGFX_XE_HP_SDV:
	        case IGFX_PVC:
                    StartMocsIdx = 1; // Index 0 is reserved for Error
                    break;
                case IGFX_DG2:
		    // DG2 provides 2 wires for MOCS Registers, gives 4(2^2) indexes to program.
                    StartMocsIdx = 0;
                    break;
                default:
                    StartMocsIdx = 1;
                    break;
            }

            // No Special MOCS handling for next platform
            if(GFX_GET_CURRENT_PRODUCT(pGmmLibContext->GetPlatformInfo().Platform) < IGFX_DG2)
            {
                CPTblIdx = IsSpecialMOCSUsage((GMM_RESOURCE_USAGE_TYPE)Usage, SpecialMOCS);
            }

            // Applicable upto Xe_HP only
            if(pCachePolicy[Usage].HDCL1 &&
               (GFX_GET_CURRENT_PRODUCT(pGmmLibContext->GetPlatformInfo().Platform) <= IGFX_XE_HP_SDV))
            {
                UsageEle.HDCL1 = 1;
            }

            UsageEle.L3.Reserved = 0; // Reserved bits zeroe'd, this is so we
                                      // we can compare the unioned L3.UshortValue.
            UsageEle.L3.ESC          = DISABLE_SKIP_CACHING_CONTROL;
            UsageEle.L3.SCC          = 0;
            UsageEle.L3.Cacheability = pCachePolicy[Usage].L3 ? L3_WB_CACHEABLE : L3_UNCACHEABLE;

            if(pCachePolicy[Usage].L3_SCC)
            {
                UsageEle.L3.ESC = ENABLE_SKIP_CACHING_CONTROL;
                UsageEle.L3.SCC = (uint16_t)pCachePolicy[Usage].L3_SCC;
            }

	    if(GFX_GET_CURRENT_PRODUCT(pGmmLibContext->GetPlatformInfo().Platform) == IGFX_PVC)
            {
                pCachePolicy[Usage].GlbGo    = 0;
                pCachePolicy[Usage].UcLookup = 0;
            }
            // Go/Lookup
            // N/A for SpecialMOCS
            // N/A for DG1, RKL, PVC
            // Applicable for IGFX_XE_HP_SDV and DG2 only
            if(!SpecialMOCS &&
               (FROMPRODUCT(XE_HP_SDV)) &&
               (GFX_GET_CURRENT_PRODUCT(pGmmLibContext->GetPlatformInfo().Platform) != IGFX_PVC))
            {
                if(pCachePolicy[Usage].L3 == 0)
                {
                    UsageEle.L3.GlobalGo = pCachePolicy[Usage].GlbGo;
                }
                UsageEle.L3.UCLookup = pCachePolicy[Usage].UcLookup;
                __GMM_ASSERT((pCachePolicy[Usage].UcLookup) || (pCachePolicy[Usage].L3 == 0 && pCachePolicy[Usage].UcLookup == 0));
            }


            //Special-case MOCS handling for MOCS Table Index 60-63
            if(CPTblIdx >= GMM_GEN12_MAX_NUMBER_MOCS_INDEXES)
            {
                GMM_CACHE_POLICY_TBL_ELEMENT *TblEle = &pGmmLibContext->GetCachePolicyTlbElement()[CPTblIdx];

                if(SpecialMOCS &&
                   !(TblEle->L3.UshortValue == UsageEle.L3.UshortValue))
                {
                    //Assert if being overwritten!
                    __GMM_ASSERT(TblEle->L3.UshortValue == 0);

                }
            }
            //For HDC L1 caching, MOCS Table index 48-59 should be used
            else if(UsageEle.HDCL1)
            {
                for(j = GMM_GEN10_HDCL1_MOCS_INDEX_START; j <= CurrentMaxL1HdcMocsIndex; j++)
                {
                    GMM_CACHE_POLICY_TBL_ELEMENT *TblEle = &pGmmLibContext->GetCachePolicyTlbElement()[j];                    
		    if(TblEle->L3.UshortValue == UsageEle.L3.UshortValue &&
                       TblEle->HDCL1 == UsageEle.HDCL1)
                    {
                        CPTblIdx = j;
                        break;
                    }
                }
            }
            else
            {
                for(j = StartMocsIdx; j <= CurrentMaxMocsIndex; j++)
                {
                    if(pCachePolicy[Usage].L3 == 0 &&
                       pCachePolicy[Usage].GlbGo == 0 &&
                       pCachePolicy[Usage].UcLookup == 0)
                    {
                        CPTblIdx = StartMocsIdx;
                        break;
                    }
                    else
                    {
                        GMM_CACHE_POLICY_TBL_ELEMENT *TblEle = &pGmmLibContext->GetCachePolicyTlbElement()[j];

                        if(TblEle->L3.UshortValue == UsageEle.L3.UshortValue)
                        {
                            CPTblIdx = j;
                            break;
                        }
                    }
                }
            }

            // Didn't find the caching settings in one of the already programmed lookup table entries.
            // Need to add a new lookup table entry.
            if(CPTblIdx == -1)
            {

                {
                    GMM_ASSERTDPF(false, "CRITICAL ERROR: Cache Policy Usage value specified by Client is not defined in Fixed MOCS Table!");

                    CachePolicyError = true;
                    GMM_ASSERTDPF(
                    "Cache Policy Init Error: Invalid Cache Programming, too many unique caching combinations"
                    "(we only support GMM_GEN_MAX_NUMBER_MOCS_INDEXES = %d)",
                    CurrentMaxMocsIndex);

                    // Set cache policy index to uncached.
                    CPTblIdx = StartMocsIdx;
                }
            }

            // PTE entries do not control caching on SKL+ (for legacy context)
            if(!GetUsagePTEValue(pCachePolicy[Usage], Usage, &PTEValue))
            {
                CachePolicyError = true;
            }

            pCachePolicy[Usage].PTE.DwordValue     = PTEValue & 0xFFFFFFFF;
            pCachePolicy[Usage].PTE.HighDwordValue = 0;

	    pCachePolicy[Usage].MemoryObjectOverride.Gen12.Index = CPTblIdx;

            pCachePolicy[Usage].Override = ALWAYS_OVERRIDE;

            if(CachePolicyError)
            {
                GMM_ASSERTDPF("Cache Policy Init Error: Invalid Cache Programming - Element %d", Usage);
            }
            
            if(GFX_GET_CURRENT_PRODUCT(pGmmLibContext->GetPlatformInfo().Platform) == IGFX_PVC)
            {
                // PAT data
                {
                    UsagePATElement.Xe_HPC.Reserved = 0;

                    UsagePATElement.Xe_HPC.MemoryType = pCachePolicy[Usage].L3 ? L3_WB_CACHEABLE : L3_PAT_UNCACHEABLE;
                    
                    // try to find a match in static PAT table
                    for(i = 0; i <= CurrentMaxPATIndex; i++)
                    {
                        GMM_PRIVATE_PAT PAT = GetPrivatePATEntry(i);
                        if(UsagePATElement.Xe_HPC.MemoryType == PAT.Xe_HPC.MemoryType)
                        {
                            PATIdx = i;
                            break;
                        }
                    }

                    if(PATIdx == -1)
                    {
                         GMM_ASSERTDPF(
                         "Cache Policy Init Error: Invalid Cache Programming, too many unique caching combinations"
                         "(we only support NumPATRegisters = %d)",
                         CurrentMaxPATIndex);
                         CachePolicyError = true;
                         // add rterror here <ToDo>
                          PATIdx = PAT0; // default to uncached PAT index 0: GMM_CP_NON_COHERENT_UC
                                           // Log Error using regkey to indicate the above error
                        
                    }
                }

                pCachePolicy[Usage].PATIndex           = PATIdx;
                pCachePolicy[Usage].PTE.DwordValue     = GMM_GET_PTE_BITS_FROM_PAT_IDX(PATIdx) & 0xFFFFFFFF;
                pCachePolicy[Usage].PTE.HighDwordValue = GMM_GET_PTE_BITS_FROM_PAT_IDX(PATIdx) >> 32;
            }
        }
    }

    return GMM_SUCCESS;
}